

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReactorCvodePreconditioner.cpp
# Opt level: O2

int pele::physics::reactions::cvode::Precond
              (Real param_1,N_Vector u,N_Vector param_3,int jok,int *jcurPtr,Real gamma,
              void *user_data)

{
  double dVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  realtype **a;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined8 uVar13;
  Real RVar14;
  Real RVar15;
  Real RVar16;
  Real RVar17;
  Real RVar18;
  Real RVar19;
  Real RVar20;
  Real RVar21;
  Real RVar22;
  Real RVar23;
  Real RVar24;
  undefined8 uVar25;
  int *piVar26;
  int i;
  sunindextype sVar27;
  realtype *prVar28;
  long lVar29;
  Real *pRVar30;
  double *pdVar31;
  double *pdVar32;
  int i_1;
  long lVar33;
  double *pdVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  ulong extraout_XMM0_Qb_00;
  undefined1 auVar54 [16];
  undefined8 extraout_XMM0_Qb_01;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar79;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  double dVar80;
  double dVar81;
  double dVar82;
  double dVar83;
  double dVar84;
  double dVar85;
  double dVar86;
  double dVar87;
  double dVar88;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  double dVar99;
  double dVar100;
  double dVar101;
  double dVar102;
  double dVar103;
  double dVar104;
  double dVar105;
  double dVar106;
  double dVar107;
  double dVar108;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  double dVar116;
  double dVar117;
  double dVar118;
  double dVar119;
  double dVar120;
  double dVar121;
  double dVar122;
  double dVar123;
  double dVar124;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  double dVar128;
  double dVar129;
  double dVar130;
  double dVar131;
  double dVar132;
  double dVar133;
  double dVar138;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  double dVar139;
  double dVar140;
  double dVar141;
  double dVar142;
  double dVar143;
  Real RVar144;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  double dVar147;
  double dVar148;
  double dVar149;
  double dVar150;
  double dVar152;
  undefined1 auVar151 [16];
  Real T_1;
  undefined4 uVar153;
  Real invT_1;
  double dVar154;
  double dVar155;
  undefined1 auVar156 [16];
  double __x;
  double dVar157;
  double dVar159;
  undefined1 auVar158 [16];
  double __x_00;
  undefined1 auVar160 [16];
  Real invT;
  double dVar161;
  double dVar162;
  undefined1 auVar163 [16];
  double local_2038;
  double dStack_2030;
  double dStack_1f80;
  double local_1f08 [16];
  undefined1 auStack_1e88 [16];
  double local_1e78;
  undefined1 local_1e58 [16];
  double local_1e48;
  double dStack_1e40;
  double local_1e38;
  double dStack_1e30;
  undefined1 local_1e28 [16];
  double local_1e18;
  double dStack_1e10;
  double local_1e08;
  double dStack_1e00;
  undefined1 local_1df8 [16];
  double local_1de8;
  double dStack_1de0;
  double local_1dd8;
  double dStack_1dd0;
  double local_1dc8;
  double dStack_1dc0;
  Real c [21];
  double local_1ce8;
  double dStack_1ce0;
  double dStack_1cd0;
  double local_1cb8;
  double dStack_1cb0;
  double local_1c98;
  double dStack_1c90;
  double local_1c70;
  Real h_RT [21];
  double dStack_1b80;
  Real T;
  double local_1b20;
  double local_1a18;
  double dStack_1a10;
  double local_18d8 [22];
  double local_1828;
  double dStack_1820;
  double local_1818;
  Real RStack_1810;
  double local_1808;
  Real RStack_1800;
  double local_17f8;
  Real RStack_17f0;
  double local_17e8;
  undefined8 uStack_17e0;
  double local_17d8;
  Real RStack_17d0;
  double local_17c8;
  undefined8 uStack_17c0;
  double local_17b8;
  undefined8 uStack_17b0;
  double local_17a8;
  double local_1798;
  double dStack_1790;
  double local_1788;
  double dStack_1780;
  double local_1778;
  double dStack_1770;
  double local_1768;
  double local_1758;
  double dStack_1750;
  double local_1740;
  double local_1738;
  double local_1730;
  double local_1728;
  double dStack_1720;
  double local_1718;
  double local_1708;
  undefined8 uStack_1700;
  double local_16f8;
  double dStack_16f0;
  double local_16e8;
  double local_16d8;
  Real RStack_16d0;
  double local_16c8;
  undefined8 uStack_16c0;
  double local_16b8;
  Real RStack_16b0;
  double local_16a8;
  double dStack_16a0;
  double local_1698;
  double local_1688;
  double dStack_1680;
  double local_1678;
  Real RStack_1670;
  double local_1668;
  undefined8 uStack_1660;
  double local_1658;
  undefined8 uStack_1650;
  double local_1648;
  double dStack_1640;
  double local_1638;
  undefined8 uStack_1630;
  double local_1628;
  undefined8 uStack_1620;
  double local_1618;
  undefined8 uStack_1610;
  double local_1608;
  Real local_15f8;
  undefined8 uStack_15f0;
  double local_15e8;
  undefined8 uStack_15e0;
  double local_15d8;
  double dStack_15d0;
  double local_15c8 [23];
  undefined1 auStack_1510 [16];
  double local_1500;
  double dStack_14f8;
  double local_14f0;
  double local_14e8;
  double local_14e0;
  double local_14d8;
  double dStack_14d0;
  double local_14c8;
  double local_14c0;
  double local_14b8;
  double local_14b0;
  double local_14a8;
  double local_14a0;
  double local_1498;
  double local_1490;
  double local_1488;
  double local_1468;
  double local_1460;
  double dStack_1458;
  double local_1450;
  double dStack_1448;
  double local_1440;
  double local_1438;
  double local_1430;
  double local_1428;
  double local_1420;
  double local_1418;
  double local_1410;
  double local_1408;
  double local_1400;
  double local_13f8;
  double local_13f0;
  double local_13e8;
  double local_13e0;
  double local_13d8;
  double local_13b8;
  double local_13b0;
  double dStack_13a8;
  double local_13a0;
  double dStack_1398;
  undefined1 local_1390 [16];
  double local_1380;
  double local_1378;
  double local_1370;
  double local_1368;
  double local_1360;
  double local_1358;
  double local_1350;
  double local_1348;
  double local_1340;
  double local_1338;
  double local_1330;
  double local_1308;
  double local_1300;
  double dStack_12f8;
  double local_12f0;
  double dStack_12e8;
  double local_12e0;
  double local_12d8;
  double dStack_12d0;
  double local_12c8;
  double local_12c0;
  double local_12b8;
  double local_12b0;
  double local_12a8;
  double local_12a0;
  double local_1298;
  double local_1290;
  double local_1280;
  double local_1278;
  double local_1258;
  double local_1250;
  double dStack_1248;
  double local_1240;
  double local_1238;
  double local_1230;
  double local_1228;
  double local_1220;
  double local_1218;
  double local_1210;
  double local_1208;
  double local_1200;
  double local_11f0;
  double local_11e8;
  double local_11d0;
  double local_11c8;
  double local_11a8;
  double local_11a0;
  double local_1198;
  double local_1190;
  double dStack_1188;
  double local_1180;
  double dStack_1178;
  double dStack_1170;
  double local_1160;
  double local_1158;
  double local_1150;
  double local_1148;
  double local_1140;
  double local_1138;
  double local_1130;
  double local_1128;
  double local_1120;
  double local_10f8;
  double local_10f0;
  double local_10e8;
  double local_10e0;
  double local_10d8;
  double local_10d0;
  double local_10c8;
  double dStack_10c0;
  double local_10b8;
  double local_10b0;
  double local_10a8;
  double local_1090;
  double local_1088;
  double local_1078;
  double local_1048;
  double local_1040;
  double local_1038;
  double local_1030;
  double local_1028;
  double local_1020;
  double local_1010;
  double local_1008;
  double local_1000;
  double local_ff8;
  double local_ff0;
  double local_fe8;
  double local_fe0;
  double local_fd8;
  double local_fc8;
  double local_f98;
  double local_f90;
  double local_f88;
  double local_f80;
  double local_f78;
  double local_f70;
  double local_f68;
  double local_f60;
  double local_f58;
  double local_f50;
  double local_f48;
  double dStack_f40;
  double local_f30;
  double dStack_f28;
  double local_f20;
  double local_f18;
  double local_f10;
  double local_f08;
  double local_ee8;
  double local_ee0;
  double local_ed8;
  double local_ed0;
  double local_ec8;
  double local_ec0;
  double local_eb8;
  double local_eb0;
  double local_ea8;
  double local_ea0;
  double local_e98;
  double dStack_e90;
  double local_e80;
  double local_e78;
  double local_e60;
  double local_e58;
  double local_e38;
  double local_e30;
  double local_e28;
  double local_e20;
  double local_e18;
  double local_e10;
  double local_e08;
  double local_e00;
  double local_df8;
  double local_df0;
  double local_de8;
  double dStack_de0;
  double local_dd8;
  double local_dd0;
  double local_dc8;
  double local_d88;
  double local_d80;
  double local_d78;
  double local_d70;
  double local_d68;
  double local_d58;
  double local_d50;
  double local_d48;
  double local_d30;
  double local_d28;
  double local_d20;
  double local_d18;
  double local_cd8;
  double local_cd0;
  double local_cc8;
  double local_cc0;
  double local_cb8;
  double local_cb0;
  double local_ca8;
  double local_ca0;
  double local_c98;
  double local_c90;
  double local_c88;
  double local_c80;
  double local_c78;
  double local_c70;
  double local_c68;
  double local_c58;
  double local_c28;
  double local_c20;
  double local_c18;
  double local_c10;
  double local_c08;
  double local_c00;
  double local_bf8;
  double dStack_bf0;
  double local_be8;
  double local_be0;
  double local_bd8;
  double local_bd0;
  double local_bc8;
  double local_bc0;
  double local_bb8;
  double local_bb0;
  double local_ba0;
  double local_b70;
  double local_b68;
  double local_b60;
  double local_b58;
  double local_b48;
  double local_b30;
  double local_b08;
  double local_b00;
  double local_ac0;
  double local_ab8;
  double local_ab0;
  double local_a98;
  double local_a90;
  double local_a88;
  double dStack_a80;
  double local_a60;
  double local_a48;
  double local_a40;
  double local_a18;
  double local_a10;
  double local_a08;
  double local_a00;
  double local_9f8;
  double local_9f0;
  double local_9e8;
  double local_9d0;
  double local_9c8;
  double local_9a8;
  double local_998;
  double local_990;
  double local_988;
  double local_968;
  double local_960;
  double local_958;
  double local_948;
  double local_940;
  double local_920;
  double local_918;
  double local_8e0;
  double local_8d8;
  double local_8b0;
  double local_8a0;
  double local_888;
  double local_880;
  double local_878;
  double local_800;
  double local_7f0;
  double local_7d8;
  double local_7d0;
  double local_7c8;
  double local_758 [10];
  undefined1 local_708 [16];
  double local_6f8;
  double dStack_6f0;
  double dStack_6e8;
  double dStack_6e0;
  double dStack_6d8;
  double dStack_6d0;
  double local_6c8;
  realtype local_6b0;
  double local_6a8;
  double dStack_6a0;
  double local_698;
  double dStack_690;
  double local_688;
  double dStack_680;
  int local_66c;
  double local_668;
  double local_658;
  undefined8 uStack_650;
  double local_648;
  Real RStack_640;
  double local_638;
  Real RStack_630;
  Real local_628;
  Real RStack_620;
  double local_618;
  double local_608;
  double local_5f8;
  Real RStack_5f0;
  double local_5e8;
  double dStack_5e0;
  double local_5d8;
  Real RStack_5d0;
  double local_5c8;
  undefined8 uStack_5c0;
  double local_5b8;
  Real RStack_5b0;
  Real local_5a8;
  undefined8 uStack_5a0;
  double local_598;
  undefined8 uStack_590;
  double local_588;
  double dStack_580;
  Real *local_578;
  int *local_570;
  Real local_568;
  Real RStack_560;
  Real local_558;
  Real RStack_550;
  double local_548;
  double dStack_540;
  undefined8 local_538;
  double dStack_530;
  Real local_528;
  undefined8 uStack_520;
  Real c_R [21];
  Real dcRdT [21];
  double local_358;
  double dStack_350;
  double local_348;
  double dStack_340;
  double local_338;
  double dStack_330;
  double local_328;
  double dStack_320;
  double local_318;
  double dStack_310;
  double local_308;
  double dStack_300;
  double local_2f8;
  double dStack_2f0;
  double local_2e8;
  double dStack_2e0;
  double local_2d8;
  double dStack_2d0;
  double local_2c8;
  double local_2c0;
  Real aRStack_2b8 [2];
  double local_2a8;
  double local_298;
  double local_288;
  Real local_278;
  Real RStack_270;
  Real local_268;
  Real RStack_260;
  double local_258;
  undefined8 uStack_250;
  realtype local_248;
  double local_238 [22];
  Real activity [21];
  Real massfrac [21];
  
  local_248 = gamma;
  prVar28 = N_VGetArrayPointer(u);
  puVar2 = *(undefined8 **)((long)user_data + 0xb0);
  puVar3 = *(undefined8 **)((long)user_data + 0xa8);
  puVar4 = *(undefined8 **)((long)user_data + 0xb8);
  local_238[0] = 2.016;
  local_238[1] = 1.008;
  local_238[2] = 15.999;
  local_238[3] = 31.998;
  local_238[4] = 17.007;
  local_238[5] = 18.015;
  local_238[6] = 33.006;
  local_238[7] = 14.027;
  local_238[8] = 14.027;
  local_238[9] = 15.035;
  local_238[10] = 16.043;
  local_238[0xb] = 28.01;
  local_238[0xc] = 44.009;
  local_238[0xd] = 29.018;
  local_238[0xe] = 30.026;
  local_238[0xf] = 31.034;
  local_238[0x10] = 28.054;
  local_238[0x11] = 29.062;
  local_238[0x12] = 30.07;
  local_238[0x13] = 28.014;
  local_238[0x14] = 39.95;
  if (jok == 0) {
    pdVar32 = &local_358;
    pRVar30 = aRStack_2b8;
    local_578 = dcRdT + 0x14;
    dVar35 = 0.0;
    for (lVar29 = 0; lVar29 != 0x15; lVar29 = lVar29 + 1) {
      dVar35 = dVar35 + prVar28[lVar29];
    }
    local_66c = *(int *)((long)user_data + 0x14);
    local_570 = jcurPtr;
    memset(massfrac,0,0xa8);
    for (lVar29 = 0; lVar29 != 0x15; lVar29 = lVar29 + 1) {
      massfrac[lVar29] = prVar28[lVar29] * (1.0 / dVar35);
    }
    dVar1 = prVar28[0x15];
    memset(activity,0,0xa8);
    local_15c8[0] = 0.49603174603174605;
    local_15c8[1] = 0.9920634920634921;
    local_15c8[2] = 0.06250390649415588;
    local_15c8[3] = 0.03125195324707794;
    local_15c8[4] = 0.05879931792791203;
    local_15c8[5] = 0.055509297807382736;
    local_15c8[6] = 0.030297521662727988;
    local_15c8[7] = 0.07129108148570615;
    local_15c8[8] = 0.07129108148570615;
    local_15c8[9] = 0.06651147322913202;
    local_15c8[10] = 0.06233248145608677;
    local_15c8[0xb] = 0.035701535166012134;
    local_15c8[0xc] = 0.022722624917630486;
    local_15c8[0xd] = 0.03446136880556896;
    local_15c8[0xe] = 0.033304469459801506;
    local_15c8[0xf] = 0.032222723464587225;
    local_15c8[0x10] = 0.035645540742853074;
    local_15c8[0x11] = 0.034409194136673316;
    local_15c8[0x12] = 0.03325573661456601;
    local_15c8[0x13] = 0.03569643749553795;
    local_15c8[0x14] = 0.025031289111389236;
    for (lVar29 = 0; lVar29 != 0x15; lVar29 = lVar29 + 1) {
      activity[lVar29] = massfrac[lVar29] * dVar35 * local_15c8[lVar29];
    }
    pdVar34 = local_15c8;
    memset(pdVar34,0,0xf20);
    for (lVar29 = 0; lVar29 != 0x15; lVar29 = lVar29 + 1) {
      c[lVar29] = activity[lVar29] * 1000000.0;
    }
    for (lVar29 = 0; lVar29 != 0x1e4; lVar29 = lVar29 + 1) {
      local_15c8[lVar29] = 0.0;
    }
    for (lVar29 = 0; lVar29 != 0x15; lVar29 = lVar29 + 1) {
      local_1f08[lVar29] = 0.0;
    }
    dVar36 = log(dVar1);
    local_1e28._8_4_ = (int)extraout_XMM0_Qb;
    local_1e28._0_8_ = dVar36;
    local_1e28._12_4_ = (int)((ulong)extraout_XMM0_Qb >> 0x20);
    dVar55 = dVar1 * dVar1;
    dVar46 = dVar1 * dVar55;
    dVar35 = 1.0 / dVar1;
    dVar37 = 12186.6002121605 / dVar1;
    local_1de8 = 0.0;
    for (lVar29 = 0; lVar29 != 0x15; lVar29 = lVar29 + 1) {
      local_1de8 = local_1de8 + c[lVar29];
    }
    dVar161 = dVar1 * dVar46;
    if (1000.0 <= dVar1) {
      local_1c70 = dVar161 * -1.00127688e-15 +
                   dVar46 * 1.496386616666667e-11 +
                   dVar55 * -8.324279633333333e-08 +
                   dVar1 * 2.470123655e-05 + dVar36 * -3.3372792 + dVar35 * -950.158922 + 6.54230251
      ;
      local_1ce8 = dVar161 * -2.490986785e-23 +
                   dVar46 * 3.945960291666667e-19 +
                   dVar55 * -2.692699133333334e-15 +
                   dVar1 * 1.154214865e-11 +
                   dVar36 * -2.50000001 + dVar35 * 25473.6599 + 2.946682924;
      dStack_1ce0 = dVar161 * 2.33577197e-15 +
                    dVar46 * -4.9640387e-11 +
                    dVar55 * 4.978572466666667e-07 +
                    dVar1 * -0.003619950185 +
                    dVar36 * -2.28571772 + dVar35 * 16775.5843 + -6.19435407;
      local_1e38 = dVar161 * -5.8706188e-16 +
                   dVar46 * 7.3288463e-12 +
                   dVar55 * -2.108420466666667e-08 +
                   dVar1 * -0.000274214858 + dVar36 * -3.09288767 + dVar35 * 3858.657 + -1.38380843;
      dStack_1e30 = dVar161 * 2.667543555e-15 +
                    dVar46 * -4.909681483333334e-11 +
                    dVar55 * 4.140760216666667e-07 +
                    dVar1 * -0.00247847763 +
                    dVar36 * -2.77217438 + dVar35 * 4011.91815 + -7.02617054;
      local_1728 = dVar161 * 4.419278200000001e-15 +
                   dVar46 * -8.386767666666666e-11 +
                   dVar55 * 7.370980216666666e-07 +
                   dVar1 * -0.00460000041 +
                   dVar36 * -1.76069008 + dVar35 * -13995.8323 + -11.89563292;
      dStack_1720 = dVar161 * 1.01823858e-15 +
                    dVar46 * -1.9171084e-11 +
                    dVar55 * 1.664709618333334e-07 +
                    dVar1 * -0.001031263715 +
                    dVar36 * -2.71518561 + dVar35 * -14151.8724 + -5.10350211;
      local_1a18 = dVar161 * 9.38637835e-16 +
                   dVar46 * -2.168162908333333e-11 +
                   dVar55 * 2.348243283333333e-07 +
                   dVar1 * -0.00182819646 + dVar36 * -2.87410113 + dVar35 * 46263.604 + -3.29709211;
      dStack_1a10 = dVar161 * 1.08358897e-15 +
                    dVar46 * -1.745587958333333e-11 +
                    dVar55 * 1.263277781666667e-07 +
                    dVar1 * -0.00074154377 +
                    dVar36 * -3.28253784 + dVar35 * -1088.45772 + -2.17069345;
      local_2038 = dVar161 * -6.141684549999999e-17 +
                   dVar46 * 8.348149916666666e-13 +
                   dVar55 * -6.991409816666667e-09 +
                   dVar1 * 4.298705685e-05 +
                   dVar36 * -2.56942078 + dVar35 * 29217.5791 + -2.214917859999999;
      dStack_2030 = dVar161 * 1.698581825e-15 +
                    dVar46 * -3.48255e-11 +
                    dVar55 * 3.353199116666667e-07 +
                    dVar1 * -0.002327943185 +
                    dVar36 * -2.29203842 + dVar35 * 50925.9997 + -6.33446327;
      local_1cb8 = dVar161 * 5.39542675e-16 +
                   dVar46 * -9.520530833333334e-12 +
                   dVar55 * 1.056096916666667e-07 +
                   dVar1 * -0.001119910065 +
                   dVar36 * -4.0172109 + dVar35 * 111.856713 + 0.2321087500000001;
      dStack_1cb0 = dVar161 * -8.4100496e-16 +
                    dVar46 * 8.08683225e-12 +
                    dVar55 * 2.734541966666666e-08 +
                    dVar1 * -0.00108845902 +
                    dVar36 * -3.03399249 + dVar35 * -30004.2971 + -1.93277761;
      local_1c98 = dVar161 * 2.36042082e-15 +
                   dVar46 * -4.362418233333334e-11 +
                   dVar55 * 3.691356733333334e-07 +
                   dVar1 * -0.00220718513 + dVar36 * -3.85746029 + dVar35 * -48759.166 + 1.58582223;
      dStack_1c90 = dVar161 * 5.0907615e-15 +
                    dVar46 * -1.019104458333333e-10 +
                    dVar55 * 9.554763483333333e-07 +
                    dVar1 * -0.00669547335 +
                    dVar36 * -0.074851495 + dVar35 * -9468.34459 + -18.362466505;
      local_15d8 = dVar161 * 6.28530305e-15 +
                   dVar46 * -1.226857691666667e-10 +
                   dVar55 * 1.118463191666667e-06 +
                   dVar1 * -0.00732270755 +
                   dVar36 * -2.03611116 + dVar35 * 4939.88614 + -8.269258140000002;
      dStack_15d0 = dVar161 * 1.056308e-15 +
                    dVar46 * -3.287025833333333e-11 +
                    dVar55 * 4.427306666666667e-07 +
                    dVar1 * -0.0039357485 + dVar36 * -3.770799 + dVar35 * 127.83252 + 0.841224;
      local_1b20 = dVar161 * 7.4820788e-15 +
                   dVar46 * -1.460147408333333e-10 +
                   dVar55 * 1.330344446666667e-06 +
                   dVar1 * -0.0086986361 + dVar36 * -1.95465642 + dVar35 * 12857.52 + -11.50777788;
      local_1818 = dVar161 * 9.5001445e-15 +
                   dVar46 * -1.845100008333333e-10 +
                   dVar55 * 1.67093445e-06 +
                   dVar1 * -0.01084263385 + dVar36 * -1.0718815 + dVar35 * -11426.3932 + -14.0437292
      ;
      local_1e58._0_8_ =
           dVar46 * -8.414198333333333e-12 +
           dVar55 * 9.474600000000001e-08 +
           dVar1 * -0.0007439884 + dVar36 * -2.92664 + dVar35 * -922.7977 + -3.053888;
      dVar108 = 3.3766755e-16;
    }
    else {
      local_1c70 = dVar161 * 3.688058805e-13 +
                   dVar46 * -1.67976745e-09 +
                   dVar55 * 3.2463585e-06 +
                   dVar1 * -0.003990260375 +
                   dVar36 * -2.34433112 + dVar35 * -917.935173 + 1.661320882;
      local_1ce8 = dVar161 * 4.63866166e-23 +
                   dVar46 * -1.917346933333333e-19 +
                   dVar55 * 3.326532733333333e-16 +
                   dVar1 * -3.526664095e-13 + dVar36 * -2.5 + dVar35 * 25473.6599 + 2.946682853;
      dStack_1ce0 = dVar161 * -1.27192867e-13 +
                    dVar46 * 5.725978541666666e-10 +
                    dVar55 * -9.550364266666668e-07 +
                    dVar1 * -0.001005475875 + dVar36 * -3.6735904 + dVar35 * 16444.9988 + 2.06902607
      ;
      local_1e38 = dVar161 * -6.8205735e-14 +
                   dVar46 * 3.234277775e-10 +
                   dVar55 * -7.696564016666666e-07 +
                   dVar1 * 0.00120065876 + dVar36 * -3.99201543 + dVar35 * 3615.08056 + 4.095940888;
      dStack_1e30 = dVar161 * -2.168844325e-13 +
                    dVar46 * 1.109534108333333e-09 +
                    dVar55 * -2.296657433333333e-06 +
                    dVar1 * 0.00162196266 +
                    dVar36 * -4.22118584 + dVar35 * 3839.56496 + 0.8268134100000002;
      local_1728 = dVar161 * -6.5886326e-13 +
                   dVar46 * 3.160710508333333e-09 +
                   dVar55 * -6.220333466666666e-06 +
                   dVar1 * 0.004954166845 + dVar36 * -4.79372315 + dVar35 * -14308.9567 + 4.19091025
      ;
      dStack_1720 = dVar161 * 4.522122495e-14 +
                    dVar46 * -7.558382366666667e-11 +
                    dVar55 * -1.69469055e-07 +
                    dVar1 * 0.00030517684 +
                    dVar36 * -3.57953347 + dVar35 * -14344.086 + 0.07112418999999992;
      local_1a18 = dVar161 * -8.43708595e-14 +
                   dVar46 * 3.209092941666667e-10 +
                   dVar55 * -4.658164016666667e-07 +
                   dVar1 * -0.0004844360715 +
                   dVar36 * -3.76267867 + dVar35 * 46004.0401 + 2.20014682;
      dStack_1a10 = dVar161 * -1.621864185e-13 +
                    dVar46 * 8.067745908333334e-10 +
                    dVar55 * -1.641217001666667e-06 +
                    dVar1 * 0.00149836708 +
                    dVar36 * -3.78245636 + dVar35 * -1063.94356 + 0.1247806300000001;
      local_2038 = dVar161 * -1.056329855e-13 +
                   dVar46 * 5.106721866666666e-10 +
                   dVar55 * -1.107177326666667e-06 +
                   dVar1 * 0.00163965942 + dVar36 * -3.1682671 + dVar35 * 29122.2592 + 1.11633364;
      dStack_2030 = dVar161 * -9.71573685e-14 +
                    dVar46 * 5.573466508333334e-10 +
                    dVar55 * -1.372160366666667e-06 +
                    dVar1 * 0.001183307095 +
                    dVar36 * -4.19860411 + dVar35 * 50496.8163 + 4.967723077;
      local_1cb8 = dVar161 * -4.646125620000001e-13 +
                   dVar46 * 2.02303245e-09 +
                   dVar55 * -3.526381516666666e-06 +
                   dVar1 * 0.002374560255 +
                   dVar36 * -4.30179801 + dVar35 * 294.80804 + 0.5851355599999999;
      dStack_1cb0 = dVar161 * -8.85989085e-14 +
                    dVar46 * 4.57330885e-10 +
                    dVar55 * -1.086733685e-06 +
                    dVar1 * 0.00101821705 +
                    dVar36 * -4.19864056 + dVar35 * -30293.7267 + 5.047672768;
      local_1c98 = dVar161 * 7.184977399999999e-15 +
                   dVar46 * -2.049325183333333e-10 +
                   dVar55 * 1.187260448333333e-06 +
                   dVar1 * -0.004492298385 +
                   dVar36 * -2.35677352 + dVar35 * -48371.9697 + -7.5442787;
      dStack_1c90 = dVar161 * -8.3346978e-13 +
                    dVar46 * 4.039525216666667e-09 +
                    dVar55 * -8.19667665e-06 +
                    dVar1 * 0.0068354894 +
                    dVar36 * -5.14987613 + dVar35 * -10246.6476 + 9.791179889999999;
      local_15d8 = dVar161 * -1.349421865e-12 +
                   dVar46 * 5.763239608333333e-09 +
                   dVar55 * -9.516504866666667e-06 +
                   dVar1 * 0.003785261235 +
                   dVar36 * -3.95920148 + dVar35 * 5089.77593 + -0.1381294799999999;
      dStack_15d0 = dVar161 * -1.037805e-13 +
                    dVar46 * 6.14803e-10 +
                    dVar55 * -8.897453333333333e-07 +
                    dVar1 * -0.0036082975 + dVar36 * -2.106204 + dVar35 * 978.6011 + -11.045973;
      local_1b20 = dVar161 * -1.15254502e-12 +
                   dVar46 * 4.992721716666666e-09 +
                   dVar55 * -8.28571345e-06 +
                   dVar1 * 0.00209329446 +
                   dVar36 * -4.30646568 + dVar35 * 12841.6265 + -0.4007435600000004;
      local_1818 = dVar161 * -1.343428855e-12 +
                   dVar46 * 5.903885708333334e-09 +
                   dVar55 * -9.990638133333334e-06 +
                   dVar1 * 0.00275077135 + dVar36 * -4.29142492 + dVar35 * -11522.2055 + 1.62460176;
      local_1e58._0_8_ =
           dVar46 * -4.701262500000001e-10 +
           dVar55 * 6.605369999999999e-07 +
           dVar1 * -0.0007041202 + dVar36 * -3.298677 + dVar35 * -1020.8999 + -0.6516950000000001;
      dVar108 = 1.222427e-13;
    }
    local_1e58._0_8_ = dVar108 * dVar161 + (double)local_1e58._0_8_;
    dVar38 = dVar35 * dVar35;
    dVar39 = 1.0 / dVar37;
    dVar108 = dVar35 * -745.375;
    if (1000.0 <= dVar1) {
      h_RT[0] = dVar35 * -950.158922 +
                dVar161 * 4.00510752e-15 +
                dVar46 * -4.48915985e-11 +
                dVar55 * 1.66485593e-07 + dVar1 * -2.47012365e-05 + 3.3372792;
      h_RT[1] = dVar35 * 25473.6599 +
                dVar161 * 9.96394714e-23 +
                dVar46 * -1.18378809e-18 +
                dVar55 * 5.38539827e-15 + dVar1 * -1.15421486e-11 + 2.50000001;
      h_RT[2] = dVar35 * 29217.5791 +
                dVar161 * 2.45667382e-16 +
                dVar46 * -2.50444497e-12 +
                dVar55 * 1.39828196e-08 + dVar1 * -4.29870569e-05 + 2.56942078;
      h_RT[3] = dVar35 * -1088.45772 +
                dVar161 * -4.33435588e-15 +
                dVar46 * 5.23676387e-11 +
                dVar55 * -2.52655556e-07 + dVar1 * 0.00074154377 + 3.28253784;
      h_RT[4] = dVar35 * 3858.657 +
                dVar161 * 2.34824752e-15 +
                dVar46 * -2.19865389e-11 +
                dVar55 * 4.21684093e-08 + dVar1 * 0.000274214858 + 3.09288767;
      h_RT[5] = dVar35 * -30004.2971 +
                dVar161 * 3.36401984e-15 +
                dVar46 * -2.42604967e-11 +
                dVar55 * -5.46908393e-08 + dVar1 * 0.00108845902 + 3.03399249;
      h_RT[6] = dVar35 * 111.856713 +
                dVar161 * -2.1581707e-15 +
                dVar46 * 2.85615925e-11 +
                dVar55 * -2.11219383e-07 + dVar1 * 0.00111991006 + 4.0172109;
      h_RT[7] = dVar35 * 46263.604 +
                dVar161 * -3.75455134e-15 +
                dVar46 * 6.50448872e-11 +
                dVar55 * -4.69648657e-07 + dVar1 * 0.00182819646 + 2.87410113;
      h_RT[8] = dVar35 * 50925.9997 +
                dVar161 * -6.7943273e-15 +
                dVar46 * 1.044765e-10 +
                dVar55 * -6.70639823e-07 + dVar1 * 0.00232794318 + 2.29203842;
      h_RT[9] = dVar35 * 16775.5843 +
                dVar161 * -9.34308788e-15 +
                dVar46 * 1.48921161e-10 +
                dVar55 * -9.95714493e-07 + dVar1 * 0.00361995018 + 2.28571772;
      h_RT[10] = dVar35 * -9468.34459 +
                 dVar161 * -2.0363046e-14 +
                 dVar46 * 3.05731338e-10 +
                 dVar55 * -1.9109527e-06 + dVar1 * 0.00669547335 + 0.074851495;
      h_RT[0xb] = dVar35 * -14151.8724 +
                  dVar161 * -4.07295432e-15 +
                  dVar46 * 5.7513252e-11 +
                  dVar55 * -3.32941924e-07 + dVar1 * 0.00103126372 + 2.71518561;
      h_RT[0xc] = dVar35 * -48759.166 +
                  dVar161 * -9.44168328e-15 +
                  dVar46 * 1.30872547e-10 +
                  dVar55 * -7.38271347e-07 + dVar1 * 0.00220718513 + 3.85746029;
      h_RT[0xd] = dVar35 * 4011.91815 +
                  dVar161 * -1.06701742e-14 +
                  dVar46 * 1.47290445e-10 +
                  dVar55 * -8.28152043e-07 + dVar1 * 0.00247847763 + 2.77217438;
      h_RT[0xe] = dVar35 * -13995.8323 +
                  dVar161 * -1.76771128e-14 +
                  dVar46 * 2.5160303e-10 +
                  dVar55 * -1.47419604e-06 + dVar1 * 0.00460000041 + 1.76069008;
      h_RT[0xf] = dVar35 * 127.83252 +
                  dVar161 * -4.225232e-15 +
                  dVar46 * 9.8610775e-11 +
                  dVar55 * -8.85461333e-07 + dVar1 * 0.0039357485 + 3.770799;
      h_RT[0x10] = dVar35 * 4939.88614 +
                   dVar161 * -2.51412122e-14 +
                   dVar46 * 3.68057308e-10 +
                   dVar55 * -2.23692638e-06 + dVar1 * 0.00732270755 + 2.03611116;
      h_RT[0x11] = dVar35 * 12857.52 +
                   dVar161 * -2.99283152e-14 +
                   dVar46 * 4.38044223e-10 +
                   dVar55 * -2.66068889e-06 + dVar1 * 0.0086986361 + 1.95465642;
      h_RT[0x12] = dVar35 * -11426.3932 +
                   dVar161 * -3.8000578e-14 +
                   dVar46 * 5.53530003e-10 +
                   dVar55 * -3.3418689e-06 + dVar1 * 0.0108426339 + 1.0718815;
      dVar80 = dVar161 * -1.3506702e-15 +
               dVar46 * 2.5242595e-11 + dVar55 * -1.89492e-07 + dVar1 * 0.0007439884 + 2.92664;
      dVar40 = -922.7977;
    }
    else {
      h_RT[0] = dVar35 * -917.935173 +
                dVar161 * -1.47522352e-12 +
                dVar46 * 5.03930235e-09 +
                dVar55 * -6.492717e-06 + dVar1 * 0.00399026037 + 2.34433112;
      h_RT[1] = dVar35 * 25473.6599 +
                dVar161 * -1.85546466e-22 +
                dVar46 * 5.7520408e-19 + dVar55 * -6.65306547e-16 + dVar1 * 3.52666409e-13 + 2.5;
      h_RT[2] = dVar35 * 29122.2592 +
                dVar161 * 4.22531942e-13 +
                dVar46 * -1.53201656e-09 +
                dVar55 * 2.21435465e-06 + dVar1 * -0.00163965942 + 3.1682671;
      h_RT[3] = dVar35 * -1063.94356 +
                dVar161 * 6.48745674e-13 +
                dVar46 * -2.42032377e-09 +
                dVar55 * 3.282434e-06 + dVar1 * -0.00149836708 + 3.78245636;
      h_RT[4] = dVar35 * 3615.08056 +
                dVar161 * 2.7282294e-13 +
                dVar46 * -9.70283332e-10 +
                dVar55 * 1.5393128e-06 + dVar1 * -0.00120065876 + 3.99201543;
      h_RT[5] = dVar35 * -30293.7267 +
                dVar161 * 3.54395634e-13 +
                dVar46 * -1.37199266e-09 +
                dVar55 * 2.17346737e-06 + dVar1 * -0.00101821705 + 4.19864056;
      h_RT[6] = dVar35 * 294.80804 +
                dVar161 * 1.85845025e-12 +
                dVar46 * -6.06909735e-09 +
                dVar55 * 7.05276303e-06 + dVar1 * -0.00237456025 + 4.30179801;
      h_RT[7] = dVar35 * 46004.0401 +
                dVar161 * 3.37483438e-13 +
                dVar46 * -9.62727883e-10 +
                dVar55 * 9.31632803e-07 + dVar1 * 0.000484436072 + 3.76267867;
      h_RT[8] = dVar35 * 50496.8163 +
                dVar161 * 3.88629474e-13 +
                dVar46 * -1.67203995e-09 +
                dVar55 * 2.74432073e-06 + dVar1 * -0.0011833071 + 4.19860411;
      h_RT[9] = dVar35 * 16444.9988 +
                dVar161 * 5.08771468e-13 +
                dVar46 * -1.71779356e-09 +
                dVar55 * 1.91007285e-06 + dVar1 * 0.00100547588 + 3.6735904;
      h_RT[10] = dVar35 * -10246.6476 +
                 dVar161 * 3.33387912e-12 +
                 dVar46 * -1.21185757e-08 +
                 dVar55 * 1.63933533e-05 + dVar1 * -0.0068354894 + 5.14987613;
      h_RT[0xb] = dVar35 * -14344.086 +
                  dVar161 * -1.808849e-13 +
                  dVar46 * 2.26751471e-10 +
                  dVar55 * 3.3893811e-07 + dVar1 * -0.00030517684 + 3.57953347;
      h_RT[0xc] = dVar35 * -48371.9697 +
                  dVar161 * -2.87399096e-14 +
                  dVar46 * 6.14797555e-10 +
                  dVar55 * -2.3745209e-06 + dVar1 * 0.00449229839 + 2.35677352;
      h_RT[0xd] = dVar35 * 3839.56496 +
                  dVar161 * 8.6753773e-13 +
                  dVar46 * -3.32860233e-09 +
                  dVar55 * 4.59331487e-06 + dVar1 * -0.00162196266 + 4.22118584;
      h_RT[0xe] = dVar35 * -14308.9567 +
                  dVar161 * 2.63545304e-12 +
                  dVar46 * -9.48213152e-09 +
                  dVar55 * 1.24406669e-05 + dVar1 * -0.00495416684 + 4.79372315;
      h_RT[0xf] = dVar35 * 978.6011 +
                  dVar161 * 4.15122e-13 +
                  dVar46 * -1.844409e-09 + dVar55 * 1.77949067e-06 + dVar1 * 0.0036082975 + 2.106204
      ;
      h_RT[0x10] = dVar35 * 5089.77593 +
                   dVar161 * 5.39768746e-12 +
                   dVar46 * -1.72897188e-08 +
                   dVar55 * 1.90330097e-05 + dVar1 * -0.00378526124 + 3.95920148;
      h_RT[0x11] = dVar35 * 12841.6265 +
                   dVar161 * 4.61018008e-12 +
                   dVar46 * -1.49781651e-08 +
                   dVar55 * 1.65714269e-05 + dVar1 * -0.00209329446 + 4.30646568;
      h_RT[0x12] = dVar35 * -11522.2055 +
                   dVar161 * 5.37371542e-12 +
                   dVar46 * -1.77116571e-08 +
                   dVar55 * 1.99812763e-05 + dVar1 * -0.00275077135 + 4.29142492;
      dVar80 = dVar161 * -4.889708e-13 +
               dVar46 * 1.41037875e-09 + dVar55 * -1.321074e-06 + dVar1 * 0.0007041202 + 3.298677;
      dVar40 = -1020.8999;
    }
    h_RT[0x13] = dVar40 * dVar35 + dVar80;
    dVar154 = dVar161 * -0.0 +
              dVar46 * -0.0 + dVar55 * -0.0 + dVar1 * -0.0 + dVar36 * -2.5 + dVar108 + -1.866;
    h_RT[0x14] = dVar161 * 0.0 + dVar46 * 0.0 + dVar55 * 0.0 + dVar1 * 0.0 + 2.5 + dVar108;
    dVar40 = c[0xb] * 0.5 + c[5] * 5.0 + c[0] + local_1de8 + c[10] + c[0xc];
    dVar56 = c[0x12] + c[0x12];
    dVar80 = c[0x14] * -0.30000000000000004;
    dVar81 = c[1] * c[7];
    dVar57 = dVar35 * -0.0;
    dVar36 = dVar36 * -0.8 + dVar57;
    dVar41 = exp(dVar36);
    dVar41 = dVar41 * 25000000000.0;
    local_1df8._8_8_ = 0;
    local_1df8._0_8_ = dVar38 * 0.0;
    dVar58 = dVar35 * -0.8 + dVar38 * 0.0;
    dVar42 = exp((double)local_1e28._0_8_ * -3.14 + dVar35 * -618.9564989398057);
    dVar40 = dVar42 * 3.2e+27 * (((dVar80 + dVar56 + dVar40) * 1e-12) / dVar41);
    dVar99 = ((dVar35 * -3.14 + dVar38 * 618.9564989398057) - dVar58) * 0.43429448190325176;
    dVar80 = log10(dVar40);
    dVar42 = exp(dVar1 / -78.0);
    dVar56 = exp(dVar1 / -1995.0);
    dVar43 = exp(dVar35 * -5590.0);
    dVar59 = dVar42 * 0.31999999999999995 + dVar56 * 0.68 + dVar43;
    dVar44 = log10(dVar59);
    dVar60 = dVar44 * -1.27 + 0.75;
    dVar80 = dVar44 * -0.67 + -0.4 + dVar80;
    dVar100 = 1.0 / (dVar80 * -0.14 + dVar60);
    dVar80 = dVar80 * dVar100;
    dVar82 = 1.0 / (dVar80 * dVar80 + 1.0);
    dVar45 = pow(10.0,dVar44 * dVar82);
    RVar144 = c[9];
    dVar61 = (dVar44 + dVar44) * dVar82 * dVar82 * dVar80 * dVar100;
    dVar100 = -dVar60 * dVar61 * dVar100;
    dVar44 = exp((local_1a18 + local_1ce8) - dStack_1ce0);
    RVar15 = h_RT[9];
    RVar16 = h_RT[1];
    RVar14 = c[10];
    dVar44 = dVar41 / (dVar44 * dVar39);
    dVar45 = dVar45 * (dVar40 / (dVar40 + 1.0));
    dVar60 = (dVar41 * dVar81 - RVar144 * dVar44) * dVar45;
    local_1f08[1] = local_1f08[1] - dVar60;
    local_1f08[7] = local_1f08[7] - dVar60;
    local_1f08[9] = dVar60 + local_1f08[9];
    local_18d8[0] = 0.0;
    local_18d8[1] = c[7] * dVar41 * dVar45 + 0.0;
    local_18d8[2] = 0.0;
    local_18d8[3] = 0.0;
    local_18d8[6] = 0.0;
    local_18d8[4] = 0.0;
    local_18d8[5] = 0.0;
    local_18d8[7] = dVar41 * dVar45 * c[1] + 0.0;
    local_18d8[8] = 0.0;
    local_18d8[9] = 0.0 - dVar44 * dVar45;
    local_18d8[0x12] = 0.0;
    local_18d8[0x13] = 0.0;
    local_18d8[0x10] = 0.0;
    local_18d8[0x11] = 0.0;
    local_18d8[0xe] = 0.0;
    local_18d8[0xf] = 0.0;
    local_18d8[0xc] = 0.0;
    local_18d8[0xd] = 0.0;
    local_18d8[0x14] = 0.0;
    local_18d8[10] = 0.0;
    local_18d8[0xb] = 0.0;
    pdVar31 = local_15c8 + 9;
    for (lVar29 = 0; lVar29 != 0x15; lVar29 = lVar29 + 1) {
      dVar116 = local_18d8[lVar29];
      pdVar31[-8] = pdVar31[-8] - dVar116;
      pdVar31[-2] = pdVar31[-2] - dVar116;
      *pdVar31 = dVar116 + *pdVar31;
      pdVar31 = pdVar31 + 0x16;
    }
    dVar40 = dVar45 * (dVar41 * dVar58 * dVar81 +
                      -(dVar58 - ((h_RT[9] - (h_RT[7] + h_RT[1])) + 1.0) * dVar35) * dVar44 *
                      RVar144) +
             ((dVar61 * dVar80 * -1.27 + dVar100 * -0.67 + dVar82) *
              (dVar43 * 5590.0 * dVar38 +
              (dVar56 * 0.68) / -1995.0 + (dVar42 * 0.31999999999999995) / -78.0) *
              (0.43429448190325176 / dVar59) + dVar99 * dVar100 + dVar99 / (dVar40 + 1.0)) *
             2.302585092994046 * dVar60;
    pdVar31 = local_15c8 + 10;
    local_758[1] = local_758[1] - dVar40;
    local_758[7] = local_758[7] - dVar40;
    local_758[9] = dVar40 + local_758[9];
    dVar40 = c[0xb] * 0.5 + c[5] * 5.0 + c[0] + local_1de8 + c[10] + c[0xc];
    dVar56 = c[0x12] + c[0x12];
    dVar80 = c[0x14] * -0.30000000000000004;
    dVar116 = c[1] * RVar144;
    dVar41 = exp((double)local_1e28._0_8_ * -0.63 + dVar35 * -192.73198300320777);
    dVar41 = dVar41 * 12700000000.0;
    dVar60 = dVar35 * -0.63 + dVar38 * 192.73198300320777;
    dVar42 = exp((double)local_1e28._0_8_ * -4.76 + dVar35 * -1227.8486645635169);
    dVar40 = dVar42 * 2.477e+33 * (((dVar80 + dVar56 + dVar40) * 1e-12) / dVar41);
    dVar82 = ((dVar35 * -4.76 + dVar38 * 1227.8486645635169) - dVar60) * 0.43429448190325176;
    dVar80 = log10(dVar40);
    dVar42 = exp(dVar1 / -74.0);
    dVar56 = exp(dVar1 / -2941.0);
    dVar43 = exp(dVar35 * -6964.0);
    local_1e48 = dVar42 * 0.21699999999999997 + dVar56 * 0.783 + dVar43;
    dVar44 = log10(local_1e48);
    dVar61 = dVar44 * -1.27 + 0.75;
    dVar80 = dVar44 * -0.67 + -0.4 + dVar80;
    dVar99 = 1.0 / (dVar80 * -0.14 + dVar61);
    dVar80 = dVar80 * dVar99;
    local_1e18 = 1.0 / (dVar80 * dVar80 + 1.0);
    dVar45 = pow(10.0,dVar44 * local_1e18);
    dVar59 = 0.43429448190325176 / local_1e48;
    dVar81 = (dVar44 + dVar44) * local_1e18 * local_1e18 * dVar80 * dVar99;
    dVar99 = -dVar61 * dVar81 * dVar99;
    dVar61 = dVar99 * -0.67 + local_1e18;
    local_1dc8 = dStack_1c90;
    dStack_1dc0 = dStack_1c90;
    dVar44 = exp((dStack_1ce0 + local_1ce8) - dStack_1c90);
    dVar44 = dVar41 / (dVar44 * dVar39);
    dVar45 = dVar45 * (dVar40 / (dVar40 + 1.0));
    dVar100 = (dVar41 * dVar116 - RVar14 * dVar44) * dVar45;
    local_1f08[1] = local_1f08[1] - dVar100;
    local_1f08[9] = local_1f08[9] - dVar100;
    local_1f08[10] = dVar100 + local_1f08[10];
    local_18d8[0] = 0.0;
    local_18d8[1] = c[9] * dVar41 * dVar45 + 0.0;
    local_18d8[6] = 0.0;
    local_18d8[7] = 0.0;
    local_18d8[4] = 0.0;
    local_18d8[5] = 0.0;
    local_18d8[2] = 0.0;
    local_18d8[3] = 0.0;
    local_18d8[8] = 0.0;
    local_18d8[9] = dVar41 * dVar45 * c[1] + 0.0;
    local_18d8[10] = 0.0 - dVar44 * dVar45;
    local_18d8[0x13] = 0.0;
    local_18d8[0x14] = 0.0;
    local_18d8[0x11] = 0.0;
    local_18d8[0x12] = 0.0;
    local_18d8[0xf] = 0.0;
    local_18d8[0x10] = 0.0;
    local_18d8[0xd] = 0.0;
    local_18d8[0xe] = 0.0;
    local_18d8[0xb] = 0.0;
    local_18d8[0xc] = 0.0;
    for (lVar29 = 0; lVar29 != 0x15; lVar29 = lVar29 + 1) {
      dVar139 = local_18d8[lVar29];
      pdVar31[-9] = pdVar31[-9] - dVar139;
      pdVar31[-1] = pdVar31[-1] - dVar139;
      *pdVar31 = dVar139 + *pdVar31;
      pdVar31 = pdVar31 + 0x16;
    }
    dVar40 = dVar45 * (dVar60 * dVar41 * dVar116 +
                      -(dVar60 - ((h_RT[10] - (RVar16 + RVar15)) + 1.0) * dVar35) * dVar44 * RVar14)
             + ((dVar81 * dVar80 * -1.27 + dVar61) *
                (dVar43 * 6964.0 * dVar38 +
                (dVar56 * 0.783) / -2941.0 + (dVar42 * 0.21699999999999997) / -74.0) * dVar59 +
                dVar82 * dVar99 + dVar82 / (dVar40 + 1.0)) * 2.302585092994046 * dVar100;
    pdVar31 = local_15c8 + 0xe;
    local_758[1] = local_758[1] - dVar40;
    local_758[9] = local_758[9] - dVar40;
    dVar56 = c[0xb] * 0.5 + c[5] * 5.0 + c[0] + local_1de8 + c[10] + c[0xc];
    local_708._0_8_ = dVar40 + (double)local_708._0_8_;
    dVar40 = c[0x12] + c[0x12];
    dVar42 = c[0x14] * -0.30000000000000004;
    dVar139 = c[1] * c[0xd];
    dVar80 = exp((double)local_1e28._0_8_ * 0.48 + dVar35 * 130.8363331092272);
    dVar80 = dVar80 * 1090000.0;
    dVar60 = dVar35 * 0.48 + dVar38 * -130.8363331092272;
    dVar41 = exp((double)local_1e28._0_8_ * -2.57 + dVar35 * -717.083748771726);
    dVar41 = dVar41 * 1.35e+24 * (((dVar42 + dVar40 + dVar56) * 1e-12) / dVar80);
    dVar100 = ((dVar35 * -2.57 + dVar38 * 717.083748771726) - dVar60) * 0.43429448190325176;
    dVar42 = log10(dVar41);
    dVar56 = exp(dVar1 / -271.0);
    dVar43 = exp(dVar1 / -2755.0);
    dVar44 = exp(dVar35 * -6570.0);
    dVar61 = dVar56 * 0.21760000000000002 + dVar43 * 0.7824 + dVar44;
    dVar45 = log10(dVar61);
    dVar81 = dVar45 * -1.27 + 0.75;
    dVar42 = dVar45 * -0.67 + -0.4 + dVar42;
    dVar116 = 1.0 / (dVar42 * -0.14 + dVar81);
    dVar42 = dVar42 * dVar116;
    dVar99 = 1.0 / (dVar42 * dVar42 + 1.0);
    dVar59 = pow(10.0,dVar45 * dVar99);
    RVar144 = c[0xe];
    dVar40 = dStack_1e30;
    dVar82 = (dVar45 + dVar45) * dVar99 * dVar99 * dVar42 * dVar116;
    dVar116 = -dVar81 * dVar82 * dVar116;
    dVar45 = exp((dStack_1e30 + local_1ce8) - local_1728);
    RVar16 = h_RT[0xe];
    RVar14 = h_RT[1];
    dVar45 = dVar80 / (dVar45 * dVar39);
    dVar59 = dVar59 * (dVar41 / (dVar41 + 1.0));
    dVar81 = (dVar80 * dVar139 - RVar144 * dVar45) * dVar59;
    local_1f08[1] = local_1f08[1] - dVar81;
    local_1f08[0xd] = local_1f08[0xd] - dVar81;
    local_1f08[0xe] = dVar81 + local_1f08[0xe];
    local_18d8[0] = 0.0;
    local_18d8[1] = c[0xd] * dVar80 * dVar59 + 0.0;
    local_18d8[10] = 0.0;
    local_18d8[0xb] = 0.0;
    local_18d8[8] = 0.0;
    local_18d8[9] = 0.0;
    local_18d8[6] = 0.0;
    local_18d8[7] = 0.0;
    local_18d8[0xc] = 0.0;
    local_18d8[4] = 0.0;
    local_18d8[5] = 0.0;
    local_18d8[2] = 0.0;
    local_18d8[3] = 0.0;
    local_18d8[0xd] = dVar80 * dVar59 * c[1] + 0.0;
    local_18d8[0xe] = 0.0 - dVar45 * dVar59;
    local_18d8[0x13] = 0.0;
    local_18d8[0x14] = 0.0;
    local_18d8[0x11] = 0.0;
    local_18d8[0x12] = 0.0;
    local_18d8[0xf] = 0.0;
    local_18d8[0x10] = 0.0;
    for (lVar29 = 0; lVar29 != 0x15; lVar29 = lVar29 + 1) {
      dVar101 = local_18d8[lVar29];
      pdVar31[-0xd] = pdVar31[-0xd] - dVar101;
      pdVar31[-1] = pdVar31[-1] - dVar101;
      *pdVar31 = dVar101 + *pdVar31;
      pdVar31 = pdVar31 + 0x16;
    }
    dVar80 = dVar59 * (dVar60 * dVar80 * dVar139 +
                      -(dVar60 - ((h_RT[0xe] - (h_RT[0xd] + h_RT[1])) + 1.0) * dVar35) * dVar45 *
                      RVar144) +
             ((dVar82 * dVar42 * -1.27 + dVar116 * -0.67 + dVar99) *
              (dVar44 * 6570.0 * dVar38 +
              (dVar43 * 0.7824) / -2755.0 + (dVar56 * 0.21760000000000002) / -271.0) *
              (0.43429448190325176 / dVar61) + dVar100 * dVar116 + dVar100 / (dVar41 + 1.0)) *
             2.302585092994046 * dVar81;
    pdVar31 = local_15c8 + 0xf;
    local_758[1] = local_758[1] - dVar80;
    dStack_6f0 = dStack_6f0 - dVar80;
    dStack_6e8 = dVar80 + dStack_6e8;
    dVar80 = c[0xb] * 0.5 + c[5] * 5.0 + c[0] + local_1de8 + c[10] + c[0xc];
    dVar43 = c[0x12] + c[0x12];
    dVar147 = c[1] * RVar144;
    dVar82 = (double)local_1e28._0_8_ * 0.454;
    dVar41 = exp(dVar35 * -1308.3633310922721 + dVar82);
    dVar41 = dVar41 * 540000.0;
    dVar42 = dVar38 * 1308.3633310922721 + dVar35 * 0.454;
    dVar56 = exp((double)local_1e28._0_8_ * -4.8 + dVar35 * -2797.884661874243);
    dVar56 = dVar56 * 2.2e+30 * (((dVar43 + dVar80) * 1e-12) / dVar41);
    dVar100 = ((dVar35 * -4.8 + dVar38 * 2797.884661874243) - dVar42) * 0.43429448190325176;
    dVar43 = log10(dVar56);
    dVar44 = exp(dVar1 / -94.0);
    dVar45 = exp(dVar1 / -1555.0);
    dVar59 = exp(dVar35 * -4200.0);
    local_1e18 = dVar44 * 0.242 + dVar45 * 0.758 + dVar59;
    dVar60 = log10(local_1e18);
    local_1e48 = dVar60 * -1.27 + 0.75;
    dVar43 = dVar60 * -0.67 + -0.4 + dVar43;
    dVar116 = 1.0 / (dVar43 * -0.14 + local_1e48);
    dVar43 = dVar43 * dVar116;
    local_1e08 = 1.0 / (dVar43 * dVar43 + 1.0);
    dVar61 = pow(10.0,dVar60 * local_1e08);
    dVar80 = dStack_15d0;
    RVar144 = c[0xf];
    dVar81 = 0.43429448190325176 / local_1e18;
    dVar99 = (dVar60 + dVar60) * local_1e08 * local_1e08 * dVar43 * dVar116;
    dVar116 = -local_1e48 * dVar99 * dVar116;
    dVar139 = dVar116 * -0.67 + local_1e08;
    dVar60 = exp((local_1728 + local_1ce8) - dStack_15d0);
    dVar60 = dVar41 / (dVar60 * dVar39);
    dVar61 = dVar61 * (dVar56 / (dVar56 + 1.0));
    dVar101 = (dVar41 * dVar147 - RVar144 * dVar60) * dVar61;
    local_1f08[1] = local_1f08[1] - dVar101;
    local_1f08[0xe] = local_1f08[0xe] - dVar101;
    local_1f08[0xf] = dVar101 + local_1f08[0xf];
    local_18d8[0] = 0.0;
    local_18d8[1] = c[0xe] * dVar41 * dVar61 + 0.0;
    local_18d8[0xc] = 0.0;
    local_18d8[0xd] = 0.0;
    local_18d8[10] = 0.0;
    local_18d8[0xb] = 0.0;
    local_18d8[8] = 0.0;
    local_18d8[9] = 0.0;
    local_18d8[6] = 0.0;
    local_18d8[7] = 0.0;
    local_18d8[4] = 0.0;
    local_18d8[5] = 0.0;
    local_18d8[2] = 0.0;
    local_18d8[3] = 0.0;
    local_18d8[0xe] = dVar41 * dVar61 * c[1] + 0.0;
    local_18d8[0xf] = 0.0 - dVar60 * dVar61;
    local_18d8[0x12] = 0.0;
    local_18d8[0x13] = 0.0;
    local_18d8[0x10] = 0.0;
    local_18d8[0x11] = 0.0;
    local_18d8[0x14] = 0.0;
    for (lVar29 = 0; lVar29 != 0x15; lVar29 = lVar29 + 1) {
      dVar102 = local_18d8[lVar29];
      pdVar31[-0xe] = pdVar31[-0xe] - dVar102;
      pdVar31[-1] = pdVar31[-1] - dVar102;
      *pdVar31 = dVar102 + *pdVar31;
      pdVar31 = pdVar31 + 0x16;
    }
    dVar41 = dVar61 * (dVar42 * dVar41 * dVar147 +
                      -(dVar42 - ((h_RT[0xf] - (RVar14 + RVar16)) + 1.0) * dVar35) * dVar60 *
                      RVar144) +
             ((dVar99 * dVar43 * -1.27 + dVar139) *
              (dVar59 * 4200.0 * dVar38 + (dVar45 * 0.758) / -1555.0 + (dVar44 * 0.242) / -94.0) *
              dVar81 + dVar100 * dVar116 + dVar100 / (dVar56 + 1.0)) * 2.302585092994046 * dVar101;
    pdVar31 = local_15c8 + 0x11;
    local_758[1] = local_758[1] - dVar41;
    dStack_6e8 = dStack_6e8 - dVar41;
    dStack_6e0 = dVar41 + dStack_6e0;
    dVar44 = c[0xb] * 0.5 + c[5] * 5.0 + c[0] + local_1de8 + c[10] + c[0xc];
    dVar41 = c[0x12] + c[0x12];
    dVar43 = c[0x14] * -0.30000000000000004;
    dVar101 = c[1] * c[0x10];
    dVar42 = exp(dVar82 + dVar35 * -915.8543317645905);
    dVar42 = dVar42 * 1080000.0;
    dVar61 = dVar35 * 0.454 + dVar38 * 915.8543317645905;
    dVar56 = exp((double)local_1e28._0_8_ * -7.62 + dVar35 * -3507.4201606588986);
    dVar41 = dVar56 * 1.2e+42 * (((dVar43 + dVar41 + dVar44) * 1e-12) / dVar42);
    dVar100 = ((dVar35 * -7.62 + dVar38 * 3507.4201606588986) - dVar61) * 0.43429448190325176;
    dVar56 = log10(dVar41);
    dVar43 = exp(dVar1 / -210.0);
    dVar44 = exp(dVar1 / -984.0);
    dVar45 = exp(dVar35 * -4374.0);
    dVar81 = dVar43 * 0.024700000000000055 + dVar44 * 0.9753 + dVar45;
    dVar59 = log10(dVar81);
    dVar82 = dVar59 * -1.27 + 0.75;
    dVar56 = dVar59 * -0.67 + -0.4 + dVar56;
    dVar116 = 1.0 / (dVar56 * -0.14 + dVar82);
    dVar56 = dVar56 * dVar116;
    local_1e48 = 1.0 / (dVar56 * dVar56 + 1.0);
    dVar60 = pow(10.0,dVar59 * local_1e48);
    RVar144 = c[0x11];
    dVar99 = (dVar59 + dVar59) * local_1e48 * local_1e48 * dVar56 * dVar116;
    dVar116 = -dVar82 * dVar99 * dVar116;
    dVar82 = dVar116 * -0.67 + local_1e48;
    dVar59 = exp((local_15d8 + local_1ce8) - local_1b20);
    RVar15 = h_RT[0x11];
    RVar16 = h_RT[1];
    RVar14 = c[0x12];
    dVar59 = dVar42 / (dVar59 * dVar39);
    dVar60 = dVar60 * (dVar41 / (dVar41 + 1.0));
    dVar139 = (dVar42 * dVar101 - RVar144 * dVar59) * dVar60;
    local_1f08[1] = local_1f08[1] - dVar139;
    auStack_1e88._0_8_ = (double)auStack_1e88._0_8_ - dVar139;
    auStack_1e88._8_8_ = dVar139 + (double)auStack_1e88._8_8_;
    local_18d8[0] = 0.0;
    local_18d8[1] = c[0x10] * dVar42 * dVar60 + 0.0;
    local_18d8[0xe] = 0.0;
    local_18d8[0xf] = 0.0;
    local_18d8[0xc] = 0.0;
    local_18d8[0xd] = 0.0;
    local_18d8[10] = 0.0;
    local_18d8[0xb] = 0.0;
    local_18d8[8] = 0.0;
    local_18d8[9] = 0.0;
    local_18d8[6] = 0.0;
    local_18d8[7] = 0.0;
    local_18d8[4] = 0.0;
    local_18d8[5] = 0.0;
    local_18d8[2] = 0.0;
    local_18d8[3] = 0.0;
    local_18d8[0x10] = dVar42 * dVar60 * c[1] + 0.0;
    local_18d8[0x11] = 0.0 - dVar59 * dVar60;
    local_18d8[0x12] = 0.0;
    local_18d8[0x13] = 0.0;
    local_18d8[0x14] = 0.0;
    for (lVar29 = 0; lVar29 != 0x15; lVar29 = lVar29 + 1) {
      dVar147 = local_18d8[lVar29];
      pdVar31[-0x10] = pdVar31[-0x10] - dVar147;
      pdVar31[-1] = pdVar31[-1] - dVar147;
      *pdVar31 = dVar147 + *pdVar31;
      pdVar31 = pdVar31 + 0x16;
    }
    dVar41 = dVar60 * (dVar61 * dVar42 * dVar101 +
                      -(dVar61 - ((h_RT[0x11] - (h_RT[0x10] + h_RT[1])) + 1.0) * dVar35) * dVar59 *
                      RVar144) +
             ((dVar99 * dVar56 * -1.27 + dVar82) *
              (dVar45 * 4374.0 * dVar38 +
              (dVar44 * 0.9753) / -984.0 + (dVar43 * 0.024700000000000055) / -210.0) *
              (0.43429448190325176 / dVar81) + dVar100 * dVar116 + dVar100 / (dVar41 + 1.0)) *
             2.302585092994046 * dVar139;
    pdVar31 = local_15c8 + 0x12;
    local_758[1] = local_758[1] - dVar41;
    dStack_6d8 = dStack_6d8 - dVar41;
    dStack_6d0 = dVar41 + dStack_6d0;
    dVar44 = c[0xb] * 0.5 + c[5] * 5.0 + c[0] + local_1de8 + c[10] + c[0xc];
    dVar41 = c[0x12] + c[0x12];
    dVar43 = c[0x14] * -0.30000000000000004;
    dVar139 = c[1] * RVar144;
    dVar42 = exp((double)local_1e28._0_8_ * -0.99 + dVar35 * -795.0823319714576);
    dVar42 = dVar42 * 521000000000.0;
    dVar60 = dVar35 * -0.99 + dVar38 * 795.0823319714576;
    dVar56 = exp((double)local_1e28._0_8_ * -7.08 + dVar35 * -3364.003410904553);
    dVar41 = dVar56 * 1.99e+41 * (((dVar43 + dVar41 + dVar44) * 1e-12) / dVar42);
    dVar100 = ((dVar35 * -7.08 + dVar38 * 3364.003410904553) - dVar60) * 0.43429448190325176;
    dVar56 = log10(dVar41);
    dVar43 = exp(dVar1 / -125.0);
    dVar44 = exp(dVar1 / -2219.0);
    dVar45 = exp(dVar35 * -6882.0);
    dVar61 = dVar43 * 0.15780000000000005 + dVar44 * 0.8422 + dVar45;
    dVar59 = log10(dVar61);
    dVar81 = dVar59 * -1.27 + 0.75;
    dVar56 = dVar59 * -0.67 + -0.4 + dVar56;
    local_1e48 = 1.0 / (dVar56 * -0.14 + dVar81);
    local_1e18 = dVar56 * local_1e48;
    dVar99 = 1.0 / (local_1e18 * local_1e18 + 1.0);
    dVar56 = pow(10.0,dVar59 * dVar99);
    dVar82 = (dVar59 + dVar59) * dVar99 * dVar99 * local_1e18 * local_1e48;
    dVar81 = -dVar81 * dVar82 * local_1e48;
    dVar82 = dVar82 * local_1e18;
    dVar59 = exp((local_1ce8 + local_1b20) - local_1818);
    dVar59 = dVar42 / (dVar59 * dVar39);
    dVar56 = dVar56 * (dVar41 / (dVar41 + 1.0));
    dVar116 = (dVar42 * dVar139 - RVar14 * dVar59) * dVar56;
    local_1f08[1] = local_1f08[1] - dVar116;
    auStack_1e88._8_8_ = (double)auStack_1e88._8_8_ - dVar116;
    local_1e78 = dVar116 + local_1e78;
    local_18d8[0] = 0.0;
    local_18d8[1] = c[0x11] * dVar42 * dVar56 + 0.0;
    local_18d8[0xe] = 0.0;
    local_18d8[0xf] = 0.0;
    local_18d8[0xc] = 0.0;
    local_18d8[0xd] = 0.0;
    local_18d8[10] = 0.0;
    local_18d8[0xb] = 0.0;
    local_18d8[8] = 0.0;
    local_18d8[9] = 0.0;
    local_18d8[0x10] = 0.0;
    local_18d8[6] = 0.0;
    local_18d8[7] = 0.0;
    local_18d8[4] = 0.0;
    local_18d8[5] = 0.0;
    local_18d8[2] = 0.0;
    local_18d8[3] = 0.0;
    local_18d8[0x11] = dVar42 * dVar56 * c[1] + 0.0;
    local_18d8[0x12] = 0.0 - dVar59 * dVar56;
    local_18d8[0x13] = 0.0;
    local_18d8[0x14] = 0.0;
    for (lVar29 = 0; lVar29 != 0x15; lVar29 = lVar29 + 1) {
      dVar101 = local_18d8[lVar29];
      pdVar31[-0x11] = pdVar31[-0x11] - dVar101;
      pdVar31[-1] = pdVar31[-1] - dVar101;
      *pdVar31 = dVar101 + *pdVar31;
      pdVar31 = pdVar31 + 0x16;
    }
    dVar41 = dVar56 * (dVar60 * dVar42 * dVar139 +
                      -(dVar60 - ((h_RT[0x12] - (RVar16 + RVar15)) + 1.0) * dVar35) * dVar59 *
                      RVar14) +
             ((dVar82 * -1.27 + dVar81 * -0.67 + dVar99) *
              (dVar45 * 6882.0 * dVar38 +
              (dVar44 * 0.8422) / -2219.0 + (dVar43 * 0.15780000000000005) / -125.0) *
              (0.43429448190325176 / dVar61) + dVar100 * dVar81 + dVar100 / (dVar41 + 1.0)) *
             2.302585092994046 * dVar116;
    pdVar31 = local_15c8 + 0xe;
    local_758[1] = local_758[1] - dVar41;
    dStack_6d0 = dStack_6d0 - dVar41;
    local_6c8 = dVar41 + local_6c8;
    dVar44 = c[0xb] * 0.5 + c[5] * 5.0 + local_1de8 + c[0] + c[10] + c[0xc];
    dVar41 = c[0x12] + c[0x12];
    dVar45 = c[0x14] * -0.30000000000000004;
    dVar139 = c[0] * c[0xb];
    dVar82 = (double)local_1e28._0_8_ * 1.5;
    dVar56 = exp(dVar35 * -40056.04659805571 + dVar82);
    dVar56 = dVar56 * 43.0;
    dVar43 = dVar38 * 40056.04659805571 + dVar35 * 1.5;
    dVar42 = exp((double)local_1e28._0_8_ * -3.42 + dVar35 * -42446.32576062813);
    dVar44 = dVar42 * 5.07e+27 * (((dVar45 + dVar41 + dVar44) * 1e-12) / dVar56);
    dVar101 = ((dVar35 * -3.42 + dVar38 * 42446.32576062813) - dVar43) * 0.43429448190325176;
    dVar45 = log10(dVar44);
    dVar59 = exp(dVar1 / -197.0);
    dVar60 = exp(dVar1 / -1540.0);
    dVar61 = exp(dVar35 * -10300.0);
    dVar99 = dVar59 * 0.06799999999999995 + dVar60 * 0.932 + dVar61;
    dVar81 = log10(dVar99);
    dVar100 = dVar81 * -1.27 + 0.75;
    dVar45 = dVar81 * -0.67 + -0.4 + dVar45;
    dVar147 = 1.0 / (dVar45 * -0.14 + dVar100);
    dVar45 = dVar45 * dVar147;
    local_1e48 = 1.0 / (dVar45 * dVar45 + 1.0);
    dVar41 = pow(10.0,dVar81 * local_1e48);
    dVar42 = dStack_1720;
    RVar144 = c[0xe];
    dVar116 = (dVar81 + dVar81) * local_1e48 * local_1e48 * dVar45 * dVar147;
    dVar147 = -dVar100 * dVar116 * dVar147;
    dVar100 = dVar147 * -0.67 + local_1e48;
    dVar81 = exp((dStack_1720 + local_1c70) - local_1728);
    RVar14 = c[0x12];
    dVar102 = dVar56 / (dVar81 * dVar39);
    dVar41 = dVar41 * (dVar44 / (dVar44 + 1.0));
    dVar81 = (dVar56 * dVar139 - RVar144 * dVar102) * dVar41;
    local_1f08[0] = local_1f08[0] - dVar81;
    local_1f08[0xb] = local_1f08[0xb] - dVar81;
    local_1f08[0xe] = dVar81 + local_1f08[0xe];
    local_18d8[0] = dVar56 * dVar41 * c[0xb] + 0.0;
    local_18d8[1] = 0.0;
    local_18d8[2] = 0.0;
    local_18d8[3] = 0.0;
    local_18d8[4] = 0.0;
    local_18d8[5] = 0.0;
    local_18d8[6] = 0.0;
    local_18d8[7] = 0.0;
    local_18d8[8] = 0.0;
    local_18d8[9] = 0.0;
    local_18d8[10] = 0.0;
    local_18d8[0xb] = dVar56 * dVar41 * c[0] + 0.0;
    local_18d8[0xc] = 0.0;
    local_18d8[0xd] = 0.0;
    local_18d8[0xe] = 0.0 - dVar102 * dVar41;
    local_18d8[0x13] = 0.0;
    local_18d8[0x14] = 0.0;
    local_18d8[0x11] = 0.0;
    local_18d8[0x12] = 0.0;
    local_18d8[0xf] = 0.0;
    local_18d8[0x10] = 0.0;
    for (lVar29 = 0; lVar29 != 0x15; lVar29 = lVar29 + 1) {
      dVar103 = local_18d8[lVar29];
      pdVar31[-0xe] = pdVar31[-0xe] - dVar103;
      pdVar31[-3] = pdVar31[-3] - dVar103;
      *pdVar31 = dVar103 + *pdVar31;
      pdVar31 = pdVar31 + 0x16;
    }
    dVar41 = dVar41 * (dVar43 * dVar56 * dVar139 +
                      -(dVar43 - ((h_RT[0xe] - (h_RT[0] + h_RT[0xb])) + 1.0) * dVar35) * dVar102 *
                      RVar144) +
             ((dVar116 * dVar45 * -1.27 + dVar100) *
              (dVar61 * 10300.0 * dVar38 +
              (dVar60 * 0.932) / -1540.0 + (dVar59 * 0.06799999999999995) / -197.0) *
              (0.43429448190325176 / dVar99) + dVar101 * dVar147 + dVar101 / (dVar44 + 1.0)) *
             2.302585092994046 * dVar81;
    pdVar31 = local_15c8 + 9;
    local_758[0] = local_758[0] - dVar41;
    local_708._8_8_ = (double)local_708._8_8_ - dVar41;
    dStack_6e8 = dVar41 + dStack_6e8;
    dVar44 = c[0xb] * 0.5 + c[5] * 5.0 + c[0] + local_1de8 + c[10] + c[0xc];
    dVar41 = c[0x12] + c[0x12];
    dVar45 = c[0x14] * -0.30000000000000004;
    dVar100 = c[9] * c[9];
    dVar56 = exp((double)local_1e28._0_8_ * -0.97 + dVar35 * -311.9943327989264);
    dVar56 = dVar56 * 21200000000.0;
    dVar81 = dVar35 * -0.97 + dVar38 * 311.9943327989264;
    dVar43 = exp((double)local_1e28._0_8_ * -9.67 + dVar35 * -3130.0076613053584);
    dVar41 = dVar43 * 1.77e+50 * (((dVar45 + dVar41 + dVar44) * 1e-12) / dVar56);
    dVar101 = ((dVar35 * -9.67 + dVar38 * 3130.0076613053584) - dVar81) * 0.43429448190325176;
    dVar43 = log10(dVar41);
    dVar44 = exp(dVar1 / -151.0);
    dVar45 = exp(dVar1 / -1038.0);
    dVar59 = exp(dVar35 * -4970.0);
    dVar99 = dVar44 * 0.4675 + dVar45 * 0.5325 + dVar59;
    local_1e18 = log10(dVar99);
    dVar61 = local_1e18 * -1.27 + 0.75;
    dVar43 = local_1e18 * -0.67 + -0.4 + dVar43;
    dVar60 = 1.0 / (dVar43 * -0.14 + dVar61);
    local_1e48 = dVar43 * dVar60;
    dVar116 = 1.0 / (local_1e48 * local_1e48 + 1.0);
    dVar43 = pow(10.0,local_1e18 * dVar116);
    dVar139 = (local_1e18 + local_1e18) * dVar116 * dVar116 * local_1e48 * dVar60;
    dVar60 = -dVar61 * dVar139 * dVar60;
    dVar139 = dVar139 * local_1e48;
    dVar61 = exp((dStack_1ce0 + dStack_1ce0) - local_1818);
    RVar22 = c[0x14];
    RVar20 = c[0x12];
    RVar18 = c[0xc];
    RVar15 = c[0xb];
    RVar16 = c[10];
    RVar144 = c[5];
    dVar61 = dVar56 / (dVar61 * dVar39);
    dVar43 = dVar43 * (dVar41 / (dVar41 + 1.0));
    dVar147 = (dVar56 * dVar100 - RVar14 * dVar61) * dVar43;
    local_1f08[9] = local_1f08[9] - (dVar147 + dVar147);
    local_1e78 = dVar147 + local_1e78;
    local_18d8[0] = 0.0;
    local_18d8[1] = 0.0;
    local_18d8[2] = 0.0;
    local_18d8[3] = 0.0;
    local_18d8[8] = 0.0;
    local_18d8[4] = 0.0;
    local_18d8[5] = 0.0;
    local_18d8[6] = 0.0;
    local_18d8[7] = 0.0;
    local_18d8[9] = (dVar56 * dVar43 + dVar56 * dVar43) * c[9] + 0.0;
    local_18d8[0x10] = 0.0;
    local_18d8[0x11] = 0.0;
    local_18d8[0xe] = 0.0;
    local_18d8[0xf] = 0.0;
    local_18d8[0xc] = 0.0;
    local_18d8[0xd] = 0.0;
    local_18d8[10] = 0.0;
    local_18d8[0xb] = 0.0;
    local_18d8[0x12] = 0.0 - dVar61 * dVar43;
    local_18d8[0x13] = 0.0;
    local_18d8[0x14] = 0.0;
    for (lVar29 = 0; lVar29 != 0x15; lVar29 = lVar29 + 1) {
      dVar102 = local_18d8[lVar29];
      *pdVar31 = *pdVar31 - (dVar102 + dVar102);
      pdVar31[9] = dVar102 + pdVar31[9];
      pdVar31 = pdVar31 + 0x16;
    }
    dVar41 = dVar43 * (dVar81 * dVar56 * dVar100 +
                      -(dVar81 - ((h_RT[0x12] - (h_RT[9] + h_RT[9])) + 1.0) * dVar35) * dVar61 *
                      RVar14) +
             (dVar60 * dVar101 +
              (dVar139 * -1.27 + dVar60 * -0.67 + dVar116) *
              (dVar59 * 4970.0 * dVar38 + (dVar45 * 0.5325) / -1038.0 + (dVar44 * 0.4675) / -151.0)
              * (0.43429448190325176 / dVar99) + dVar101 / (dVar41 + 1.0)) * 2.302585092994046 *
             dVar147;
    pdVar31 = local_15c8 + 1;
    local_758[9] = local_758[9] - (dVar41 + dVar41);
    local_6c8 = dVar41 + local_6c8;
    dVar59 = c[0] + local_1de8;
    dVar44 = c[0xb] * 0.5 + c[5] * 5.0 + dVar59 + c[10] + c[0xc];
    dVar41 = c[0x12] + c[0x12];
    local_1828 = dVar57 - (double)local_1e28._0_8_;
    dVar56 = exp(local_1828);
    RVar21 = c[4];
    dVar56 = dVar56 * 500000.0;
    local_1dd8 = (double)local_1df8._0_8_ - dVar35;
    dStack_1dd0 = (double)local_1df8._8_8_;
    dVar43 = exp((local_2038 + local_1ce8) - local_1e38);
    RVar24 = h_RT[2];
    RVar23 = h_RT[1];
    RVar19 = c[3];
    RVar17 = c[2];
    RVar14 = c[1];
    dVar45 = dVar56 / (dVar43 * dVar39);
    dVar43 = RVar22 * -0.30000000000000004 + dVar44 + dVar41;
    local_18d8[3] = c[2] * c[1] * dVar56 + -dVar45 * RVar21;
    dVar60 = dVar43 * local_18d8[3];
    dVar44 = local_1f08[1] - dVar60;
    dVar61 = local_1f08[2] - dVar60;
    local_1f08[1] = dVar44;
    local_1f08[2] = dVar61;
    local_1f08[4] = dVar60 + local_1f08[4];
    local_18d8[1] = dVar56 * dVar43 * c[2] + local_18d8[3];
    local_18d8[2] = dVar56 * dVar43 * c[1] + local_18d8[3];
    local_18d8[4] = local_18d8[3] - dVar45 * dVar43;
    local_18d8[5] = local_18d8[3] * 6.0;
    local_18d8[8] = local_18d8[3];
    local_18d8[9] = local_18d8[3];
    local_18d8[6] = local_18d8[3];
    local_18d8[7] = local_18d8[3];
    local_18d8[0] = local_18d8[3] * 2.0;
    local_18d8[10] = local_18d8[0];
    local_18d8[0xb] = local_18d8[3] * 1.5;
    local_18d8[0xc] = local_18d8[0];
    local_18d8[0xf] = local_18d8[3];
    local_18d8[0x10] = local_18d8[3];
    local_18d8[0xd] = local_18d8[3];
    local_18d8[0xe] = local_18d8[3];
    local_18d8[0x11] = local_18d8[3];
    local_18d8[0x12] = local_18d8[3] * 3.0;
    local_18d8[0x13] = local_18d8[3];
    local_18d8[0x14] = local_18d8[3] * 0.7;
    for (lVar29 = 0; lVar29 != 0x15; lVar29 = lVar29 + 1) {
      dVar60 = local_18d8[lVar29];
      *pdVar31 = *pdVar31 - dVar60;
      pdVar31[1] = pdVar31[1] - dVar60;
      pdVar31[3] = dVar60 + pdVar31[3];
      pdVar31 = pdVar31 + 0x16;
    }
    dVar43 = (c[2] * c[1] * local_1dd8 * dVar56 -
             (local_1dd8 - ((h_RT[4] - (h_RT[1] + h_RT[2])) + 1.0) * dVar35) * dVar45 * RVar21) *
             dVar43;
    pdVar31 = local_15c8 + 0xc;
    local_758[1] = local_758[1] - dVar43;
    local_758[2] = local_758[2] - dVar43;
    local_758[4] = dVar43 + local_758[4];
    dVar41 = RVar22 * -0.5 +
             dVar41 + RVar18 * 2.5 + RVar15 * 0.5 + RVar144 * 5.0 + c[3] * 5.0 + dVar59 + RVar16;
    dVar59 = c[2] * RVar15;
    dVar56 = exp((double)local_1e28._0_8_ * 0.0 + dVar35 * -1509.64999741416);
    dVar56 = dVar56 * 602.0;
    local_1e48 = dVar35 * 0.0 + dVar38 * 1509.64999741416;
    dVar43 = exp((dVar42 + local_2038) - local_1c98);
    dVar43 = dVar56 / (dVar43 * dVar39);
    local_18d8[1] = dVar56 * dVar59 - RVar18 * dVar43;
    dVar45 = dVar41 * local_18d8[1];
    local_1f08[2] = dVar61 - dVar45;
    local_1f08[0xb] = local_1f08[0xb] - dVar45;
    local_1f08[0xc] = dVar45 + local_1f08[0xc];
    local_18d8[0] = local_18d8[1] + local_18d8[1];
    local_18d8[2] = dVar56 * dVar41 * RVar15 + local_18d8[1];
    local_18d8[3] = local_18d8[1] * 6.0;
    local_18d8[4] = local_18d8[1];
    local_18d8[5] = local_18d8[1] * 6.0;
    local_18d8[8] = local_18d8[1];
    local_18d8[9] = local_18d8[1];
    local_18d8[6] = local_18d8[1];
    local_18d8[7] = local_18d8[1];
    local_18d8[10] = local_18d8[1] + local_18d8[1];
    local_18d8[0xb] = local_18d8[1] * 1.5 + RVar17 * dVar56 * dVar41;
    local_18d8[0xc] = local_18d8[1] * 3.5 + -dVar43 * dVar41;
    local_18d8[0xf] = local_18d8[1];
    local_18d8[0x10] = local_18d8[1];
    local_18d8[0xd] = local_18d8[1];
    local_18d8[0xe] = local_18d8[1];
    local_18d8[0x11] = local_18d8[1];
    local_18d8[0x12] = local_18d8[1] * 3.0;
    local_18d8[0x13] = local_18d8[1];
    local_18d8[0x14] = local_18d8[1] * 0.5;
    for (lVar29 = 0; lVar29 != 0x15; lVar29 = lVar29 + 1) {
      dVar45 = local_18d8[lVar29];
      pdVar31[-10] = pdVar31[-10] - dVar45;
      pdVar31[-1] = pdVar31[-1] - dVar45;
      *pdVar31 = dVar45 + *pdVar31;
      pdVar31 = pdVar31 + 0x16;
    }
    dVar41 = dVar41 * (local_1e48 * dVar56 * dVar59 -
                      (local_1e48 - ((h_RT[0xc] - (RVar24 + h_RT[0xb])) + 1.0) * dVar35) * dVar43 *
                      RVar18);
    pdVar31 = local_15c8 + 1;
    local_758[2] = local_758[2] - dVar41;
    local_708._8_8_ = (double)local_708._8_8_ - dVar41;
    local_6f8 = dVar41 + local_6f8;
    dVar45 = ((RVar20 * 0.5 + RVar18 * 0.5 + RVar15 * -0.25 + ((local_1de8 - RVar19) - RVar144)) -
             c[0x13]) - RVar22;
    dVar61 = RVar19 * RVar14;
    dVar41 = exp((double)local_1e28._0_8_ * -0.86 + dVar57);
    dVar41 = dVar41 * 2800000.0;
    dVar56 = dVar35 * -0.86 + (double)local_1df8._0_8_;
    local_1e18 = c[6];
    local_1e48 = (dStack_1a10 + local_1ce8) - local_1cb8;
    dStack_1e40 = dStack_1a10;
    dVar43 = exp(local_1e48);
    RVar15 = h_RT[6];
    RVar16 = h_RT[3];
    dVar59 = dVar41 / (dVar43 * dVar39);
    dVar81 = RVar23 + h_RT[3];
    local_18d8[0] = dVar41 * dVar61 - local_1e18 * dVar59;
    local_18d8[1] = dVar41 * dVar45 * RVar19 + local_18d8[0];
    local_18d8[2] = local_18d8[0];
    local_18d8[3] = dVar41 * dVar45 * RVar14;
    local_18d8[4] = local_18d8[0];
    local_18d8[5] = 0.0;
    local_18d8[6] = local_18d8[0] - dVar59 * dVar45;
    local_18d8[9] = local_18d8[0];
    local_18d8[10] = local_18d8[0];
    local_18d8[7] = local_18d8[0];
    local_18d8[8] = local_18d8[0];
    local_18d8[0xb] = local_18d8[0] * 0.75;
    local_18d8[0xc] = local_18d8[0] * 1.5;
    local_18d8[0xf] = local_18d8[0];
    local_18d8[0x10] = local_18d8[0];
    local_18d8[0xd] = local_18d8[0];
    local_18d8[0xe] = local_18d8[0];
    dVar60 = dVar45 * local_18d8[0];
    local_18d8[0x11] = local_18d8[0];
    dVar44 = dVar44 - dVar60;
    local_1f08[1] = dVar44;
    local_18d8[0x12] = local_18d8[0] * 1.5;
    local_18d8[0x13] = 0.0;
    local_18d8[0x14] = 0.0;
    dVar43 = local_1f08[3] - dVar60;
    local_1f08[3] = dVar43;
    dVar60 = dVar60 + local_1f08[6];
    local_1f08[6] = dVar60;
    for (lVar29 = 0; lVar29 != 0x15; lVar29 = lVar29 + 1) {
      dVar99 = local_18d8[lVar29];
      *pdVar31 = *pdVar31 - dVar99;
      pdVar31[2] = pdVar31[2] - dVar99;
      pdVar31[5] = dVar99 + pdVar31[5];
      pdVar31 = pdVar31 + 0x16;
    }
    dVar45 = dVar45 * (dVar56 * dVar41 * dVar61 -
                      (dVar56 - ((h_RT[6] - dVar81) + 1.0) * dVar35) * dVar59 * local_1e18);
    pdVar31 = local_15c8 + 1;
    dVar139 = local_758[1] - dVar45;
    dVar41 = RVar19 * RVar19 * RVar14;
    dVar56 = (double)local_1e28._0_8_ * -1.72 + dVar57;
    local_1e08 = exp(dVar56);
    local_1e08 = local_1e08 * 300000000.0;
    dVar59 = dVar35 * -1.72 + (double)local_1df8._0_8_;
    dVar99 = RVar19 * local_1e18;
    dVar100 = exp(local_1e48);
    dVar100 = local_1e08 / (dVar100 * dVar39);
    dVar128 = local_1e08 * dVar41 - dVar99 * dVar100;
    dVar147 = dVar59 * local_1e08 * dVar41 -
              (dVar59 - (((RVar15 + RVar16) - (RVar16 + RVar16 + RVar23)) + 1.0) * dVar35) * dVar100
              * dVar99;
    dVar129 = RVar19 * RVar19 * local_1e08;
    dVar101 = (local_1e08 * RVar14 + local_1e08 * RVar14) * RVar19 - dVar100 * local_1e18;
    local_1e08 = dVar101 + (double)local_1390._8_8_;
    dVar117 = -dVar100 * RVar19;
    dVar41 = exp((double)local_1e28._0_8_ * -0.76 + dVar57);
    dVar41 = dVar41 * 9380000.0;
    dVar99 = dVar35 * -0.76 + (double)local_1df8._0_8_;
    dVar100 = RVar144 * local_1e18;
    dVar116 = exp(local_1e48);
    RVar18 = c[0x13];
    RVar15 = c[6];
    RVar16 = c[3];
    RVar14 = c[1];
    dVar116 = dVar41 / (dVar116 * dVar39);
    local_1e18 = h_RT[6];
    dVar118 = dVar41 * dVar61 * RVar144 - dVar100 * dVar116;
    dVar148 = dVar99 * dVar41 * dVar61 * RVar144 -
              (dVar99 - (((h_RT[5] + h_RT[6]) - (dVar81 + h_RT[5])) + 1.0) * dVar35) * dVar116 *
              dVar100;
    dVar140 = dVar41 * c[3] * c[5];
    dVar99 = -dVar116 * c[5];
    dVar141 = c[5] * dVar41 * c[1];
    dVar102 = dVar141 + local_1e08;
    dVar41 = dVar41 * c[1] * c[3] - dVar116 * c[6];
    local_1250 = local_1250 - dVar41;
    local_1240 = local_1240 - dVar41;
    local_1228 = dVar41 + local_1228;
    dVar61 = c[3] * c[1];
    local_1e08 = dVar61 * c[0x13];
    local_658 = exp(dVar56);
    local_658 = local_658 * 375000000.0;
    dVar41 = RVar15 * RVar18;
    dVar56 = exp(local_1e48);
    RVar20 = c[0x14];
    dVar56 = local_658 / (dVar56 * dVar39);
    dVar81 = h_RT[1] + h_RT[3];
    dVar119 = local_658 * local_1e08 - dVar41 * dVar56;
    dVar41 = dVar59 * local_658 * local_1e08 -
             (dVar59 - (((h_RT[0x13] + local_1e18) - (dVar81 + h_RT[0x13])) + 1.0) * dVar35) *
             dVar56 * dVar41;
    dVar100 = local_658 * RVar16 * RVar18;
    local_1e08 = dVar100 + dVar140 + dVar129 + local_14e8;
    dVar116 = RVar18 * local_658 * RVar14;
    local_1e18 = dVar116 + dVar102;
    dVar102 = -dVar56 * RVar18;
    dVar56 = local_658 * RVar14 * RVar16 - dVar56 * RVar15;
    local_8b0 = local_8b0 - dVar56;
    local_8a0 = local_8a0 - dVar56;
    local_888 = dVar56 + local_888;
    dVar61 = dVar61 * c[0x14];
    dVar36 = exp(dVar36);
    RVar15 = c[6];
    dVar36 = dVar36 * 700000.0;
    dVar56 = c[6] * RVar20;
    dVar59 = exp(local_1e48);
    RVar16 = c[5];
    RVar14 = c[1];
    RVar144 = c[0];
    dVar59 = dVar36 / (dVar59 * dVar39);
    dVar103 = dVar36 * dVar61 - dVar56 * dVar59;
    dVar58 = dVar58 * dVar36 * dVar61 -
             (dVar58 - (((h_RT[0x14] + h_RT[6]) - (dVar81 + h_RT[0x14])) + 1.0) * dVar35) * dVar59 *
             dVar56;
    local_1f08[3] = (((dVar43 - dVar128) - dVar118) - dVar119) - dVar103;
    local_1f08[6] = dVar103 + dVar119 + dVar118 + dVar128 + dVar60;
    local_14e8 = dVar36 * c[3] * RVar20;
    auStack_1510._0_8_ = ((((double)auStack_1510._0_8_ - dVar129) - dVar140) - dVar100) - local_14e8
    ;
    local_1500 = (((local_1500 - dVar129) - dVar140) - dVar100) - local_14e8;
    local_14e8 = local_14e8 + local_1e08;
    dVar56 = RVar20 * dVar36 * c[1];
    local_13b0 = (((local_13b0 - dVar101) - dVar141) - dVar116) - dVar56;
    local_13a0 = (((local_13a0 - dVar101) - dVar141) - dVar116) - dVar56;
    local_1390._8_8_ = dVar56 + local_1e18;
    dVar56 = -dVar59 * RVar20;
    local_11a0 = (((local_11a0 - dVar117) - dVar99) - dVar102) - dVar56;
    local_1190 = (((local_1190 - dVar117) - dVar99) - dVar102) - dVar56;
    dStack_1178 = dVar56 + dVar102 + dVar99 + dVar117 + dStack_1178;
    dVar36 = dVar36 * c[1] * c[3] - dVar59 * RVar15;
    local_800 = local_800 - dVar36;
    local_7f0 = local_7f0 - dVar36;
    local_7d8 = dVar36 + local_7d8;
    local_758[1] = (((dVar139 - dVar147) - dVar148) - dVar41) - dVar58;
    local_758[3] = ((((local_758[3] - dVar45) - dVar147) - dVar148) - dVar41) - dVar58;
    local_758[6] = dVar58 + dVar41 + dVar148 + dVar147 + dVar45 + local_758[6];
    dVar45 = RVar20 * -0.37 + c[0x12] + c[0x12] + ((((local_1de8 - c[0]) - c[5]) + c[10]) - c[0xc]);
    dVar59 = c[1] * c[1];
    dVar36 = exp(local_1828);
    dVar36 = dVar36 * 1000000.0;
    dVar41 = (local_1ce8 + local_1ce8) - local_1c70;
    dVar56 = exp(dVar41);
    RVar15 = h_RT[0];
    dVar56 = dVar36 / (dVar56 * dVar39);
    dVar43 = h_RT[1] + h_RT[1];
    local_18d8[2] = dVar36 * dVar59 - RVar144 * dVar56;
    dVar58 = dVar45 * local_18d8[2];
    dVar60 = local_1f08[0] + dVar58;
    dVar44 = ((((dVar44 - dVar128) - dVar118) - dVar119) - dVar103) - (dVar58 + dVar58);
    local_18d8[0] = -dVar56 * dVar45;
    local_18d8[1] = (dVar36 * dVar45 + dVar36 * dVar45) * RVar14 + local_18d8[2];
    local_18d8[3] = local_18d8[2];
    local_18d8[4] = local_18d8[2];
    local_18d8[5] = 0.0;
    local_18d8[8] = local_18d8[2];
    local_18d8[9] = local_18d8[2];
    local_18d8[6] = local_18d8[2];
    local_18d8[7] = local_18d8[2];
    local_18d8[10] = local_18d8[2] + local_18d8[2];
    local_18d8[0xb] = local_18d8[2];
    local_18d8[0xc] = 0.0;
    local_18d8[0xf] = local_18d8[2];
    local_18d8[0x10] = local_18d8[2];
    local_18d8[0xd] = local_18d8[2];
    local_18d8[0xe] = local_18d8[2];
    local_18d8[0x11] = local_18d8[2];
    local_18d8[0x12] = local_18d8[2] * 3.0;
    local_18d8[0x13] = local_18d8[2];
    local_18d8[0x14] = local_18d8[2] * 0.63;
    local_1f08[0] = dVar60;
    local_1f08[1] = dVar44;
    for (lVar29 = 0; lVar29 != 0x15; lVar29 = lVar29 + 1) {
      dVar58 = local_18d8[lVar29];
      pdVar31[-1] = pdVar31[-1] + dVar58;
      *pdVar31 = *pdVar31 - (dVar58 + dVar58);
      pdVar31 = pdVar31 + 0x16;
    }
    dVar45 = dVar45 * (local_1dd8 * dVar36 * dVar59 -
                      (local_1dd8 - ((h_RT[0] - dVar43) + 1.0) * dVar35) * dVar56 * RVar144);
    pdVar31 = local_15c8 + 5;
    dVar56 = local_758[0] + dVar45;
    dVar45 = local_758[1] - (dVar45 + dVar45);
    dVar36 = exp((double)local_1e28._0_8_ * -0.6 + dVar57);
    dVar36 = dVar36 * 90000.0;
    dVar58 = dVar35 * -0.6 + (double)local_1df8._0_8_;
    dVar61 = exp(dVar41);
    dVar61 = dVar36 / (dVar61 * dVar39);
    dVar119 = dVar36 * dVar59 * RVar144 - RVar144 * RVar144 * dVar61;
    dVar128 = dVar58 * dVar36 * dVar59 * RVar144 -
              (dVar58 - (((RVar15 + RVar15) - (dVar43 + RVar15)) + 1.0) * dVar35) * dVar61 *
              RVar144 * RVar144;
    local_1dd8 = c[1];
    local_1e48 = c[1] * c[1];
    dStack_1e40 = 0.0;
    dVar58 = dVar36 * local_1e48 + dVar61 * -2.0 * RVar144;
    local_1e08 = local_15c8[0] + dVar58;
    dVar139 = local_15c8[1] - (dVar58 + dVar58);
    dVar118 = (dVar36 * RVar144 + dVar36 * RVar144) * c[1];
    local_1828 = (double)auStack_1510._0_8_ - (dVar118 + dVar118);
    local_668 = exp((double)local_1e28._0_8_ * -1.25 + dVar57);
    dVar58 = dVar35 * -1.25 + (double)local_1df8._0_8_;
    local_15e8 = exp(dVar41);
    dVar36 = local_1250;
    RVar20 = c[0xc];
    RVar14 = c[0];
    dVar43 = dVar43 + h_RT[5];
    dVar59 = h_RT[5] + RVar15;
    dVar61 = local_1e48 * c[0xc];
    dVar101 = (double)local_1e28._0_8_ + (double)local_1e28._0_8_;
    dVar81 = exp(dVar57 - dVar101);
    dVar81 = dVar81 * 550000000.0;
    dVar99 = dVar35 + dVar35;
    local_1e18 = (double)local_1df8._0_8_ - dVar99;
    dStack_1e10 = (double)local_1df8._8_8_;
    dVar41 = exp(dVar41);
    RVar17 = h_RT[1];
    RVar18 = c[5];
    RVar15 = c[1];
    dVar147 = dVar81 / (dVar41 * dVar39);
    dVar129 = local_1e18 * dVar81 * dVar61 -
              (local_1e18 -
              (((h_RT[0xc] + h_RT[0]) - (h_RT[1] + h_RT[1] + h_RT[0xc])) + 1.0) * dVar35) * dVar147
              * RVar14 * RVar20;
    dVar140 = -dVar147 * RVar20;
    dVar41 = (dVar81 + dVar81) * c[1] * RVar20;
    dVar100 = c[1] * c[1] * dVar81 - dVar147 * RVar14;
    local_d88 = local_d88 + dVar100;
    local_d80 = local_d80 - (dVar100 + dVar100);
    dVar102 = c[0x14] * -0.62 +
              c[0x12] + c[0x12] + c[5] * 2.65 + RVar14 * -0.27 + local_1de8 + c[10];
    local_15f8 = c[4];
    uStack_15f0 = 0;
    dVar100 = exp(dVar57 - dVar101);
    dVar116 = exp((local_1e38 + local_1ce8) - dStack_1cb0);
    RVar19 = h_RT[5];
    RVar22 = c[0xd];
    dVar103 = local_1e18 - ((h_RT[5] - (RVar17 + h_RT[4])) + 1.0) * dVar35;
    local_658 = dVar103;
    uStack_650 = dStack_1e10;
    dVar117 = local_668 * 60000000.0;
    dVar100 = dVar100 * 22000000000.0;
    auVar90._8_8_ = dVar116 * dVar39;
    auVar90._0_8_ = local_15e8 * dVar39;
    auVar89._8_8_ = dVar100;
    auVar89._0_8_ = dVar117;
    auVar90 = divpd(auVar89,auVar90);
    dVar39 = auVar90._0_8_;
    dVar148 = dVar58 * dVar117 * RVar16 * local_1e48 -
              (dVar58 - ((dVar59 - dVar43) + 1.0) * dVar35) * dVar39 * RVar144 * RVar16;
    dVar43 = auVar90._8_8_;
    dVar58 = dVar117 * RVar16 * local_1e48 - RVar144 * RVar16 * dVar39;
    local_18d8[2] = dVar100 * local_15f8 * RVar15 - RVar18 * dVar43;
    local_18d8[0] = local_18d8[2] * 0.73;
    local_18d8[1] = local_15f8 * dVar100 * dVar102 + local_18d8[2];
    local_18d8[3] = local_18d8[2];
    local_18d8[4] = local_18d8[2] + RVar15 * dVar100 * dVar102;
    local_18d8[5] = -dVar43 * dVar102 + local_18d8[2] * 3.65;
    local_18d8[6] = local_18d8[2];
    local_18d8[7] = local_18d8[2];
    local_18d8[8] = local_18d8[2];
    local_18d8[9] = local_18d8[2];
    local_18d8[10] = local_18d8[2] + local_18d8[2];
    local_18d8[0xb] = local_18d8[2];
    local_18d8[0xc] = local_18d8[2];
    local_18d8[0xd] = local_18d8[2];
    local_18d8[0xe] = local_18d8[2];
    local_18d8[0xf] = local_18d8[2];
    local_18d8[0x10] = local_18d8[2];
    local_18d8[0x11] = local_18d8[2];
    local_18d8[0x12] = local_18d8[2] * 3.0;
    dVar116 = dVar102 * local_18d8[2];
    local_18d8[0x13] = local_18d8[2];
    dVar59 = RVar16 * -dVar39;
    dVar141 = (dVar117 + dVar117) * local_1dd8 * RVar16;
    dVar39 = local_1e48 * dVar117 + RVar14 * -dVar39;
    local_1258 = local_1258 + dVar39;
    local_1250 = dVar36 - (dVar39 + dVar39);
    dVar39 = dVar81 * dVar61 - RVar14 * RVar20 * dVar147;
    local_15c8[0] = local_1e08 + dVar59 + dVar140;
    local_15c8[1] = (dVar139 - (dVar59 + dVar59)) - (dVar140 + dVar140);
    local_15c8[0x16] = local_15c8[0x16] + dVar118 + dVar141 + dVar41;
    auStack_1510._0_8_ = (local_1828 - (dVar141 + dVar141)) - (dVar41 + dVar41);
    local_758[0] = dVar56 + dVar128 + dVar148 + dVar129;
    local_758[1] = ((dVar45 - (dVar128 + dVar128)) - (dVar148 + dVar148)) - (dVar129 + dVar129);
    dVar36 = (((dVar44 - (dVar119 + dVar119)) - (dVar58 + dVar58)) - (dVar39 + dVar39)) - dVar116;
    local_1f08[0] = dVar60 + dVar119 + dVar58 + dVar39;
    local_1f08[1] = dVar36;
    local_1f08[4] = local_1f08[4] - dVar116;
    local_1f08[5] = dVar116 + local_1f08[5];
    local_18d8[0x14] = local_18d8[2] * 0.38;
    for (lVar29 = 0; lVar29 != 0x15; lVar29 = lVar29 + 1) {
      dVar39 = local_18d8[lVar29];
      pdVar31[-4] = pdVar31[-4] - dVar39;
      pdVar31[-1] = pdVar31[-1] - dVar39;
      *pdVar31 = dVar39 + *pdVar31;
      pdVar31 = pdVar31 + 0x16;
    }
    dVar102 = dVar102 * (local_15f8 * RVar15 * local_1e18 * dVar100 - dVar43 * dVar103 * RVar18);
    pdVar31 = local_15c8 + 0xd;
    local_758[1] = local_758[1] - dVar102;
    local_758[4] = local_758[4] - dVar102;
    local_758[5] = dVar102 + local_758[5];
    dVar60 = RVar18 * c[0xd];
    dVar39 = dVar35 * -8554.68331868024 - (double)local_1e28._0_8_;
    dVar41 = exp(dVar39);
    RVar14 = c[0xb];
    dVar41 = dVar41 * 2244000000000.0;
    dVar56 = dVar38 * 8554.68331868024 - dVar35;
    dVar45 = RVar15 * RVar18 * c[0xb];
    dVar43 = (-local_1ce8 - dVar42) + dVar40;
    dVar44 = exp(dVar43);
    RVar144 = c[0];
    dVar58 = dVar41 / (dVar44 * dVar37);
    dVar59 = dVar41 * dVar60 - dVar45 * dVar58;
    dVar44 = dVar56 * dVar41 * dVar60 -
             (dVar56 - (((RVar19 + h_RT[1] + h_RT[0xb]) - (h_RT[0xd] + RVar19)) + -1.0) * dVar35) *
             dVar58 * dVar45;
    local_1f08[1] = dVar36 + dVar59;
    local_1f08[0xb] = local_1f08[0xb] + dVar59;
    local_1f08[0xd] = local_1f08[0xd] - dVar59;
    dVar36 = RVar18 * -dVar58 * RVar14;
    auStack_1510._0_8_ = (double)auStack_1510._0_8_ + dVar36;
    local_14c0 = local_14c0 + dVar36;
    local_14b0 = local_14b0 - dVar36;
    dVar36 = -dVar58 * RVar15;
    dVar45 = dVar41 * RVar22 + RVar14 * dVar36;
    local_1250 = local_1250 + dVar45;
    local_1200 = local_1200 + dVar45;
    local_11f0 = local_11f0 - dVar45;
    dVar36 = dVar36 * RVar18;
    local_e30 = local_e30 + dVar36;
    dStack_de0 = dStack_de0 + dVar36;
    local_dd0 = local_dd0 - dVar36;
    dVar41 = dVar41 * RVar18;
    local_cd0 = local_cd0 + dVar41;
    local_c80 = local_c80 + dVar41;
    local_c70 = local_c70 - dVar41;
    local_758[1] = local_758[1] + dVar44;
    local_708._8_8_ = (double)local_708._8_8_ + dVar44;
    dStack_6f0 = dStack_6f0 - dVar44;
    dVar36 = c[0x12] + c[0x12] + RVar14 * 0.5 + ((local_1de8 + c[0]) - RVar18) + c[10] + c[0xc];
    dVar39 = exp(dVar39);
    RVar14 = c[1];
    dVar39 = dVar39 * 187000000000.0;
    local_1de8 = c[0xb];
    dVar41 = c[1] * c[0xb];
    dVar43 = exp(dVar43);
    RVar16 = h_RT[1];
    dVar43 = dVar39 / (dVar43 * dVar37);
    local_18d8[2] = dVar39 * RVar22 - dVar41 * dVar43;
    dVar45 = dVar36 * local_18d8[2];
    dVar44 = local_1f08[1] + dVar45;
    local_1f08[1] = dVar44;
    local_1f08[0xb] = local_1f08[0xb] + dVar45;
    local_1f08[0xd] = local_1f08[0xd] - dVar45;
    local_18d8[0] = local_18d8[2] + local_18d8[2];
    local_18d8[1] = local_1de8 * -dVar43 * dVar36 + local_18d8[2];
    local_18d8[3] = local_18d8[2];
    local_18d8[4] = local_18d8[2];
    local_18d8[5] = 0.0;
    local_18d8[8] = local_18d8[2];
    local_18d8[9] = local_18d8[2];
    local_18d8[6] = local_18d8[2];
    local_18d8[7] = local_18d8[2];
    local_18d8[10] = local_18d8[0];
    local_18d8[0xb] = local_18d8[2] * 1.5 + -dVar43 * dVar36 * RVar14;
    local_18d8[0xc] = local_18d8[0];
    local_18d8[0xd] = dVar39 * dVar36 + local_18d8[2];
    local_18d8[0x10] = local_18d8[2];
    local_18d8[0x11] = local_18d8[2];
    local_18d8[0xe] = local_18d8[2];
    local_18d8[0xf] = local_18d8[2];
    local_18d8[0x12] = local_18d8[2] * 3.0;
    local_18d8[0x13] = local_18d8[2];
    local_18d8[0x14] = local_18d8[2];
    for (lVar29 = 0; lVar29 != 0x15; lVar29 = lVar29 + 1) {
      dVar45 = local_18d8[lVar29];
      pdVar31[-0xc] = pdVar31[-0xc] + dVar45;
      pdVar31[-2] = pdVar31[-2] + dVar45;
      *pdVar31 = *pdVar31 - dVar45;
      pdVar31 = pdVar31 + 0x16;
    }
    dVar36 = dVar36 * (dVar56 * dVar39 * RVar22 -
                      (dVar56 - (((h_RT[0xb] + h_RT[1]) - h_RT[0xd]) + -1.0) * dVar35) * dVar43 *
                      dVar41);
    local_758[1] = local_758[1] + dVar36;
    dStack_6f0 = dStack_6f0 - dVar36;
    local_1de8 = c[2];
    dStack_1de0 = 0.0;
    dVar41 = RVar144 * c[2];
    local_708._8_8_ = (double)local_708._8_8_ + dVar36;
    dVar36 = exp((double)local_1e28._0_8_ * 2.67 + dVar35 * -3165.232827911689);
    RVar15 = c[4];
    dVar36 = dVar36 * 0.05;
    dVar56 = dVar35 * 2.67 + dVar38 * 3165.232827911689;
    dVar43 = RVar14 * c[4];
    local_1e18 = local_1c70 - local_1ce8;
    dVar39 = exp((local_2038 + local_1e18) - local_1e38);
    RVar17 = c[6];
    dVar39 = dVar36 / dVar39;
    dVar45 = dVar36 * dVar41 - dVar43 * dVar39;
    dVar43 = dVar56 * dVar36 * dVar41 -
             (dVar56 - ((RVar16 + h_RT[4]) - (h_RT[0] + h_RT[2])) * dVar35) * dVar39 * dVar43;
    local_1f08[0] = local_1f08[0] - dVar45;
    local_1f08[1] = dVar44 + dVar45;
    local_1f08[2] = local_1f08[2] - dVar45;
    local_1f08[4] = dVar45 + local_1f08[4];
    dVar41 = dVar36 * local_1de8;
    local_15c8[0] = local_15c8[0] - dVar41;
    local_15c8[1] = local_15c8[1] + dVar41;
    local_15c8[2] = local_15c8[2] - dVar41;
    local_15c8[4] = dVar41 + local_15c8[4];
    dVar41 = RVar15 * -dVar39;
    local_15c8[0x16] = local_15c8[0x16] - dVar41;
    auStack_1510._8_8_ = (double)auStack_1510._8_8_ - dVar41;
    dStack_14f8 = dVar41 + dStack_14f8;
    dVar36 = dVar36 * RVar144;
    local_1468 = local_1468 - dVar36;
    local_1460 = local_1460 + dVar36;
    local_16d8 = dStack_1458 - dVar36;
    dVar56 = -dVar39 * RVar14;
    local_1308 = local_1308 - dVar56;
    local_1300 = local_1300 + dVar56;
    local_1698 = dStack_12f8 - dVar56;
    local_758[0] = local_758[0] - dVar43;
    local_758[1] = local_758[1] + dVar43;
    local_758[2] = local_758[2] - dVar43;
    local_758[4] = dVar43 + local_758[4];
    dVar62 = (double)local_1e28._0_8_ * 0.0;
    dVar57 = dVar57 + dVar62;
    auStack_1510._0_8_ = (double)auStack_1510._0_8_ + dVar41;
    dVar39 = exp(dVar57);
    RVar22 = c[4];
    RVar20 = c[3];
    dVar41 = exp(((local_2038 - dStack_1a10) - local_1e38) + local_1cb8);
    RVar21 = h_RT[6];
    RVar19 = h_RT[4];
    RVar18 = h_RT[3];
    RVar15 = h_RT[2];
    RVar16 = c[2];
    local_16c8 = local_1f08[2];
    local_16b8 = local_1f08[4];
    local_16f8 = local_1450;
    local_1718 = local_1438;
    local_1808 = dStack_13a8;
    uVar25 = local_1390._8_8_;
    local_16a8 = local_12f0;
    local_1708 = local_1198;
    local_16e8 = dStack_1178;
    local_1730 = local_758[2];
    local_698 = local_758[4];
    local_1828 = c[7];
    dStack_1820 = 0.0;
    dStack_16f0 = dVar36 + dStack_1448;
    dStack_16a0 = dVar56 + dStack_12e8;
    dVar36 = exp(dVar57);
    RVar14 = c[0xd];
    RVar144 = c[1];
    dVar100 = local_2038 - local_1ce8;
    auVar47._0_8_ = exp((local_1a18 + dVar100) - dVar40);
    uVar13 = auStack_1510._8_8_;
    dVar58 = dVar35 * 0.0;
    dStack_1de0 = (double)local_1df8._0_8_ + dVar58;
    local_1df8._8_8_ = dVar38 * 4498.756992294197 + dVar58;
    dVar36 = dVar36 * 80000000.0;
    dStack_5e0 = dVar39 * 20000000.0;
    auVar47._8_8_ = dVar41;
    auVar91._8_8_ = dStack_5e0;
    auVar91._0_8_ = dVar36;
    auVar90 = divpd(auVar91,auVar47);
    dVar43 = RVar14 * RVar144;
    dVar44 = RVar22 * RVar20;
    dVar39 = RVar16 * local_1828;
    local_1de8 = RVar17 * local_1de8;
    dVar41 = auVar90._0_8_;
    dVar56 = auVar90._8_8_;
    local_538 = -dVar41;
    dStack_530 = -dVar56;
    local_548 = dVar36 * dVar39 - dVar43 * dVar41;
    dStack_540 = dStack_5e0 * local_1de8 - dVar44 * dVar56;
    local_618 = local_1f08[1] + local_548;
    local_5f8 = local_1f08[0xd] + local_548;
    dVar83 = RVar14 * local_538;
    local_15e8 = (double)auStack_1510._0_8_ + dVar83;
    local_15f8 = local_14b0 + dVar83;
    auVar5._8_4_ = SUB84(dStack_5e0,0);
    auVar5._0_8_ = dVar36;
    auVar5._12_4_ = (int)((ulong)dStack_5e0 >> 0x20);
    local_1828 = local_1828 * dVar36;
    local_5d8 = local_1460 + local_1828;
    dVar61 = local_1400 + local_1828;
    local_5e8 = dVar36 * RVar16;
    local_5c8 = local_10f0 + local_5e8;
    local_5b8 = local_1090 + local_5e8;
    dVar140 = RVar144 * local_538;
    local_1688 = dStack_1de0 * dVar36 * dVar39 -
                 (dStack_1de0 - ((h_RT[0xd] + h_RT[1]) - (h_RT[7] + h_RT[2])) * dVar35) * dVar41 *
                 dVar43;
    dStack_1680 = dStack_1de0 * dStack_5e0 * local_1de8 -
                  (dStack_1de0 - ((RVar19 + RVar18) - (RVar15 + RVar21)) * dVar35) * dVar56 * dVar44
    ;
    dVar39 = local_cd0 + dVar140;
    local_17e8 = local_c70 + dVar140;
    local_668 = local_758[1] + local_1688;
    dVar41 = dStack_6f0 + local_1688;
    local_648 = local_14e0;
    local_638 = local_1430;
    local_1740 = local_10e8;
    local_1738 = dStack_10c0;
    local_608 = local_ca0;
    local_5a8 = c[8];
    uStack_5a0 = 0;
    local_1e08 = dVar58;
    dStack_1e00 = dVar58;
    local_1de8 = dStack_1de0;
    local_1df8._0_8_ = dStack_1de0;
    dVar60 = exp(dVar57);
    RVar19 = c[0xd];
    RVar144 = c[1];
    local_288 = exp((dStack_2030 + dVar100) - dVar40);
    RVar15 = c[2];
    local_268 = h_RT[2];
    RStack_260 = h_RT[3];
    local_278 = h_RT[8];
    RStack_270 = h_RT[9];
    local_558 = h_RT[1];
    RStack_550 = h_RT[2];
    local_568 = h_RT[0xd];
    RStack_560 = h_RT[0xe];
    local_17f8 = local_1428;
    local_17d8 = local_1040;
    local_1678 = local_1038;
    local_17c8 = local_1008;
    local_6a8 = local_c98;
    local_628 = c[9];
    RStack_620 = 0.0;
    local_298 = exp(dVar57);
    RVar14 = c[1];
    local_528 = c[0xe];
    uStack_520 = 0;
    local_2a8 = exp((dStack_1ce0 + dVar100) - local_1728);
    RVar18 = c[2];
    dVar43 = dVar35 * 1.5 + dVar38 * 4327.663325920592;
    local_1668 = (double)local_1e28._0_8_ * 1.83 + dVar35 * -110.7076664770384;
    uStack_1660 = local_1e28._8_8_;
    dVar59 = dVar35 * 1.83 + dVar38 * 110.7076664770384;
    local_17b8 = (double)local_1e28._0_8_ * 1.92 + dVar35 * -2863.302828428857;
    uStack_17b0 = local_1e28._8_8_;
    local_17a8 = dVar35 * 1.92 + dVar38 * 2863.302828428857;
    local_1c70 = local_1ce8 - local_1c70;
    dVar84 = (double)local_1e28._0_8_ * 1.62;
    dVar116 = dVar35 * 1.62 + dVar38 * 5454.868657323165;
    dVar85 = (double)local_1e28._0_8_ * 1.05;
    dVar139 = dVar35 * 1.05 + dVar38 * 1648.034580510458;
    dVar86 = (double)local_1e28._0_8_ * 1.9;
    dVar147 = dVar35 * 1.9 + dVar38 * 3789.2214935095417;
    dVar102 = (double)local_1e28._0_8_ * 1.51;
    dVar103 = (double)local_1e28._0_8_ * 2.4;
    dVar63 = (double)local_1e28._0_8_ * 1.6;
    dVar117 = dVar35 * 1.6 + dVar38 * 2727.4343286615826;
    dVar104 = (double)local_1e28._0_8_ * 1.228;
    dVar120 = (double)local_1e28._0_8_ * 1.18;
    dVar105 = dVar35 * 1.18 + dVar38 * -224.93784961470985;
    dVar121 = (double)local_1e28._0_8_ * 2.12;
    dVar106 = dVar35 * 2.12 + dVar38 * 437.79849925010643;
    local_1608 = dVar35 * -4161.601826205035 + dVar101;
    dVar107 = dVar38 * 3638.256493768126 + dVar99;
    dVar99 = dVar38 * 4161.601826205035 + dVar99;
    dVar148 = dStack_2030 - local_1a18;
    local_1758 = (dVar148 + (double)local_1e58._0_8_) - (double)local_1e58._0_8_;
    dStack_1750 = dStack_2030;
    local_688 = (dVar148 + dVar154) - dVar154;
    dStack_680 = dStack_2030;
    dVar56 = local_2038 - local_1e38;
    local_1658 = (dVar42 + (dStack_1a10 - local_2038)) - local_1c98;
    dVar64 = dStack_1a10 - local_1cb8;
    local_1648 = ((local_1ce8 - local_2038) + dStack_1a10) - local_1e38;
    dStack_1640 = dStack_1ce0;
    local_1798 = (local_1c70 - dStack_1a10) + local_1cb8;
    dStack_1790 = dStack_1ce0;
    dVar154 = local_1e38 + local_1e38;
    dVar44 = local_1e38 - local_1ce8;
    dVar122 = local_1ce8 - local_1e38;
    dVar130 = local_1e38 + local_1e18;
    local_1788 = (dVar154 - local_2038) - dStack_1cb0;
    local_1778 = ((local_1e38 - dStack_1a10) - dStack_1cb0) + local_1cb8;
    dVar162 = local_1cb8 - local_1e38;
    dVar142 = dStack_1a10 - local_1e38;
    dVar118 = (dStack_1a10 - local_1ce8) - local_1e38;
    dVar131 = local_1e38 - dStack_1cb0;
    local_588 = (dVar148 + local_1c98) - local_1c98;
    dStack_580 = dStack_2030;
    dVar45 = dVar38 * 1781.3869969487089 + dVar58;
    local_1638 = dVar38 * 319.54258278599724 + dVar58;
    dVar119 = dVar38 * -251.60833290236002 + dVar58;
    dVar65 = dVar38 * 301.929999482832 + dVar58;
    dVar66 = dVar38 * -286.8334995086904 + dVar58;
    local_658 = dVar38 * 14492.639975175936 + dVar58;
    local_258 = (double)local_1e28._0_8_ * 0.1 + dVar35 * -5334.096657530033;
    uStack_250 = local_1e28._8_8_;
    dVar123 = dVar35 * 0.1 + dVar38 * 5334.096657530033;
    dVar58 = (dVar56 - dStack_1ce0) + local_1dc8;
    dVar128 = (local_1c70 - dStack_1ce0) + local_1dc8;
    local_1628 = (dVar131 - local_1a18) + dStack_1ce0;
    local_1618 = (dVar131 - dStack_2030) + dStack_1ce0;
    dVar129 = (dVar131 - dStack_1ce0) + local_1dc8;
    dVar36 = ((local_1cb8 - dStack_1a10) + dStack_1ce0) - local_1dc8;
    local_1768 = (local_1a18 + local_1e18) - dStack_1ce0;
    __x = dStack_1ce0 * -2.0 + local_1a18 + local_1dc8;
    local_1e18 = (local_1e18 + dStack_2030) - dStack_1ce0;
    local_598 = dStack_1ce0 * -2.0 + dStack_2030 + local_1dc8;
    dVar67 = dStack_1ce0 - local_1dc8;
    dStack_1f80 = auVar5._8_8_;
    dVar141 = RVar17 * dStack_1f80;
    local_1438 = local_1718 - dVar141;
    local_1450 = dVar141 + local_16f8;
    dStack_1448 = dVar141 + dStack_16f0;
    dStack_1f80 = dStack_1f80 * RVar16;
    local_1198 = local_1708 - dStack_1f80;
    dStack_1178 = local_16e8 - dStack_1f80;
    local_1190 = dStack_1f80 + local_1190;
    dStack_1188 = dStack_1f80 + dStack_1188;
    auVar92._8_8_ = local_2a8;
    auVar92._0_8_ = local_288;
    dVar60 = dVar60 * 15000000.0;
    dVar81 = local_298 * 84300000.0;
    auVar145._8_8_ = dVar81;
    auVar145._0_8_ = dVar60;
    auVar90 = divpd(auVar145,auVar92);
    local_1f08[4] = dStack_540 + local_16b8;
    dVar87 = RVar22 * (double)CONCAT44(local_538._4_4_,dStack_530._0_4_);
    dVar124 = local_1808 - dVar87;
    local_1808 = local_14a8;
    local_13a0 = dVar87 + local_13a0;
    dStack_1398 = dVar87 + dStack_1398;
    dStack_12e8 = RVar20 * (double)CONCAT44(local_538._4_4_,dStack_530._0_4_);
    dStack_12f8 = local_1698 - dStack_12e8;
    local_12d8 = local_12d8 - dStack_12e8;
    local_12f0 = dStack_12e8 + local_16a8;
    dStack_12e8 = dStack_12e8 + dStack_16a0;
    local_1f08[3] = dStack_540 + local_1f08[3];
    local_1f08[6] = local_1f08[6] - dStack_540;
    local_1f08[7] = local_1f08[7] - local_548;
    local_14e0 = local_648 - dVar83;
    local_1430 = local_638 - local_1828;
    local_10f0 = local_5c8;
    local_10e8 = local_1740 - local_5e8;
    dStack_10c0 = local_1738 - local_5e8;
    local_1090 = local_5b8;
    local_ca0 = local_608 - dVar140;
    dVar157 = RVar144 * RVar19;
    dVar159 = local_528 * RVar14;
    dVar68 = dVar81 * local_628;
    dVar79 = local_628 * RVar15;
    dVar132 = auVar90._0_8_;
    dVar133 = auVar90._8_8_;
    local_1f08[0xd] = dVar60 * RVar16 * local_5a8 - dVar157 * dVar132;
    dVar138 = dVar81 * dVar79 - dVar159 * dVar133;
    local_758[4] = dStack_1680 + local_698;
    local_758[3] = dStack_1680 + local_758[3];
    local_758[6] = local_758[6] - dStack_1680;
    local_758[7] = local_758[7] - local_1688;
    dVar69 = local_528 * -dVar133;
    dVar149 = RVar14 * -dVar133;
    dVar88 = local_5a8 * dVar60;
    local_1428 = local_17f8 - dVar88;
    local_1400 = dVar88 + dVar61;
    dVar61 = RVar15 * dVar60;
    local_1040 = local_17d8 + dVar61;
    local_1038 = local_1678 - dVar61;
    local_1008 = local_17c8 - dVar61;
    local_fe0 = dVar61 + local_fe0;
    dVar61 = RVar19 * -dVar132;
    local_14d8 = local_14d8 - dVar61;
    local_14b0 = dVar61 + local_15f8;
    local_c70 = -dVar132 * RVar144;
    local_cd0 = dVar39 + local_c70;
    local_cc8 = (local_cc8 - dVar140) - local_c70;
    local_c98 = local_6a8 - local_c70;
    local_c70 = local_c70 + local_17e8;
    local_1f08[1] = local_618 + local_1f08[0xd] + dVar138;
    local_1f08[2] = (((local_16c8 - dStack_540) - local_548) - local_1f08[0xd]) - dVar138;
    local_1f08[8] = local_1f08[8] - local_1f08[0xd];
    local_1f08[9] = local_1f08[9] - dVar138;
    local_1f08[0xd] = local_5f8 + local_1f08[0xd];
    local_1f08[0xe] = local_1f08[0xe] + dVar138;
    auStack_1510._0_8_ = local_15e8 + dVar61 + dVar69;
    auStack_1510._8_8_ = (((double)uVar13 - dVar83) - dVar61) - dVar69;
    local_14a8 = local_14a8 + dVar69;
    dStack_14d0 = dStack_14d0 - dVar69;
    local_1460 = local_5d8 + dVar88 + dVar68;
    dStack_1458 = (((local_16d8 - dVar141) - local_1828) - dVar88) - dVar68;
    local_13f8 = local_13f8 + dVar68;
    local_1420 = local_1420 - dVar68;
    dVar39 = dVar81 * c[2];
    local_f90 = local_f90 + dVar39;
    local_f88 = local_f88 - dVar39;
    dStack_6f0 = dVar60 * local_1de8 * RVar16 * local_5a8 -
                 (local_1de8 - ((local_558 + local_568) - (local_268 + local_278)) * dVar35) *
                 dVar132 * dVar157;
    dVar60 = dVar81 * dStack_1de0 * dVar79 -
             (dStack_1de0 - ((h_RT[0xe] + h_RT[1]) - (h_RT[9] + h_RT[2])) * dVar35) * dVar133 *
             dVar159;
    dStack_f28 = dStack_f28 + dVar39;
    local_f50 = local_f50 - dVar39;
    local_c20 = local_c20 + dVar149;
    local_c18 = local_c18 - dVar149;
    local_bb8 = local_bb8 + dVar149;
    local_be0 = local_be0 - dVar149;
    local_758[1] = local_668 + dStack_6f0 + dVar60;
    local_758[2] = (((local_1730 - dStack_1680) - local_1688) - dStack_6f0) - dVar60;
    local_758[8] = local_758[8] - dStack_6f0;
    local_758[9] = local_758[9] - dVar60;
    dStack_6f0 = dVar41 + dStack_6f0;
    dStack_6e8 = dStack_6e8 + dVar60;
    local_1740 = (dVar56 - dVar42) + dVar40;
    local_17f8 = dVar35 * -1781.3869969487089 + dVar62;
    local_17e8 = (dVar56 - dVar40) + local_1728;
    local_17d8 = ((local_2038 - dStack_1ce0) - dVar40) + local_15d8;
    dVar83 = (local_2038 - dStack_1ce0) - local_1728;
    dVar132 = (dVar56 - local_1b20) + local_1818;
    local_1678 = dVar35 * -24053.756625465616 + dVar62;
    local_17c8 = dVar35 * -20128.6666321888 + dVar62;
    dVar133 = (dVar64 - dVar40) + local_1728;
    local_6a8 = dVar38 * 537.435399079441;
    dStack_6a0 = dVar38 * 7252.86180424343;
    local_1730 = dVar35 * -319.54258278599724 + dVar62;
    local_698 = (local_1c70 - dVar42) + dVar40;
    dStack_690 = dStack_1ce0;
    local_1dc8 = (local_1c70 - dVar40) + local_1728;
    dStack_1dc0 = dStack_1ce0;
    dVar39 = (local_1c70 - local_1b20) + local_1818;
    auVar6._8_4_ = SUB84(dVar38 * -1061.7871648479593,0);
    auVar6._0_8_ = dVar38 * 1726.0331637101897;
    auVar6._12_4_ = (int)((ulong)(dVar38 * -1061.7871648479593) >> 0x20);
    dVar41 = (local_1a18 + dVar44) - local_1728;
    local_1e58._8_4_ = SUB84(dStack_2030,0);
    local_1e58._0_8_ = (dStack_2030 + dVar44) - local_1728;
    local_1e58._12_4_ = (int)((ulong)dStack_2030 >> 0x20);
    auVar7._8_4_ = SUB84(dVar38 * 35.225166606330404,0);
    auVar7._0_8_ = dVar38 * 1570.0359973107265;
    auVar7._12_4_ = (int)((ulong)(dVar38 * 35.225166606330404) >> 0x20);
    __x_00 = (dVar131 - dVar40) + local_1728;
    local_1e38 = (dVar131 - local_1b20) + local_1818;
    local_1dd8 = (local_1a18 + dVar162) - local_1728;
    dVar140 = ((local_1a18 - local_1ce8) + dStack_1ce0) - local_15d8;
    dVar141 = dVar35 * -301.929999482832 + dVar62;
    dVar88 = dVar35 * 286.8334995086904 + dVar62;
    dVar138 = ((dStack_2030 - local_1ce8) + dStack_1ce0) - local_15d8;
    local_1e48 = (dVar42 + dVar148) - dVar42;
    dVar148 = ((dStack_2030 - dVar42) + local_1c98) - local_1728;
    local_15f8 = dVar35 * -14492.639975175936 + dVar62;
    local_15e8 = dVar35 * -4498.756992294197 + dVar62;
    dVar68 = (dVar142 + dStack_1ce0) - local_1728;
    local_668 = (dVar67 - dVar42) + dVar40;
    local_528 = c[10];
    uStack_520 = 0;
    local_1828 = dVar38;
    dStack_1820 = dVar38;
    dStack_13a8 = dVar124;
    local_1390._8_8_ = (double)uVar25 - dVar87;
    local_558 = exp(dVar82 + dVar35 * -4327.663325920592);
    RVar15 = c[9];
    RVar14 = c[4];
    local_548 = exp(dVar58);
    dVar56 = local_f88;
    RVar22 = c[0xd];
    RVar144 = c[2];
    local_538 = h_RT[10];
    dStack_530 = h_RT[0xb];
    local_648 = h_RT[2];
    RStack_640 = h_RT[3];
    local_628 = h_RT[4];
    RStack_620 = h_RT[5];
    local_638 = h_RT[9];
    RStack_630 = h_RT[10];
    local_16f8 = local_1f08[2];
    local_16e8 = local_1f08[4];
    local_16d8 = local_1f08[9];
    local_1738 = dStack_1458;
    local_618 = dStack_1448;
    local_5f8 = local_1420;
    local_5d8 = local_1418;
    local_16c8 = dStack_12f8;
    local_16b8 = dStack_12e8;
    local_1808 = local_12c0;
    local_16a8 = local_f78;
    local_1698 = local_f50;
    local_1688 = local_f48;
    local_608 = local_ed8;
    local_5e8 = local_ec8;
    local_5c8 = local_ea0;
    local_5b8 = local_e98;
    local_5a8 = local_758[2];
    local_1718 = local_758[4];
    local_1708 = local_758[9];
    local_568 = exp(dVar57);
    RVar20 = c[0xb];
    RVar16 = c[4];
    dVar58 = exp(local_1740);
    RVar17 = c[0xd];
    auVar109._8_8_ = dVar58;
    auVar109._0_8_ = local_548;
    dVar149 = local_558 * 1020.0;
    dVar157 = local_568 * 30000000.0;
    auVar70._8_8_ = dVar157;
    auVar70._0_8_ = dVar149;
    auVar90 = divpd(auVar70,auVar109);
    dVar58 = RVar14 * RVar15;
    dVar60 = RVar20 * RVar16;
    dVar124 = dVar149 * local_528;
    dVar79 = RVar22 * RVar144;
    dVar82 = local_648 + local_538;
    dVar69 = local_628 + local_638;
    dVar61 = auVar90._0_8_;
    dVar81 = auVar90._8_8_;
    dStack_12e8 = RVar20 * -dVar81;
    dVar87 = RVar16 * -dVar81;
    dStack_1458 = local_1738 - dVar124;
    local_648 = local_e28;
    local_638 = local_dd0;
    local_1738 = local_cc8;
    local_628 = local_cb8;
    local_1740 = local_c80;
    local_1420 = local_5f8 + dVar124;
    local_1418 = local_5d8 - dVar124;
    local_e98 = RVar144 * dVar149;
    local_ed8 = local_608 - local_e98;
    local_ec8 = local_5e8 + local_e98;
    local_ea0 = local_5c8 + local_e98;
    local_e98 = local_5b8 - local_e98;
    dVar82 = dVar43 * dVar149 * RVar18 * local_528 -
             (dVar43 - (dVar69 - dVar82) * dVar35) * dVar61 * dVar58;
    dVar69 = (double)local_1df8._0_8_ * dVar157 * dVar79 -
             ((double)local_1df8._0_8_ - ((h_RT[0xb] + h_RT[4]) - (h_RT[0xd] + h_RT[2])) * dVar35) *
             dVar81 * dVar60;
    local_758[9] = local_1708 + dVar82;
    dVar58 = RVar18 * local_528 * dVar149 - dVar58 * dVar61;
    dVar60 = dVar79 * dVar157 - dVar60 * dVar81;
    local_1f08[9] = local_16d8 + dVar58;
    dVar43 = RVar15 * -dVar61;
    local_12c0 = local_1808 + dVar43;
    local_12b8 = local_12b8 - dVar43;
    local_f48 = -dVar61 * RVar14;
    local_f88 = dVar56 - local_f48;
    local_f78 = local_16a8 + local_f48;
    local_f50 = local_1698 + local_f48;
    local_f48 = local_1688 - local_f48;
    local_1f08[2] = (local_16f8 - dVar58) - dVar60;
    local_1f08[4] = local_16e8 + dVar58 + dVar60;
    local_1f08[10] = local_1f08[10] - dVar58;
    local_1f08[0xb] = dVar60 + local_1f08[0xb];
    local_1f08[0xd] = local_1f08[0xd] - dVar60;
    dStack_1448 = RVar22 * dVar157;
    dStack_1458 = dStack_1458 - dStack_1448;
    local_1410 = local_1410 + dStack_1448;
    local_1400 = local_1400 - dStack_1448;
    dStack_1448 = dStack_1448 + local_618 + dVar124;
    dStack_12f8 = (local_16c8 - dVar43) - dStack_12e8;
    local_12b0 = local_12b0 + dStack_12e8;
    local_12a0 = local_12a0 - dStack_12e8;
    dStack_12e8 = dStack_12e8 + local_16b8 + dVar43;
    local_e28 = local_e28 - dVar87;
    local_e18 = local_e18 + dVar87;
    dStack_de0 = dStack_de0 + dVar87;
    local_dd0 = local_dd0 - dVar87;
    dVar157 = dVar157 * c[2];
    local_cc8 = local_cc8 - dVar157;
    local_cb8 = local_cb8 + dVar157;
    local_c80 = local_c80 + dVar157;
    local_c70 = local_c70 - dVar157;
    local_758[2] = (local_5a8 - dVar82) - dVar69;
    local_758[4] = local_1718 + dVar82 + dVar69;
    local_708._0_8_ = (double)local_708._0_8_ - dVar82;
    local_708._8_8_ = dVar69 + (double)local_708._8_8_;
    dStack_6f0 = dStack_6f0 - dVar69;
    dVar61 = c[2] * c[0xd];
    dVar56 = exp(dVar57);
    RVar14 = c[0xc];
    RVar144 = c[1];
    dVar56 = dVar56 * 30000000.0;
    dVar43 = c[1] * c[0xc];
    dVar58 = exp((dVar100 - local_1c98) + dVar40);
    RVar15 = c[0xe];
    dVar58 = dVar56 / dVar58;
    dVar60 = dVar56 * dVar61 - dVar43 * dVar58;
    dVar43 = (double)local_1df8._0_8_ * dVar56 * dVar61 -
             ((double)local_1df8._0_8_ - ((h_RT[1] + h_RT[0xc]) - (h_RT[2] + h_RT[0xd])) * dVar35) *
             dVar58 * dVar43;
    local_1f08[1] = local_1f08[1] + dVar60;
    local_1f08[2] = local_1f08[2] - dVar60;
    local_1f08[0xd] = local_1f08[0xd] - dVar60;
    local_1f08[0xc] = dVar60 + local_1f08[0xc];
    dVar60 = RVar14 * -dVar58;
    auStack_1510._0_8_ = (double)auStack_1510._0_8_ + dVar60;
    auStack_1510._8_8_ = (double)auStack_1510._8_8_ - dVar60;
    local_14b8 = local_14b8 + dVar60;
    local_14b0 = local_14b0 - dVar60;
    dVar81 = RVar17 * dVar56;
    local_1460 = local_1460 + dVar81;
    dVar61 = dStack_1458 - dVar81;
    local_1408 = local_1408 + dVar81;
    dVar81 = local_1400 - dVar81;
    dVar58 = -dVar58 * RVar144;
    local_d80 = local_d80 + dVar58;
    local_d78 = local_d78 - dVar58;
    local_d28 = local_d28 + dVar58;
    local_d20 = local_d20 - dVar58;
    dVar56 = dVar56 * c[2];
    local_cd0 = local_cd0 + dVar56;
    dVar60 = local_cc8 - dVar56;
    local_c78 = local_c78 + dVar56;
    dVar56 = local_c70 - dVar56;
    local_758[1] = local_758[1] + dVar43;
    local_758[2] = local_758[2] - dVar43;
    local_6f8 = local_6f8 + dVar43;
    dStack_6f0 = dStack_6f0 - dVar43;
    dVar82 = c[2] * c[0xe];
    local_17f8 = exp(local_17f8);
    RVar16 = c[0xd];
    RVar14 = c[4];
    local_17f8 = local_17f8 * 39000000.0;
    dVar43 = c[4] * c[0xd];
    dVar58 = exp(local_17e8);
    RVar144 = c[2];
    dVar58 = local_17f8 / dVar58;
    dVar100 = local_17f8 * dVar82 - dVar43 * dVar58;
    dVar45 = dVar45 * local_17f8 * dVar82 -
             (dVar45 - ((h_RT[4] + h_RT[0xd]) - (h_RT[2] + h_RT[0xe])) * dVar35) * dVar58 * dVar43;
    local_1f08[2] = local_1f08[2] - dVar100;
    local_1f08[4] = local_1f08[4] + dVar100;
    local_1f08[0xe] = local_1f08[0xe] - dVar100;
    local_1f08[0xd] = dVar100 + local_1f08[0xd];
    dVar43 = RVar15 * local_17f8;
    dStack_1458 = dVar61 - dVar43;
    dStack_1448 = dStack_1448 + dVar43;
    local_1400 = dVar81 + dVar43;
    local_13f8 = local_13f8 - dVar43;
    dVar43 = RVar16 * -dVar58;
    dStack_12f8 = dStack_12f8 - dVar43;
    dStack_12e8 = dStack_12e8 + dVar43;
    local_12a0 = local_12a0 + dVar43;
    local_1298 = local_1298 - dVar43;
    dVar43 = -dVar58 * RVar14;
    local_cc8 = dVar60 - dVar43;
    local_cb8 = local_cb8 + dVar43;
    local_c70 = dVar56 + dVar43;
    local_c68 = local_c68 - dVar43;
    dVar56 = local_17f8 * c[2];
    local_c18 = local_c18 - dVar56;
    local_c08 = local_c08 + dVar56;
    local_bc0 = local_bc0 + dVar56;
    local_bb8 = local_bb8 - dVar56;
    local_758[2] = local_758[2] - dVar45;
    local_758[4] = local_758[4] + dVar45;
    dStack_6f0 = dStack_6f0 + dVar45;
    dStack_6e8 = dStack_6e8 - dVar45;
    local_5c8 = c[0x10];
    uStack_5c0 = 0;
    dVar60 = exp(local_1668);
    RVar18 = c[0xd];
    RVar16 = c[9];
    local_608 = exp(local_17d8);
    dVar58 = local_f50;
    dVar45 = local_f88;
    dVar43 = dStack_1458;
    RVar22 = c[0x11];
    RVar14 = c[2];
    dVar56 = local_1f08[2];
    local_5e8 = h_RT[2];
    dStack_5e0 = h_RT[3];
    local_5f8 = h_RT[0x10];
    RStack_5f0 = h_RT[0x11];
    local_5b8 = h_RT[9];
    RStack_5b0 = h_RT[10];
    local_5d8 = h_RT[0xd];
    RStack_5d0 = h_RT[0xe];
    local_1668 = local_1f08[9];
    local_16e8 = local_1420;
    local_16d8 = local_1400;
    local_16c8 = local_13e8;
    local_16a8 = local_f30;
    local_1698 = local_f18;
    local_1688 = local_cc8;
    local_17f8 = local_c90;
    local_17e8 = local_c70;
    local_17d8 = local_c58;
    local_5a8 = local_ab8;
    local_1718 = dStack_a80;
    local_1708 = local_a60;
    local_16f8 = local_a48;
    local_16b8 = local_758[2];
    local_1808 = local_758[9];
    local_618 = exp(dVar57);
    RVar20 = c[0xe];
    RVar15 = c[9];
    dVar61 = exp(dVar83 + local_1b20);
    RVar17 = c[0x12];
    auVar110._8_8_ = dVar61;
    auVar110._0_8_ = local_608;
    dVar60 = dVar60 * (double)0x4033333333333333;
    dVar81 = local_618 * 132000000.0;
    auVar93._8_8_ = dVar81;
    auVar93._0_8_ = dVar60;
    auVar90 = divpd(auVar93,auVar110);
    dVar87 = RVar16 * RVar18;
    dVar124 = RVar20 * RVar15;
    dVar82 = dVar60 * local_5c8;
    dVar149 = RVar22 * RVar14;
    dVar79 = auVar90._0_8_;
    dVar83 = auVar90._8_8_;
    local_f50 = RVar20 * -dVar83;
    dVar61 = RVar15 * -dVar83;
    local_1400 = local_16d8 + dVar82;
    local_13e8 = local_16c8 - dVar82;
    local_a48 = RVar14 * dVar60;
    local_ab8 = local_5a8 - local_a48;
    dStack_a80 = local_1718 + local_a48;
    local_a60 = local_1708 + local_a48;
    local_a48 = local_16f8 - local_a48;
    dVar100 = dVar59 * dVar60 * RVar144 * local_5c8 -
              (dVar59 - ((local_5b8 + local_5d8) - (local_5e8 + local_5f8)) * dVar35) * dVar79 *
              dVar87;
    dVar69 = (double)local_1df8._0_8_ * dVar81 * dVar149 -
             ((double)local_1df8._0_8_ - ((h_RT[0xe] + h_RT[9]) - (h_RT[0x11] + h_RT[2])) * dVar35)
             * dVar83 * dVar124;
    dVar60 = RVar144 * local_5c8 * dVar60 - dVar87 * dVar79;
    dVar83 = dVar149 * dVar81 - dVar124 * dVar83;
    dVar59 = RVar18 * -dVar79;
    local_f30 = local_16a8 + dVar59;
    local_f18 = local_1698 - dVar59;
    local_c58 = -dVar79 * RVar16;
    local_cc8 = local_1688 - local_c58;
    local_c90 = local_17f8 + local_c58;
    local_c70 = local_17e8 + local_c58;
    local_c58 = local_17d8 - local_c58;
    local_1f08[2] = (dVar56 - dVar60) - dVar83;
    local_1f08[9] = dVar83 + local_1668 + dVar60;
    local_1f08[0xd] = local_1f08[0xd] + dVar60;
    local_1f08[0xe] = local_1f08[0xe] + dVar83;
    auStack_1e88._0_8_ = (double)auStack_1e88._0_8_ - dVar60;
    auStack_1e88._8_8_ = (double)auStack_1e88._8_8_ - dVar83;
    local_1420 = RVar22 * dVar81;
    dStack_1458 = (dVar43 - dVar82) - local_1420;
    local_13f8 = local_13f8 + local_1420;
    local_13e0 = local_13e0 - local_1420;
    local_1420 = local_1420 + local_16e8 + dVar82;
    local_f88 = (dVar45 - dVar59) - local_f50;
    dStack_f28 = dStack_f28 + local_f50;
    local_f10 = local_f10 - local_f50;
    local_f50 = local_f50 + dVar58 + dVar59;
    local_c18 = local_c18 - dVar61;
    local_be0 = local_be0 + dVar61;
    local_bb8 = local_bb8 + dVar61;
    local_ba0 = local_ba0 - dVar61;
    dVar81 = dVar81 * c[2];
    local_9d0 = local_9d0 + dVar81;
    local_9a8 = local_9a8 + dVar81;
    local_758[2] = (local_16b8 - dVar100) - dVar69;
    local_758[9] = local_1808 + dVar100 + dVar69;
    dStack_6f0 = dStack_6f0 + dVar100;
    dStack_6e8 = dStack_6e8 + dVar69;
    dStack_6d8 = dStack_6d8 - dVar100;
    dStack_6d0 = dStack_6d0 - dVar69;
    dVar59 = c[2] * c[0x12];
    dVar56 = exp(local_17b8);
    RVar15 = c[0x11];
    RVar16 = c[4];
    dVar56 = dVar56 * 89.8;
    dVar43 = c[4] * c[0x11];
    dVar45 = exp(dVar132);
    RVar14 = c[3];
    RVar144 = c[2];
    dVar45 = dVar56 / dVar45;
    dVar58 = dVar56 * dVar59 - dVar43 * dVar45;
    local_1f08[2] = local_1f08[2] - dVar58;
    local_1f08[4] = local_1f08[4] + dVar58;
    local_1e78 = local_1e78 - dVar58;
    auStack_1e88._8_8_ = dVar58 + (double)auStack_1e88._8_8_;
    dVar58 = local_17a8 * dVar56 * dVar59 -
             (local_17a8 - ((h_RT[4] + h_RT[0x11]) - (h_RT[2] + h_RT[0x12])) * dVar35) * dVar45 *
             dVar43;
    dVar43 = RVar17 * dVar56;
    dStack_1458 = dStack_1458 - dVar43;
    dStack_1448 = dStack_1448 + dVar43;
    local_13e0 = local_13e0 + dVar43;
    local_13d8 = local_13d8 - dVar43;
    dVar43 = RVar15 * -dVar45;
    dStack_12f8 = dStack_12f8 - dVar43;
    dStack_12e8 = dStack_12e8 + dVar43;
    local_1280 = local_1280 + dVar43;
    local_1278 = local_1278 - dVar43;
    dVar43 = -dVar45 * RVar16;
    local_a08 = (local_a08 - dVar81) - dVar43;
    local_9f8 = local_9f8 + dVar43;
    local_990 = (local_990 - dVar81) + dVar43;
    local_988 = local_988 - dVar43;
    dVar56 = dVar56 * c[2];
    local_958 = local_958 - dVar56;
    local_948 = local_948 + dVar56;
    local_8e0 = local_8e0 + dVar56;
    local_8d8 = local_8d8 - dVar56;
    local_758[2] = local_758[2] - dVar58;
    local_758[4] = local_758[4] + dVar58;
    dStack_6d0 = dStack_6d0 + dVar58;
    local_6c8 = local_6c8 - dVar58;
    local_16c8 = c[0xb];
    uStack_16c0 = 0;
    local_16e8 = exp(local_1678);
    local_16f8 = exp(local_1658);
    uVar13 = local_708._8_8_;
    dVar100 = local_d28;
    dVar82 = local_d78;
    dVar81 = local_13a0;
    dVar61 = dStack_13a8;
    dVar60 = local_1408;
    dVar59 = local_1410;
    dVar58 = local_1450;
    RVar16 = c[0xe];
    dVar45 = local_1f08[3];
    local_16b8 = h_RT[3];
    RStack_16b0 = h_RT[4];
    local_16d8 = h_RT[0xb];
    RStack_16d0 = h_RT[0xc];
    local_1808 = h_RT[2];
    RStack_1800 = h_RT[3];
    local_1668 = local_1f08[2];
    local_17b8 = local_1f08[0xb];
    local_17a8 = dStack_1458;
    local_16a8 = local_1358;
    local_1698 = local_e28;
    local_1688 = local_e20;
    local_17f8 = dStack_de0;
    local_17e8 = local_dd8;
    local_17d8 = local_758[2];
    local_1678 = local_758[3];
    local_1658 = c[2];
    local_1708 = c[3];
    uStack_1700 = 0;
    local_1718 = exp(local_17c8);
    local_17c8 = c[6];
    uStack_17c0 = 0;
    dVar56 = exp(dVar133);
    RVar15 = c[3];
    dVar157 = local_16e8 * 2500000.0;
    dVar159 = local_1718 * 100000000.0;
    auVar71._8_8_ = dVar56;
    auVar71._0_8_ = local_16f8;
    auVar111._8_8_ = dVar159;
    auVar111._0_8_ = dVar157;
    auVar90 = divpd(auVar111,auVar71);
    dVar143 = dVar157 * local_16c8;
    dVar150 = RVar14 * local_16c8;
    dVar152 = RVar16 * local_1708;
    dVar56 = local_16b8 + local_16d8;
    dVar133 = auVar90._0_8_;
    dVar149 = auVar90._8_8_;
    dVar124 = dVar157 * dVar150 - RVar144 * c[0xc] * dVar133;
    dVar132 = dVar159 * dVar152 - local_17c8 * c[0xd] * dVar149;
    dVar69 = local_1808 + h_RT[0xc];
    dVar79 = dVar38 * 24053.756625465616 + local_1e08;
    dVar87 = dVar38 * 20128.6666321888 + dStack_1e00;
    dVar43 = -dVar149 * local_17c8;
    dVar155 = RVar16 * dVar159;
    dVar83 = dVar159 * local_1708;
    dStack_13a8 = dVar61 + dVar143;
    local_1718 = local_1190;
    local_16e8 = local_1138;
    local_16d8 = local_cc0;
    local_1808 = local_c68;
    local_1708 = local_ca8;
    local_16f8 = local_c70;
    local_16c8 = local_bf8;
    local_16b8 = local_bc0;
    local_1360 = local_1360 - dVar143;
    local_1358 = dVar143 + local_16a8;
    local_dd8 = RVar14 * dVar157;
    local_e28 = local_1698 + local_dd8;
    local_e20 = local_1688 - local_dd8;
    dStack_de0 = local_17f8 - local_dd8;
    local_dd8 = local_dd8 + local_17e8;
    dVar56 = dVar157 * dVar79 * dVar150 -
             (dVar79 - (dVar69 - dVar56) * dVar35) * dVar133 * RVar144 * c[0xc];
    dVar61 = dVar159 * dVar87 * dVar152 -
             (dVar87 - ((h_RT[6] + h_RT[0xd]) - (h_RT[0xe] + h_RT[3])) * dVar35) * dVar149 *
             local_17c8 * c[0xd];
    local_758[2] = local_17d8 + dVar56;
    local_708._8_8_ = (double)uVar13 - dVar56;
    local_1f08[2] = local_1668 + dVar124;
    local_1f08[0xb] = local_17b8 - dVar124;
    local_1408 = c[0xc] * -dVar133;
    dVar69 = c[0xd] * -dVar149;
    dStack_1458 = local_17a8 + local_1408;
    local_1450 = dVar58 - local_1408;
    local_1410 = dVar59 - local_1408;
    local_1408 = local_1408 + dVar60;
    local_d28 = -dVar133 * local_1658;
    local_d78 = dVar82 + local_d28;
    local_d70 = local_d70 - local_d28;
    local_d30 = local_d30 - local_d28;
    local_d28 = local_d28 + dVar100;
    local_1f08[3] = (dVar45 - dVar124) - dVar132;
    local_1f08[6] = local_1f08[6] + dVar132;
    local_1f08[0xc] = dVar124 + local_1f08[0xc];
    local_1f08[0xd] = dVar132 + local_1f08[0xd];
    local_1f08[0xe] = local_1f08[0xe] - dVar132;
    local_13a0 = (dVar81 - dVar143) - dVar155;
    local_1390._8_8_ = (double)local_1390._8_8_ + dVar155;
    local_1350 = local_1350 + dVar155;
    local_1348 = local_1348 - dVar155;
    local_1190 = local_1190 - dVar69;
    dStack_1178 = dStack_1178 + dVar69;
    local_1140 = local_1140 + dVar69;
    local_1138 = local_1138 - dVar69;
    local_cc0 = local_cc0 - dVar43;
    local_ca8 = local_ca8 + dVar43;
    local_c70 = local_c70 + dVar43;
    local_c68 = local_c68 - dVar43;
    local_c10 = local_c10 - dVar83;
    local_bf8 = local_bf8 + dVar83;
    local_bc0 = local_bc0 + dVar83;
    local_bb8 = local_bb8 - dVar83;
    local_758[3] = (local_1678 - dVar56) - dVar61;
    local_758[6] = local_758[6] + dVar61;
    local_6f8 = dVar56 + local_6f8;
    dStack_6f0 = dVar61 + dStack_6f0;
    dStack_6e8 = dStack_6e8 - dVar61;
    local_17c8 = c[1];
    uStack_17c0 = 0;
    dVar59 = exp(dVar35 * -7252.86180424343 + dVar62);
    RVar18 = c[4];
    local_17a8 = exp(local_1648);
    dVar100 = local_758[3];
    dVar82 = local_758[2];
    RVar19 = h_RT[4];
    RVar17 = h_RT[1];
    RVar20 = c[6];
    RVar14 = c[1];
    dVar81 = local_1f08[3];
    dVar61 = local_1f08[2];
    dVar60 = local_1f08[1];
    local_1648 = local_758[1];
    local_1658 = h_RT[3];
    uStack_1650 = 0;
    local_17b8 = exp(dVar35 * -537.435399079441 + dVar62);
    RVar144 = c[0];
    auVar48._0_8_ = exp(local_1798);
    RVar22 = c[6];
    RVar16 = c[1];
    dVar87 = RVar17 + local_1658;
    auVar48._8_8_ = local_17a8;
    dVar58 = local_17b8 * 28000000.0;
    dVar59 = dVar59 * 83000000.0;
    auVar160._8_8_ = dVar59;
    auVar160._0_8_ = dVar58;
    auVar90 = divpd(auVar160,auVar48);
    dVar124 = c[3] * RVar144;
    dVar133 = c[2] * RVar18;
    dVar159 = RVar14 * RVar20;
    dVar143 = RVar15 * local_17c8;
    dVar69 = RVar15 * dVar59;
    dStack_14f8 = dStack_14f8 + dVar69;
    dVar45 = dVar69 + (double)auStack_1510._8_8_;
    dVar79 = (double)auStack_1510._0_8_ - dVar69;
    dVar149 = local_6a8 + local_1e08;
    dVar150 = auVar90._0_8_;
    dVar152 = auVar90._8_8_;
    dVar56 = dVar58 * dVar159 - dVar124 * dVar150;
    dVar43 = dVar59 * dVar143 - dVar133 * dVar152;
    local_6a8 = local_15c8[1];
    local_1668 = local_15c8[6];
    local_17a8 = (double)local_1390._8_8_;
    local_1798 = local_758[0];
    local_1658 = local_13b8;
    local_17b8 = local_11a8;
    auStack_1510._8_4_ = SUB84(dVar45,0);
    auStack_1510._0_8_ = dVar79;
    auStack_1510._12_4_ = (int)((ulong)dVar45 >> 0x20);
    dVar157 = dVar59 * local_17c8;
    dStack_1398 = dVar157 + dStack_1398;
    auVar8._8_4_ = SUB84(dStack_13a8 + dVar157,0);
    auVar8._0_8_ = local_13b0 - dVar157;
    auVar8._12_4_ = (int)((ulong)(dStack_13a8 + dVar157) >> 0x20);
    dVar132 = RVar20 * dVar58;
    dVar83 = RVar14 * dVar58;
    dVar45 = dVar58 * dVar149 * dVar159 -
             (dVar149 - ((h_RT[3] + h_RT[0]) - (h_RT[6] + h_RT[1])) * dVar35) * dVar150 * dVar124;
    dVar58 = dVar59 * (dStack_6a0 + dStack_1e00) * dVar143 -
             ((dStack_6a0 + dStack_1e00) - ((h_RT[2] + RVar19) - dVar87) * dVar35) * dVar152 *
             dVar133;
    local_758[1] = local_1648 - dVar58;
    local_758[2] = dVar82 + dVar58;
    local_1f08[2] = dVar61 + dVar43;
    dVar61 = c[3] * -dVar150;
    dVar82 = RVar144 * -dVar150;
    dVar59 = RVar18 * -dVar152;
    local_1460 = local_1460 - dVar59;
    dStack_1458 = dStack_1458 + dVar59;
    dStack_1448 = dVar59 + dStack_1448;
    local_1450 = local_1450 - dVar59;
    dVar59 = c[2] * -dVar152;
    local_1300 = local_1300 - dVar59;
    local_12f0 = local_12f0 - dVar59;
    dStack_12f8 = dStack_12f8 + dVar59;
    dStack_12e8 = dVar59 + dStack_12e8;
    local_1f08[0] = local_1f08[0] + dVar56;
    local_1f08[1] = (dVar60 - dVar43) - dVar56;
    local_1f08[3] = (dVar81 - dVar43) + dVar56;
    local_1f08[4] = local_1f08[4] + dVar43;
    local_1f08[6] = local_1f08[6] - dVar56;
    local_15c8[0] = local_15c8[0] + dVar61;
    local_15c8[1] = local_15c8[1] - dVar61;
    local_15c8[3] = local_15c8[3] + dVar61;
    local_15c8[6] = local_15c8[6] - dVar61;
    local_15c8[0x16] = local_15c8[0x16] + dVar132;
    dVar60 = local_14e8 - dVar132;
    local_1500 = dVar132 + (local_1500 - dVar69);
    local_13b8 = local_13b8 + dVar82;
    local_13b0 = (local_13b0 - dVar157) - dVar82;
    dStack_13a8 = auVar8._8_8_;
    local_1390._8_8_ = (double)local_1390._8_8_ - dVar82;
    local_13a0 = dVar82 + (local_13a0 - dVar157);
    local_11a8 = local_11a8 + dVar83;
    local_1190 = local_1190 + dVar83;
    dVar61 = local_11a0 - dVar83;
    dVar83 = dStack_1178 - dVar83;
    local_758[0] = local_758[0] + dVar45;
    dVar56 = local_758[1] - dVar45;
    local_758[3] = (dVar100 - dVar58) + dVar45;
    local_758[4] = local_758[4] + dVar58;
    dVar45 = local_758[6] - dVar45;
    dVar43 = c[1] * c[6];
    local_1798 = exp(local_1730);
    RVar144 = c[4];
    local_1798 = local_1798 * 134000000.0;
    dVar58 = c[4] * c[4];
    dVar59 = exp((local_1ce8 - dVar154) + local_1cb8);
    RVar19 = h_RT[1];
    dVar59 = local_1798 / dVar59;
    dVar81 = local_1798 * dVar43 - dVar58 * dVar59;
    dVar58 = local_1638 * local_1798 * dVar43 -
             (local_1638 - ((h_RT[4] + h_RT[4]) - (h_RT[6] + h_RT[1])) * dVar35) * dVar59 * dVar58;
    dVar69 = local_1f08[1] - dVar81;
    local_1f08[6] = local_1f08[6] - dVar81;
    local_1f08[4] = dVar81 + dVar81 + local_1f08[4];
    dVar124 = RVar22 * local_1798;
    local_14e8 = dVar60 - dVar124;
    dStack_14f8 = dVar124 + dVar124 + dStack_14f8;
    dVar43 = dVar59 * -2.0 * RVar144;
    local_1300 = local_1300 - dVar43;
    local_12d8 = local_12d8 - dVar43;
    dStack_12e8 = dVar43 + dVar43 + dStack_12e8;
    dVar43 = local_1798 * RVar16;
    local_11a0 = dVar61 - dVar43;
    dStack_1178 = dVar83 - dVar43;
    dStack_1188 = dVar43 + dVar43 + dStack_1188;
    local_758[1] = dVar56 - dVar58;
    local_758[6] = dVar45 - dVar58;
    local_758[4] = dVar58 + dVar58 + local_758[4];
    local_17e8 = c[10];
    uStack_17e0 = 0;
    local_1688 = exp(dVar84 + dVar35 * -5454.868657323165);
    RVar18 = c[9];
    RVar144 = c[0];
    local_1698 = exp(dVar128);
    dVar43 = local_ea0;
    dVar82 = local_f48;
    dVar81 = local_f50;
    dVar61 = local_f90;
    dVar56 = dStack_14d0;
    dVar60 = local_15c8[0x16];
    RVar22 = c[0xd];
    RVar15 = c[1];
    dVar59 = local_1f08[0];
    local_17f8 = h_RT[10];
    RStack_17f0 = h_RT[0xb];
    local_1678 = h_RT[0];
    RStack_1670 = h_RT[1];
    local_17d8 = h_RT[9];
    RStack_17d0 = h_RT[10];
    local_17b8 = local_1f08[9];
    local_17a8 = local_15c8[0];
    local_1648 = local_15c8[1];
    local_1798 = local_15c8[9];
    local_1638 = local_15c8[10];
    local_17c8 = local_ee0;
    local_6a8 = local_e98;
    local_1668 = local_758[0];
    local_1730 = local_758[1];
    local_1658 = local_758[9];
    local_16a8 = exp(dVar57);
    RVar20 = c[0xb];
    RVar14 = c[0];
    dVar45 = exp(local_698);
    RVar17 = c[0xe];
    auVar112._8_8_ = dVar45;
    auVar112._0_8_ = local_1698;
    dVar128 = local_1688 * 660.0;
    dVar87 = local_16a8 * 73400000.0;
    auVar72._8_8_ = dVar87;
    auVar72._0_8_ = dVar128;
    auVar90 = divpd(auVar72,auVar112);
    dVar45 = RVar144 * RVar18;
    dVar58 = RVar20 * RVar14;
    dVar83 = dVar128 * local_17e8;
    dVar157 = RVar16 * local_17e8;
    dVar159 = RVar22 * RVar15;
    dVar149 = local_1678 + local_17d8;
    dVar154 = auVar90._0_8_;
    dVar100 = auVar90._8_8_;
    dVar133 = RVar20 * -dVar100;
    dVar84 = RVar14 * -dVar100;
    local_17d8 = local_14b0;
    local_1678 = local_e30;
    local_17e8 = dStack_de0;
    local_698 = local_c80;
    dStack_14d0 = dVar56 + dVar83;
    local_14c8 = local_14c8 - dVar83;
    local_e98 = RVar15 * dVar128;
    local_ee8 = local_ee8 + local_e98;
    local_ee0 = local_17c8 - local_e98;
    local_ea0 = dVar43 + local_e98;
    local_e98 = local_6a8 - local_e98;
    dVar56 = dVar116 * dVar128 * dVar157 -
             (dVar116 - (dVar149 - (RVar19 + local_17f8)) * dVar35) * dVar154 * dVar45;
    dVar43 = (double)local_1df8._0_8_ * dVar87 * dVar159 -
             ((double)local_1df8._0_8_ - ((h_RT[0xb] + h_RT[0]) - (h_RT[0xd] + h_RT[1])) * dVar35) *
             dVar100 * dVar58;
    local_758[9] = local_1658 + dVar56;
    dVar45 = dVar157 * dVar128 - dVar45 * dVar154;
    dVar58 = dVar159 * dVar87 - dVar58 * dVar100;
    local_1f08[9] = local_17b8 + dVar45;
    dVar100 = RVar18 * -dVar154;
    local_15c8[9] = local_1798 + dVar100;
    local_15c8[10] = local_1638 - dVar100;
    local_f48 = -dVar154 * RVar144;
    local_f98 = local_f98 + local_f48;
    local_f90 = dVar61 - local_f48;
    local_f50 = dVar81 + local_f48;
    local_f48 = dVar82 - local_f48;
    local_1f08[0] = dVar59 + dVar45 + dVar58;
    local_1f08[1] = (dVar69 - dVar45) - dVar58;
    local_1f08[10] = local_1f08[10] - dVar45;
    auVar10._8_4_ = SUB84(dVar58 + local_1f08[0xb],0);
    auVar10._0_8_ = local_1f08[10];
    auVar10._12_4_ = (int)((ulong)(dVar58 + local_1f08[0xb]) >> 0x20);
    local_1f08[0xb] = auVar10._8_8_;
    local_1f08[0xd] = local_1f08[0xd] - dVar58;
    local_15c8[0] = local_17a8 + dVar100 + dVar133;
    local_15c8[1] = (local_1648 - dVar100) - dVar133;
    local_15c8[0xb] = local_15c8[0xb] + dVar133;
    local_15c8[0xd] = local_15c8[0xd] - dVar133;
    dVar45 = RVar22 * dVar87;
    local_15c8[0x16] = dVar60 + dVar83 + dVar45;
    auStack_1510._0_8_ = (((dVar79 - dVar132) - dVar124) - dVar83) - dVar45;
    local_14c0 = local_14c0 + dVar45;
    local_14b0 = local_14b0 - dVar45;
    local_e38 = local_e38 + dVar84;
    local_e30 = local_e30 - dVar84;
    dStack_de0 = dStack_de0 + dVar84;
    local_dd0 = local_dd0 - dVar84;
    dVar87 = dVar87 * c[1];
    local_c80 = local_c80 + dVar87;
    dVar58 = local_cd0 - dVar87;
    dVar59 = local_c70 - dVar87;
    local_758[0] = local_1668 + dVar56 + dVar43;
    local_758[1] = (local_1730 - dVar56) - dVar43;
    dVar45 = dVar43 + (double)local_708._8_8_;
    local_708._8_4_ = SUB84(dVar45,0);
    local_708._0_8_ = (double)local_708._0_8_ - dVar56;
    local_708._12_4_ = (int)((ulong)dVar45 >> 0x20);
    dStack_6f0 = dStack_6f0 - dVar43;
    dVar61 = c[1] * c[0xe];
    dVar56 = exp(dVar85 + dVar35 * -1648.034580510458);
    RVar14 = c[0xd];
    RVar144 = c[0];
    dVar56 = dVar56 * 23000.0;
    dVar43 = c[0] * c[0xd];
    dVar45 = exp(local_1dc8);
    RVar16 = c[0xf];
    dVar45 = dVar56 / dVar45;
    dVar60 = dVar56 * dVar61 - dVar43 * dVar45;
    local_1f08[0] = local_1f08[0] + dVar60;
    local_1f08[1] = local_1f08[1] - dVar60;
    local_1f08[0xe] = local_1f08[0xe] - dVar60;
    local_1f08[0xd] = dVar60 + local_1f08[0xd];
    dVar61 = dVar139 * dVar56 * dVar61 -
             (dVar139 - ((h_RT[0] + h_RT[0xd]) - (h_RT[1] + h_RT[0xe])) * dVar35) * dVar45 * dVar43;
    dVar43 = RVar14 * -dVar45;
    local_15c8[0] = local_15c8[0] + dVar43;
    local_15c8[1] = local_15c8[1] - dVar43;
    local_15c8[0xd] = local_15c8[0xd] + dVar43;
    local_15c8[0xe] = local_15c8[0xe] - dVar43;
    dVar43 = RVar17 * dVar56;
    local_15c8[0x16] = local_15c8[0x16] + dVar43;
    dVar60 = (double)auStack_1510._0_8_ - dVar43;
    local_14b0 = local_14b0 + dVar43;
    local_14a8 = local_14a8 - dVar43;
    dVar43 = -dVar45 * RVar144;
    local_cd8 = local_cd8 + dVar87 + dVar43;
    local_cd0 = dVar58 - dVar43;
    local_c70 = dVar59 + dVar43;
    local_c68 = local_c68 - dVar43;
    dVar56 = dVar56 * c[1];
    local_c28 = local_c28 + dVar56;
    local_c20 = local_c20 - dVar56;
    local_bc0 = local_bc0 + dVar56;
    local_bb8 = local_bb8 - dVar56;
    local_758[0] = local_758[0] + dVar61;
    local_758[1] = local_758[1] - dVar61;
    dStack_6f0 = dStack_6f0 + dVar61;
    dStack_6e8 = dStack_6e8 - dVar61;
    dVar58 = c[1] * c[0xf];
    dVar56 = exp(dVar57);
    RVar14 = c[9];
    RVar144 = c[4];
    dVar56 = dVar56 * 32000000.0;
    dVar43 = c[4] * c[9];
    dVar45 = exp((dVar122 - dStack_1ce0) + dVar80);
    RVar20 = c[0x12];
    dVar45 = dVar56 / dVar45;
    dVar59 = dVar56 * dVar58 - dVar43 * dVar45;
    dVar43 = (double)local_1df8._0_8_ * dVar56 * dVar58 -
             ((double)local_1df8._0_8_ - ((h_RT[4] + h_RT[9]) - (h_RT[1] + h_RT[0xf])) * dVar35) *
             dVar45 * dVar43;
    local_1f08[1] = local_1f08[1] - dVar59;
    local_1f08[4] = local_1f08[4] + dVar59;
    local_1f08[0xf] = local_1f08[0xf] - dVar59;
    local_1f08[9] = dVar59 + local_1f08[9];
    dVar58 = RVar16 * dVar56;
    auStack_1510._0_8_ = dVar60 - dVar58;
    dStack_14f8 = dStack_14f8 + dVar58;
    dStack_14d0 = dStack_14d0 + dVar58;
    local_14a0 = local_14a0 - dVar58;
    dVar58 = RVar14 * -dVar45;
    local_1300 = local_1300 - dVar58;
    dStack_12e8 = dStack_12e8 + dVar58;
    local_12c0 = local_12c0 + dVar58;
    local_1290 = local_1290 - dVar58;
    dVar45 = -dVar45 * RVar144;
    local_f90 = local_f90 - dVar45;
    local_f78 = local_f78 + dVar45;
    local_f50 = local_f50 + dVar45;
    local_f20 = local_f20 - dVar45;
    dVar56 = dVar56 * c[1];
    local_b70 = local_b70 - dVar56;
    local_b58 = local_b58 + dVar56;
    local_b30 = local_b30 + dVar56;
    local_b00 = local_b00 - dVar56;
    local_758[1] = local_758[1] - dVar43;
    local_758[4] = local_758[4] + dVar43;
    local_758[9] = local_758[9] + dVar43;
    dStack_6e0 = dStack_6e0 - dVar43;
    dVar58 = c[1] * c[0x12];
    dVar56 = exp(dVar86 + dVar35 * -3789.2214935095417);
    RVar18 = c[0x11];
    RVar144 = c[0];
    dVar56 = dVar56 * 115.0;
    dVar43 = c[0] * c[0x11];
    dVar39 = exp(dVar39);
    RVar15 = c[4];
    RVar16 = c[1];
    RVar14 = c[0];
    dVar39 = dVar56 / dVar39;
    dVar45 = dVar56 * dVar58 - dVar43 * dVar39;
    dVar58 = dVar147 * dVar56 * dVar58 -
             (dVar147 - ((h_RT[0] + h_RT[0x11]) - (h_RT[1] + h_RT[0x12])) * dVar35) * dVar39 *
             dVar43;
    local_1f08[0] = local_1f08[0] + dVar45;
    local_1f08[1] = local_1f08[1] - dVar45;
    local_1e78 = local_1e78 - dVar45;
    auStack_1e88._8_8_ = dVar45 + (double)auStack_1e88._8_8_;
    dVar43 = RVar18 * -dVar39;
    local_15c8[0] = local_15c8[0] + dVar43;
    local_15c8[1] = local_15c8[1] - dVar43;
    local_15c8[0x11] = local_15c8[0x11] + dVar43;
    local_15c8[0x12] = local_15c8[0x12] - dVar43;
    dVar43 = RVar20 * dVar56;
    local_15c8[0x16] = local_15c8[0x16] + dVar43;
    auStack_1510._0_8_ = (double)auStack_1510._0_8_ - dVar43;
    local_1490 = local_1490 + dVar43;
    local_1488 = local_1488 - dVar43;
    dVar39 = -dVar39 * RVar144;
    local_a18 = local_a18 + dVar39;
    local_a10 = local_a10 - dVar39;
    local_990 = local_990 + dVar39;
    local_988 = local_988 - dVar39;
    dVar56 = dVar56 * c[1];
    local_968 = local_968 + dVar56;
    local_960 = local_960 - dVar56;
    local_8e0 = local_8e0 + dVar56;
    local_8d8 = local_8d8 - dVar56;
    local_758[0] = local_758[0] + dVar58;
    local_758[1] = local_758[1] - dVar58;
    dStack_6d0 = dStack_6d0 + dVar58;
    local_6c8 = local_6c8 - dVar58;
    dVar154 = exp(dVar102 + dVar35 * -1726.0331637101897);
    RVar144 = c[5];
    local_1638 = exp(dVar130 - dStack_1cb0);
    dVar100 = local_758[5];
    dVar82 = local_758[4];
    dVar81 = local_758[0];
    dVar61 = local_1258;
    dVar60 = dStack_12e8;
    dVar59 = dStack_14f8;
    uVar13 = auStack_1510._0_8_;
    dVar58 = local_15c8[0x16];
    RVar18 = c[4];
    dVar45 = local_1f08[5];
    dVar43 = local_1f08[4];
    dVar56 = local_1f08[1];
    dVar39 = local_1f08[0];
    dVar116 = h_RT[0] + h_RT[4];
    dVar102 = h_RT[1] + h_RT[5];
    local_698 = local_15c8[0];
    local_17b8 = local_15c8[1];
    local_17a8 = local_15c8[4];
    local_1648 = local_15c8[5];
    local_1798 = local_1308;
    dVar139 = exp(dVar103 + dVar35 * 1061.7871648479593);
    RVar20 = c[5];
    dVar139 = dVar139 * 0.0357;
    dVar147 = exp(local_1788);
    RVar23 = h_RT[4];
    RVar22 = c[6];
    local_1dc8 = h_RT[5];
    dStack_1dc0 = 0.0;
    dVar154 = dVar154 * 216.0;
    local_15c8[5] = dVar154 * RVar15;
    local_15c8[0] = local_698 - local_15c8[5];
    local_15c8[1] = local_17b8 + local_15c8[5];
    local_15c8[4] = local_17a8 - local_15c8[5];
    local_15c8[5] = local_15c8[5] + local_1648;
    dVar69 = dVar154 * RVar14;
    dVar79 = dVar139 * 2.0 * RVar18;
    local_1308 = local_1798 - dVar69;
    local_1300 = local_1300 + dVar69;
    dStack_12f8 = dStack_12f8 + dVar79;
    auVar125._8_8_ = dVar147;
    auVar125._0_8_ = local_1638;
    dVar84 = dVar35 * 1.51 + dVar38 * 1726.0331637101897;
    dStack_1cd0 = auVar6._8_8_;
    dStack_1cd0 = dVar35 * 2.4 + dStack_1cd0;
    auVar134._8_8_ = dVar139;
    auVar134._0_8_ = dVar154;
    auVar90 = divpd(auVar134,auVar125);
    dVar103 = -auVar90._0_8_;
    dVar128 = -auVar90._8_8_;
    dVar147 = dVar128 * RVar20;
    dStack_1458 = dStack_1458 + dVar147;
    dStack_1448 = dStack_1448 - (dVar147 + dVar147);
    local_1440 = dVar147 + local_1440;
    dVar147 = RVar144 * dVar103;
    local_15c8[0x16] = dVar58 - dVar147;
    auStack_1510._0_8_ = (double)uVar13 + dVar147;
    dStack_14f8 = dVar59 - dVar147;
    local_14f0 = dVar147 + local_14f0;
    dVar83 = c[1] * dVar103;
    dVar87 = c[2] * dVar128;
    local_1258 = dVar61 - dVar83;
    local_1250 = local_1250 + dVar83;
    dStack_1248 = dStack_1248 + dVar87;
    dVar59 = RVar15 * RVar14;
    dStack_1780 = RVar18 * RVar18;
    local_1788 = dStack_1780 * dVar139 + RVar20 * c[2] * dVar128;
    dVar58 = RVar144 * RVar16;
    local_1f08[5] = dVar154 * dVar59 + dVar103 * dVar58;
    dVar85 = dVar84 * dVar154 * dVar59 +
             dVar58 * -(dVar84 - (dVar102 - dVar116) * dVar35) * auVar90._0_8_;
    dVar86 = dStack_1cd0 * dVar139 * dStack_1780 +
             -(dStack_1cd0 - ((h_RT[2] + h_RT[5]) - (h_RT[4] + h_RT[4])) * dVar35) * auVar90._8_8_ *
             RVar20 * c[2];
    local_1f08[0] = dVar39 - local_1f08[5];
    local_1f08[1] = dVar56 + local_1f08[5];
    local_1f08[4] = dVar43 - local_1f08[5];
    local_1f08[5] = local_1f08[5] + dVar45;
    local_758[0] = dVar81 - dVar85;
    dVar103 = local_1f08[4] - (local_1788 + local_1788);
    local_758[1] = local_758[1] + dVar85;
    local_758[2] = local_758[2] + dVar86;
    dVar124 = local_1f08[5] + local_1788;
    dVar61 = exp(dVar35 * 251.60833290236002 + dVar62);
    RVar14 = c[3];
    dVar39 = exp(local_1778);
    dVar59 = local_758[3];
    dVar58 = local_1228;
    dVar45 = local_1240;
    dVar43 = local_12d8;
    dVar56 = local_12f0;
    RVar24 = h_RT[6];
    RVar21 = h_RT[3];
    RVar15 = c[7];
    RVar16 = c[4];
    local_1778 = c[5];
    dStack_1770 = 0.0;
    dVar81 = exp(dVar57);
    RVar19 = c[0xe];
    RVar144 = c[1];
    dVar41 = exp(dVar41);
    RVar17 = c[8];
    auVar73._8_8_ = dVar41;
    auVar73._0_8_ = dVar39;
    dVar61 = dVar61 * 29000000.0;
    dVar81 = dVar81 * 20000000.0;
    auVar126._8_8_ = dVar81;
    auVar126._0_8_ = dVar61;
    auVar90 = divpd(auVar126,auVar73);
    dVar39 = RVar20 * RVar14;
    dVar41 = RVar19 * RVar144;
    dVar139 = dVar61 * RVar22;
    dVar128 = RVar18 * RVar22;
    dVar84 = RVar15 * RVar16;
    dVar147 = auVar90._0_8_;
    dVar102 = auVar90._8_8_;
    dVar154 = dVar119 * dVar61 * dVar128 -
              (dVar119 - ((local_1dc8 + RVar21) - (RVar23 + RVar24)) * dVar35) * dVar147 * dVar39;
    dVar116 = (double)local_1df8._0_8_ * dVar81 * dVar84 -
              ((double)local_1df8._0_8_ - ((h_RT[0xe] + h_RT[1]) - (h_RT[7] + h_RT[4])) * dVar35) *
              dVar102 * dVar41;
    dVar119 = dVar128 * dVar61 - dVar39 * dVar147;
    dVar128 = dVar84 * dVar81 - dVar41 * dVar102;
    dVar39 = RVar19 * -dVar102;
    dVar102 = RVar144 * -dVar102;
    local_12f0 = dVar56 + dVar139;
    local_1dc8 = local_10d8;
    local_12e0 = dVar79 + local_12e0 + dVar69 + dVar139;
    local_12d8 = dVar43 - dVar139;
    dVar43 = RVar15 * dVar81;
    dVar81 = dVar81 * RVar16;
    dVar61 = dVar61 * RVar16;
    local_1190 = local_1190 + dVar61;
    dStack_1188 = dStack_1188 - dVar61;
    local_1180 = dVar61 + local_1180;
    dStack_1178 = dStack_1178 - dVar61;
    local_758[3] = dVar59 + dVar154;
    local_758[5] = dVar86 + dVar100 + dVar85 + dVar154;
    local_1f08[2] = local_1788 + local_1f08[2];
    local_1f08[3] = dVar119 + local_1f08[3];
    local_1f08[5] = dVar124 + dVar119;
    dVar56 = local_1778 * -dVar147;
    dVar41 = (double)local_1390._8_8_ - dVar56;
    local_13a0 = dVar56 + local_13a0;
    dStack_1398 = dStack_1398 - dVar56;
    local_1390._8_4_ = SUB84(dVar41,0);
    local_1390._0_8_ = (double)local_1390._0_8_ + dVar56;
    local_1390._12_4_ = (int)((ulong)dVar41 >> 0x20);
    local_1228 = -dVar147 * RVar14;
    local_1240 = dVar45 + local_1228;
    local_1238 = ((local_1238 - dVar83) - (dVar87 + dVar87)) - local_1228;
    local_1230 = dVar87 + local_1230 + dVar83 + local_1228;
    local_1228 = dVar58 - local_1228;
    local_1f08[1] = local_1f08[1] + dVar128;
    local_1f08[0xe] = local_1f08[0xe] + dVar128;
    local_1f08[4] = (dVar103 - dVar119) - dVar128;
    local_1f08[6] = local_1f08[6] - dVar119;
    local_1f08[7] = local_1f08[7] - dVar128;
    auStack_1510._0_8_ = (double)auStack_1510._0_8_ + dVar39;
    dStack_14f8 = dStack_14f8 - dVar39;
    local_14a8 = local_14a8 + dVar39;
    local_14e0 = local_14e0 - dVar39;
    local_1300 = local_1300 + dVar43;
    dStack_12e8 = (((dVar60 - dVar69) - (dVar79 + dVar79)) - dVar139) - dVar43;
    local_1298 = local_1298 + dVar43;
    dStack_12d0 = dStack_12d0 - dVar43;
    local_10f0 = local_10f0 + dVar81;
    local_10d8 = local_10d8 - dVar81;
    local_1088 = local_1088 + dVar81;
    dStack_10c0 = dStack_10c0 - dVar81;
    local_c20 = local_c20 + dVar102;
    local_c08 = local_c08 - dVar102;
    local_bb8 = local_bb8 + dVar102;
    dStack_bf0 = dStack_bf0 - dVar102;
    local_758[1] = local_758[1] + dVar116;
    local_758[4] = (((dVar82 - dVar85) - (dVar86 + dVar86)) - dVar154) - dVar116;
    local_758[6] = local_758[6] - dVar154;
    local_758[7] = local_758[7] - dVar116;
    dStack_6e8 = dStack_6e8 + dVar116;
    local_1798 = c[4];
    dStack_1790 = 0.0;
    dVar41 = exp(dVar57);
    RVar19 = c[0xe];
    RVar144 = c[1];
    dVar103 = exp((double)local_1e58._0_8_);
    dVar102 = dStack_6e8;
    dVar147 = local_758[4];
    dVar139 = local_758[1];
    dVar116 = local_bb8;
    dVar154 = local_c08;
    dVar100 = local_c20;
    dVar82 = local_1040;
    dVar81 = local_1298;
    dVar61 = dStack_12e8;
    dVar60 = local_1300;
    dVar59 = local_14a8;
    dVar58 = dStack_14f8;
    uVar13 = auStack_1510._0_8_;
    RVar23 = h_RT[0xe];
    RVar21 = h_RT[1];
    RVar20 = c[9];
    RVar14 = c[4];
    dVar45 = local_1f08[0xe];
    dVar43 = local_1f08[4];
    dVar56 = local_1f08[1];
    local_1e58._0_8_ = local_14d8;
    local_1788 = local_12c8;
    local_1778 = local_1008;
    local_1dc8 = local_fd8;
    local_1638 = h_RT[4];
    uStack_1630 = 0;
    local_1648 = h_RT[8];
    dStack_1640 = 0.0;
    dVar39 = exp(dVar35 * -2727.4343286615826 + dVar63);
    RVar18 = c[7];
    RVar15 = c[5];
    auVar49._0_8_ = exp(local_1628);
    RVar22 = c[9];
    RVar16 = c[4];
    dVar39 = dVar39 * 56.0;
    dVar41 = dVar41 * 30000000.0;
    auVar49._8_8_ = dVar103;
    auVar135._8_8_ = dVar41;
    auVar135._0_8_ = dVar39;
    auVar90 = divpd(auVar135,auVar49);
    dVar103 = RVar18 * RVar15;
    dVar119 = RVar19 * RVar144;
    dVar128 = RVar14 * RVar20;
    dVar69 = RVar17 * local_1798;
    dVar79 = auVar90._0_8_;
    dVar83 = auVar90._8_8_;
    dVar87 = dVar117 * dVar39 * dVar128 -
             (dVar117 - ((h_RT[7] + h_RT[5]) - (h_RT[9] + h_RT[4])) * dVar35) * dVar79 * dVar103;
    dVar84 = (double)local_1df8._0_8_ * dVar41 * dVar69 -
             ((double)local_1df8._0_8_ - ((RVar23 + RVar21) - (local_1638 + local_1648)) * dVar35) *
             dVar83 * dVar119;
    dVar128 = dVar128 * dVar39 - dVar103 * dVar79;
    dVar119 = dVar69 * dVar41 - dVar119 * dVar83;
    dVar103 = RVar20 * dVar39;
    dVar39 = dVar39 * RVar14;
    dVar117 = RVar17 * dVar41;
    local_1300 = dVar60 + dVar117;
    local_1638 = local_1238;
    local_1628 = local_10b0;
    local_12c8 = local_1788 - dVar117;
    local_1298 = dVar117 + dVar81;
    dVar41 = dVar41 * local_1798;
    local_1040 = dVar82 + dVar41;
    local_1028 = local_1028 - dVar41;
    local_1008 = local_1778 - dVar41;
    local_fd8 = dVar41 + local_1dc8;
    local_758[1] = dVar139 + dVar84;
    dStack_6e8 = dVar84 + dVar102;
    local_1f08[1] = dVar56 + dVar119;
    local_1f08[0xe] = dVar119 + dVar45;
    dVar41 = RVar18 * -dVar79;
    dVar56 = RVar15 * -dVar79;
    local_14a8 = RVar19 * -dVar83;
    auStack_1510._0_8_ = (double)uVar13 + local_14a8;
    dStack_14f8 = dVar58 - local_14a8;
    local_14d8 = (double)local_1e58._0_8_ - local_14a8;
    local_14a8 = local_14a8 + dVar59;
    local_bb8 = RVar144 * -dVar83;
    local_c20 = dVar100 + local_bb8;
    local_c08 = dVar154 - local_bb8;
    local_be8 = local_be8 - local_bb8;
    local_bb8 = local_bb8 + dVar116;
    local_1f08[4] = (dVar43 - dVar119) - dVar128;
    local_1f08[5] = local_1f08[5] + dVar128;
    local_1f08[7] = local_1f08[7] + dVar128;
    local_1f08[8] = local_1f08[8] - dVar119;
    local_1f08[9] = local_1f08[9] - dVar128;
    dStack_12e8 = (dVar61 - dVar117) - dVar103;
    local_12e0 = local_12e0 + dVar103;
    dStack_12d0 = dStack_12d0 + dVar103;
    local_12c0 = local_12c0 - dVar103;
    local_1238 = local_1238 - dVar41;
    local_1230 = local_1230 + dVar41;
    local_1220 = local_1220 + dVar41;
    local_1210 = local_1210 - dVar41;
    local_10d8 = local_10d8 - dVar56;
    local_10d0 = local_10d0 + dVar56;
    dStack_10c0 = dStack_10c0 + dVar56;
    local_10b0 = local_10b0 - dVar56;
    local_f78 = local_f78 - dVar39;
    local_f70 = local_f70 + dVar39;
    local_f60 = local_f60 + dVar39;
    local_f50 = local_f50 - dVar39;
    local_758[5] = local_758[5] + dVar87;
    local_758[4] = (dVar147 - dVar84) - dVar87;
    local_758[7] = local_758[7] + dVar87;
    local_758[8] = local_758[8] - dVar84;
    local_758[9] = local_758[9] - dVar87;
    dVar39 = c[4] * c[9];
    dVar102 = exp(dVar57);
    RVar15 = c[8];
    RVar144 = c[5];
    dVar102 = dVar102 * 25010000.0;
    dVar41 = c[5] * c[8];
    dVar56 = exp(local_1618);
    RVar20 = c[10];
    RVar14 = c[4];
    dVar56 = dVar102 / dVar56;
    dVar43 = dVar102 * dVar39 - dVar41 * dVar56;
    dVar39 = (double)local_1df8._0_8_ * dVar102 * dVar39 -
             ((double)local_1df8._0_8_ - ((h_RT[5] + h_RT[8]) - (h_RT[4] + h_RT[9])) * dVar35) *
             dVar56 * dVar41;
    local_1f08[4] = local_1f08[4] - dVar43;
    local_1f08[5] = local_1f08[5] + dVar43;
    local_1f08[9] = local_1f08[9] - dVar43;
    local_1f08[8] = dVar43 + local_1f08[8];
    dVar41 = RVar22 * dVar102;
    dStack_12e8 = dStack_12e8 - dVar41;
    local_12e0 = local_12e0 + dVar41;
    local_12c8 = local_12c8 + dVar41;
    local_12c0 = local_12c0 - dVar41;
    dVar41 = RVar15 * -dVar56;
    local_1238 = local_1238 - dVar41;
    local_1230 = local_1230 + dVar41;
    local_1218 = local_1218 + dVar41;
    local_1210 = local_1210 - dVar41;
    dVar41 = -dVar56 * RVar144;
    local_1028 = local_1028 - dVar41;
    local_1020 = local_1020 + dVar41;
    local_1008 = local_1008 + dVar41;
    local_1000 = local_1000 - dVar41;
    dVar102 = dVar102 * RVar16;
    local_1e58._0_8_ = local_f78 - dVar102;
    dVar119 = local_f70 + dVar102;
    local_f58 = local_f58 + dVar102;
    dVar102 = local_f50 - dVar102;
    local_758[4] = local_758[4] - dVar39;
    local_758[5] = local_758[5] + dVar39;
    local_758[8] = local_758[8] + dVar39;
    local_758[9] = local_758[9] - dVar39;
    dVar41 = exp(dVar35 * -1570.0359973107265 + dVar63);
    RVar18 = c[9];
    RVar15 = c[5];
    dVar39 = exp(dVar129);
    dVar147 = local_758[5];
    dVar139 = local_758[4];
    dVar116 = local_e98;
    dVar154 = local_ea0;
    dVar100 = local_ec8;
    dVar82 = local_f48;
    dVar81 = local_1210;
    dVar61 = local_1230;
    dVar60 = local_1238;
    dVar59 = local_12e0;
    dVar58 = dStack_12e8;
    RVar24 = h_RT[9];
    RVar23 = h_RT[5];
    RVar21 = h_RT[4];
    RVar22 = c[0xb];
    RVar16 = c[4];
    dVar45 = local_1f08[9];
    dVar43 = local_1f08[4];
    local_1788 = h_RT[10];
    dStack_1780 = h_RT[0xb];
    local_1778 = local_12c0;
    local_1628 = local_12b8;
    local_1618 = local_ec0;
    local_1dc8 = local_758[9];
    dVar56 = exp(dVar104 + dVar35 * -35.225166606330404);
    RVar17 = c[0xc];
    RVar144 = c[1];
    dVar44 = exp((dVar44 + dVar42) - local_1c98);
    RVar19 = c[0xd];
    dVar103 = dVar35 * 1.6 + dVar38 * 1570.0359973107265;
    dStack_1b80 = auVar7._8_8_;
    dStack_1b80 = dVar35 * 1.228 + dStack_1b80;
    auVar94._8_8_ = dVar44;
    auVar94._0_8_ = dVar39;
    dVar41 = dVar41 * 100.0;
    dVar56 = dVar56 * 47.6;
    auVar113._8_8_ = dVar56;
    auVar113._0_8_ = dVar41;
    auVar90 = divpd(auVar113,auVar94);
    dVar39 = RVar18 * RVar15;
    dVar128 = RVar17 * RVar144;
    local_12b8 = dVar41 * RVar20;
    dVar129 = RVar14 * RVar20;
    dVar69 = RVar22 * RVar16;
    dVar63 = auVar90._0_8_;
    dVar79 = auVar90._8_8_;
    dVar44 = dVar103 * dVar41 * dVar129 -
             (dVar103 - ((RVar24 + RVar23) - (RVar21 + local_1788)) * dVar35) * dVar63 * dVar39;
    dVar117 = dStack_1b80 * dVar56 * dVar69 -
              (dStack_1b80 - ((h_RT[0xc] + h_RT[1]) - (h_RT[0xb] + h_RT[4])) * dVar35) * dVar79 *
              dVar128;
    dVar129 = dVar129 * dVar41 - dVar39 * dVar63;
    dVar128 = dVar69 * dVar56 - dVar128 * dVar79;
    dVar103 = RVar22 * dVar56;
    dVar56 = dVar56 * RVar16;
    dVar39 = RVar17 * -dVar79;
    dVar69 = RVar144 * -dVar79;
    dStack_12e8 = dVar58 - local_12b8;
    local_1788 = local_758[1];
    local_12e0 = dVar59 + local_12b8;
    local_12c0 = local_1778 + local_12b8;
    local_12b8 = local_1628 - local_12b8;
    dVar41 = dVar41 * RVar14;
    local_ec8 = dVar100 - dVar41;
    local_ec0 = local_1618 + dVar41;
    local_ea0 = dVar154 + dVar41;
    local_e98 = dVar116 - dVar41;
    local_758[4] = dVar139 - dVar44;
    local_758[5] = dVar147 + dVar44;
    local_1f08[1] = dVar128 + local_1f08[1];
    local_758[9] = local_1dc8 + dVar44;
    local_1f08[9] = dVar45 + dVar129;
    dVar41 = RVar18 * -dVar63;
    local_1238 = dVar60 - dVar41;
    local_1230 = dVar61 + dVar41;
    local_1210 = dVar81 + dVar41;
    local_1208 = local_1208 - dVar41;
    local_f48 = -dVar63 * RVar15;
    local_f78 = (double)local_1e58._0_8_ - local_f48;
    local_f70 = dVar119 + local_f48;
    local_f50 = dVar102 + local_f48;
    local_f48 = dVar82 - local_f48;
    local_1f08[4] = (dVar43 - dVar129) - dVar128;
    local_1f08[5] = dVar129 + local_1f08[5];
    local_1f08[10] = local_1f08[10] - dVar129;
    local_1f08[0xb] = local_1f08[0xb] - dVar128;
    auStack_1510._0_8_ = (double)auStack_1510._0_8_ + dVar39;
    dStack_14f8 = dStack_14f8 - dVar39;
    local_14b8 = local_14b8 + dVar39;
    local_14c0 = local_14c0 - dVar39;
    local_1300 = local_1300 + dVar103;
    local_12a8 = local_12a8 + dVar103;
    dVar102 = dStack_12e8 - dVar103;
    dVar103 = local_12b0 - dVar103;
    local_e30 = local_e30 + dVar56;
    local_dd8 = local_dd8 + dVar56;
    dVar116 = local_e18 - dVar56;
    dStack_de0 = dStack_de0 - dVar56;
    local_d80 = local_d80 + dVar69;
    local_d68 = local_d68 - dVar69;
    local_d28 = local_d28 + dVar69;
    local_d30 = local_d30 - dVar69;
    local_758[1] = local_758[1] + dVar117;
    dVar119 = local_758[4] - dVar117;
    local_708._0_8_ = (double)local_708._0_8_ - dVar44;
    local_708._8_8_ = (double)local_708._8_8_ - dVar117;
    local_1618 = c[4];
    uStack_1610 = 0;
    dVar139 = exp(dVar57);
    RVar16 = c[5];
    local_1628 = c[0xb];
    uStack_1620 = 0;
    local_1778 = exp((dVar131 - dVar42) + dVar40);
    dVar154 = local_c70;
    dVar100 = local_c80;
    dVar82 = local_cb8;
    dVar81 = dStack_de0;
    dVar61 = local_11f0;
    dVar60 = local_1200;
    dVar59 = local_1230;
    dVar58 = local_1238;
    dVar45 = local_12a0;
    dVar44 = local_12e0;
    RVar23 = h_RT[0xb];
    RVar21 = h_RT[5];
    RVar17 = h_RT[4];
    RVar20 = c[0xe];
    RVar144 = c[4];
    dVar43 = local_1f08[0xd];
    dVar56 = local_1f08[4];
    local_1e58._0_8_ = local_dd0;
    local_1dc8 = dStack_6f0;
    local_1788 = h_RT[0xd];
    dStack_1780 = 0.0;
    dVar147 = exp(dVar120 + dVar35 * 224.93784961470985);
    RVar18 = c[0xd];
    RVar15 = c[5];
    auVar50._0_8_ = exp(__x_00);
    RVar22 = c[0x12];
    RVar14 = c[4];
    auVar50._8_8_ = local_1778;
    dVar147 = dVar147 * 3430.0;
    dVar139 = dVar139 * 50000000.0;
    auVar74._8_8_ = dVar139;
    auVar74._0_8_ = dVar147;
    auVar90 = divpd(auVar74,auVar50);
    dVar63 = RVar15 * RVar18;
    dVar79 = local_1628 * RVar16;
    dVar129 = RVar144 * RVar20;
    dVar69 = RVar19 * local_1618;
    dVar41 = RVar19 * dVar139;
    local_12b0 = dVar103 + dVar41;
    dVar39 = dVar139 * local_1618;
    local_c80 = dVar100 + dVar39;
    dVar100 = auVar90._0_8_;
    dVar103 = auVar90._8_8_;
    dVar83 = dVar105 * dVar147 * dVar129 -
             (dVar105 - ((h_RT[0xd] + h_RT[5]) - (h_RT[0xe] + h_RT[4])) * dVar35) * dVar100 * dVar63
    ;
    dVar87 = (double)local_1df8._0_8_ * dVar139 * dVar69 -
             ((double)local_1df8._0_8_ - ((RVar21 + RVar23) - (RVar17 + local_1788)) * dVar35) *
             dVar103 * dVar79;
    local_708._8_8_ = dVar87 + (double)local_708._8_8_;
    local_6f8 = dVar117 + local_6f8;
    dVar117 = dVar129 * dVar147 - dVar63 * dVar100;
    dVar139 = dVar69 * dVar139 - dVar79 * dVar103;
    local_1f08[0xb] = dVar139 + local_1f08[0xb];
    auVar9._8_4_ = SUB84(dVar128 + local_1f08[0xc],0);
    auVar9._0_8_ = local_1f08[0xb];
    auVar9._12_4_ = (int)((ulong)(dVar128 + local_1f08[0xc]) >> 0x20);
    local_1f08[0xc] = auVar9._8_8_;
    dVar128 = local_1628 * -dVar103;
    local_1200 = dVar60 + dVar128;
    local_dd0 = RVar16 * -dVar103;
    local_e18 = dVar116 - local_dd0;
    local_e10 = local_e10 + local_dd0;
    dStack_de0 = dVar81 + local_dd0;
    local_dd0 = (double)local_1e58._0_8_ - local_dd0;
    local_1f08[4] = (dVar56 - dVar139) - dVar117;
    local_1f08[5] = local_1f08[5] + dVar139 + dVar117;
    local_1f08[0xd] = (dVar43 - dVar139) + dVar117;
    local_1f08[0xe] = local_1f08[0xe] - dVar117;
    dVar56 = RVar144 * dVar147;
    dVar147 = dVar147 * RVar20;
    dStack_12e8 = (dVar102 - dVar41) - dVar147;
    local_12e0 = dVar44 + dVar41 + dVar147;
    local_1298 = local_1298 - dVar147;
    local_12a0 = dVar147 + (dVar45 - dVar41);
    local_11f0 = RVar18 * -dVar100;
    local_1238 = (dVar58 - dVar128) - local_11f0;
    local_1230 = dVar59 + dVar128 + local_11f0;
    local_11e8 = local_11e8 - local_11f0;
    local_11f0 = local_11f0 + (dVar61 - dVar128);
    dVar41 = -dVar100 * RVar15;
    local_cb8 = (dVar82 - dVar39) - dVar41;
    local_cb0 = local_cb0 + dVar39 + dVar41;
    local_c70 = (dVar154 - dVar39) + dVar41;
    local_c68 = local_c68 - dVar41;
    local_c08 = local_c08 - dVar56;
    local_c00 = local_c00 + dVar56;
    local_bc0 = local_bc0 + dVar56;
    local_bb8 = local_bb8 - dVar56;
    local_758[4] = (dVar119 - dVar87) - dVar83;
    local_758[5] = local_758[5] + dVar87 + dVar83;
    dStack_6f0 = (local_1dc8 - dVar87) + dVar83;
    dStack_6e8 = dStack_6e8 - dVar83;
    dVar147 = exp(dVar121 + dVar35 * -437.79849925010643);
    RVar20 = c[0x11];
    dVar102 = exp(local_1e38);
    dVar139 = local_6c8;
    dVar116 = dStack_6d0;
    dVar154 = local_758[4];
    dVar100 = local_8d8;
    dVar82 = local_948;
    dVar81 = local_988;
    dVar61 = local_990;
    dVar60 = local_9f8;
    dVar59 = local_1230;
    dVar58 = local_1238;
    dVar45 = local_1278;
    dVar44 = local_1280;
    dVar43 = local_12e0;
    dVar56 = dStack_12e8;
    RVar19 = h_RT[0x12];
    RVar17 = h_RT[0x11];
    RVar144 = c[6];
    dVar39 = local_1e78;
    uVar13 = auStack_1e88._8_8_;
    dVar41 = local_1f08[4];
    local_1e58._0_8_ = local_11d0;
    local_1dc8 = local_8e0;
    local_1e38 = c[7];
    dStack_1e30 = 0.0;
    local_1618 = h_RT[4];
    uStack_1610 = 0;
    dVar103 = exp(dVar57);
    RVar15 = c[0xe];
    auVar51._0_8_ = exp(local_1dd8);
    RVar18 = c[9];
    RVar16 = c[6];
    dVar103 = dVar103 * 20000000.0;
    dVar147 = dVar147 * 3.54;
    auVar51._8_8_ = dVar102;
    auVar146._8_8_ = dVar147;
    auVar146._0_8_ = dVar103;
    auVar90 = divpd(auVar146,auVar51);
    dVar102 = local_1e38 * RVar144;
    dVar117 = RVar22 * RVar14;
    dVar119 = RVar15 * c[4];
    dVar129 = RVar20 * c[5];
    dVar79 = auVar90._0_8_;
    dVar83 = auVar90._8_8_;
    dVar69 = dVar103 * dVar102 - dVar119 * dVar79;
    dVar63 = dVar147 * dVar117 - dVar129 * dVar83;
    dVar128 = RVar22 * dVar147;
    local_1dd8 = local_bf8;
    dStack_1dd0 = dStack_bf0;
    local_12e0 = dVar43 + dVar128;
    local_1280 = dVar44 + dVar128;
    local_1278 = dVar45 - dVar128;
    local_8d8 = dVar147 * RVar14;
    local_948 = dVar82 - local_8d8;
    local_940 = local_940 + local_8d8;
    local_8e0 = local_1dc8 + local_8d8;
    local_8d8 = dVar100 - local_8d8;
    dVar45 = local_1e38 * dVar103;
    dVar87 = RVar144 * dVar103;
    dVar82 = (double)local_1df8._0_8_ * dVar103 * dVar102 -
             ((double)local_1df8._0_8_ - ((h_RT[0xe] + h_RT[4]) - (h_RT[7] + h_RT[6])) * dVar35) *
             dVar79 * dVar119;
    dVar43 = dVar106 * dVar147 * dVar117 -
             (dVar106 - ((RVar17 + h_RT[5]) - (RVar19 + local_1618)) * dVar35) * dVar83 * dVar129;
    dStack_6d0 = dVar116 + dVar43;
    local_6c8 = dVar139 - dVar43;
    auStack_1e88._8_8_ = (double)uVar13 + dVar63;
    local_1e78 = dVar39 - dVar63;
    dVar100 = c[4] * -dVar79;
    local_988 = c[5] * -dVar83;
    dVar39 = RVar15 * -dVar79;
    dVar44 = -dVar83 * RVar20;
    local_1238 = dVar58 - dVar44;
    local_1230 = dVar59 + dVar44;
    local_11d0 = (double)local_1e58._0_8_ + dVar44;
    local_11c8 = local_11c8 - dVar44;
    local_9f8 = dVar60 - local_988;
    local_9f0 = local_9f0 + local_988;
    local_990 = dVar61 + local_988;
    local_988 = dVar81 - local_988;
    local_1f08[4] = (dVar41 - dVar63) + dVar69;
    local_1f08[5] = local_1f08[5] + dVar63;
    local_1f08[6] = local_1f08[6] - dVar69;
    local_1f08[0xe] = local_1f08[0xe] + dVar69;
    dStack_12e8 = (dVar56 - dVar128) + dVar39;
    local_1298 = local_1298 + dVar39;
    local_12d8 = local_12d8 - dVar39;
    dStack_12d0 = dStack_12d0 - dVar39;
    dStack_1188 = dStack_1188 + dVar45;
    local_1138 = local_1138 + dVar45;
    dStack_1178 = dStack_1178 - dVar45;
    dStack_1170 = dStack_1170 - dVar45;
    local_10d8 = local_10d8 + dVar87;
    local_1088 = local_1088 + dVar87;
    local_10c8 = local_10c8 - dVar87;
    dStack_10c0 = dStack_10c0 - dVar87;
    local_c08 = local_c08 + dVar100;
    local_bb8 = local_bb8 + dVar100;
    local_bf8 = local_bf8 - dVar100;
    dStack_bf0 = dStack_bf0 - dVar100;
    local_758[4] = (dVar154 - dVar43) + dVar82;
    local_758[5] = local_758[5] + dVar43;
    local_758[6] = local_758[6] - dVar82;
    dStack_6e8 = dStack_6e8 + dVar82;
    dVar39 = exp(dVar57);
    local_1e38 = c[10];
    dStack_1e30 = 0.0;
    dVar100 = exp(dVar36);
    dVar81 = local_758[9];
    dVar61 = local_758[3];
    dVar60 = local_e98;
    dVar59 = local_ea0;
    dVar41 = local_f48;
    dVar58 = local_f50;
    dVar45 = dStack_1178;
    dVar44 = local_13a0;
    RVar21 = h_RT[10];
    RVar19 = h_RT[9];
    RVar17 = h_RT[6];
    RVar14 = c[9];
    RVar144 = c[6];
    dVar43 = local_1f08[9];
    dVar56 = local_1f08[3];
    uVar13 = local_1390._8_8_;
    local_1dd8 = local_1370;
    local_1dc8 = local_1190;
    local_1e58._0_8_ = local_ed0;
    dVar36 = exp(dVar57);
    RVar20 = c[0xf];
    auVar52._0_8_ = exp((dStack_1ce0 + dVar162) - dVar80);
    RVar22 = c[0xb];
    RVar15 = c[6];
    auVar52._8_8_ = dVar100;
    dVar36 = dVar36 * 20000000.0;
    dVar39 = dVar39 * 1000000.0;
    auVar158._8_8_ = dVar39;
    auVar158._0_8_ = dVar36;
    auVar90 = divpd(auVar158,auVar52);
    dVar116 = c[4] * RVar20;
    dVar102 = RVar144 * RVar14;
    dVar103 = RVar18 * RVar16;
    dVar117 = auVar90._0_8_;
    dVar119 = auVar90._8_8_;
    local_1f08[9] = dVar36 * dVar102 - dVar116 * dVar117;
    dVar139 = dVar39 * dVar103 - c[3] * local_1e38 * dVar119;
    dVar147 = RVar18 * dVar39;
    local_1190 = local_1dc8 + dVar147;
    local_1dc8 = local_b30;
    local_1158 = dVar147 + local_1158;
    dVar100 = dVar39 * RVar16;
    local_f80 = local_f80 + dVar100;
    local_f48 = dVar100 + dVar41;
    dVar154 = RVar14 * dVar36;
    local_f50 = RVar144 * dVar36;
    dVar36 = dVar36 * local_1de8 * dVar102 -
             (local_1de8 - ((h_RT[4] + h_RT[0xf]) - (h_RT[9] + h_RT[6])) * dVar35) * dVar117 *
             dVar116;
    dVar41 = dVar39 * dStack_1de0 * dVar103 -
             (dStack_1de0 - ((h_RT[3] + RVar21) - (RVar17 + RVar19)) * dVar35) * dVar119 *
             c[3] * local_1e38;
    local_758[3] = dVar61 + dVar41;
    local_758[7] = local_758[7] - dVar82;
    local_1f08[3] = dVar56 + dVar139;
    local_1f08[7] = local_1f08[7] - dVar69;
    dVar56 = RVar20 * -dVar117;
    dVar61 = c[4] * -dVar117;
    dVar39 = local_1e38 * -dVar119;
    local_13a0 = dVar44 + dVar39;
    local_1370 = local_1dd8 - dVar39;
    local_1368 = dVar39 + local_1368;
    local_e98 = c[3] * -dVar119;
    local_ed0 = (double)local_1e58._0_8_ + local_e98;
    local_eb8 = local_eb8 - local_e98;
    local_ea0 = dVar59 - local_e98;
    local_e98 = local_e98 + dVar60;
    local_1f08[4] = local_1f08[4] + local_1f08[9];
    local_1f08[6] = (local_1f08[6] - dVar139) - local_1f08[9];
    local_1f08[0xf] = local_1f08[0xf] + local_1f08[9];
    local_1f08[9] = (dVar43 - dVar139) - local_1f08[9];
    local_1f08[10] = dVar139 + local_1f08[10];
    dStack_12e8 = dStack_12e8 + dVar56;
    local_12d8 = local_12d8 - dVar56;
    local_1290 = local_1290 + dVar56;
    local_12c0 = local_12c0 - dVar56;
    dStack_1188 = dStack_1188 + dVar154;
    dStack_1178 = (dVar45 - dVar147) - dVar154;
    local_1130 = local_1130 + dVar154;
    local_1160 = (local_1160 - dVar147) - dVar154;
    local_f78 = local_f78 + local_f50;
    local_f20 = local_f20 + local_f50;
    local_f68 = (local_f68 - dVar100) - local_f50;
    local_f50 = (dVar58 - dVar100) - local_f50;
    local_b58 = local_b58 + dVar61;
    local_b48 = local_b48 - dVar61;
    local_b00 = local_b00 + dVar61;
    local_b30 = local_b30 - dVar61;
    local_758[4] = local_758[4] + dVar36;
    local_758[6] = (local_758[6] - dVar41) - dVar36;
    local_708._0_8_ = dVar41 + (double)local_708._0_8_;
    local_758[9] = (dVar81 - dVar41) - dVar36;
    dStack_6e0 = dStack_6e0 + dVar36;
    local_1390._8_8_ = (double)uVar13 - dVar39;
    dVar116 = exp(dVar35 * -11875.913312991392 + dVar62);
    RVar17 = c[0xc];
    local_1e38 = c[4];
    dStack_1e30 = 0.0;
    dVar36 = exp((dVar162 + dVar42) - local_1c98);
    uVar13 = local_708._8_8_;
    dVar154 = local_758[4];
    dVar100 = local_d28;
    dVar82 = local_d30;
    dVar81 = local_d68;
    dVar61 = local_dd8;
    dVar60 = dStack_de0;
    dVar59 = local_e18;
    dVar58 = dStack_1178;
    dVar45 = dStack_1188;
    dVar44 = local_12a8;
    dVar43 = local_12b0;
    dVar56 = local_12d8;
    RVar24 = h_RT[0xc];
    RVar23 = h_RT[6];
    RVar21 = h_RT[4];
    RVar18 = c[7];
    RVar14 = c[3];
    dVar41 = local_1f08[0xb];
    dVar39 = local_1f08[4];
    local_1dc8 = h_RT[0xb];
    dStack_1dc0 = h_RT[0xc];
    local_1e58._0_8_ = dStack_12e8;
    local_1dd8 = local_d58;
    dVar139 = exp(dVar35 * -754.82499870708 + dVar62);
    RVar19 = c[0xd];
    RVar16 = c[4];
    dVar147 = exp((local_1a18 + dVar142) - dVar40);
    RVar20 = c[7];
    RVar144 = c[0];
    dVar129 = dVar38 * 11875.913312991392 + local_1e08;
    dVar69 = dVar38 * 754.82499870708 + dStack_1e00;
    auVar75._8_8_ = dVar147;
    auVar75._0_8_ = dVar36;
    dVar116 = dVar116 * 150000000.0;
    dVar139 = dVar139 * 13200000.0;
    auVar114._8_8_ = dVar139;
    auVar114._0_8_ = dVar116;
    auVar90 = divpd(auVar114,auVar75);
    dVar102 = local_1e38 * RVar17;
    dVar103 = RVar19 * RVar16;
    dVar117 = dVar116 * RVar22;
    dVar79 = RVar22 * RVar15;
    dVar83 = RVar18 * RVar14;
    dVar147 = local_1dc8 + RVar23;
    dVar63 = RVar18 * dVar139;
    dVar87 = dVar139 * RVar14;
    dVar119 = auVar90._0_8_;
    dVar128 = auVar90._8_8_;
    dVar84 = RVar19 * -dVar128;
    dVar36 = RVar16 * -dVar128;
    dStack_1188 = dVar45 + dVar117;
    local_1e08 = local_ca0;
    local_1dc8 = local_1090;
    dStack_1178 = dVar58 - dVar117;
    local_1150 = local_1150 - dVar117;
    local_1148 = dVar117 + local_1148;
    local_dd8 = RVar15 * dVar116;
    local_e18 = dVar59 + local_dd8;
    local_e08 = local_e08 - local_dd8;
    dStack_de0 = dVar60 - local_dd8;
    local_dd8 = local_dd8 + dVar61;
    dVar45 = dVar129 * dVar116 * dVar79 -
             (dVar129 - ((RVar21 + RVar24) - dVar147) * dVar35) * dVar119 * dVar102;
    dVar58 = dVar69 * dVar139 * dVar83 -
             (dVar69 - ((h_RT[0xd] + h_RT[4]) - (h_RT[7] + h_RT[3])) * dVar35) * dVar128 * dVar103;
    local_708._8_8_ = (double)uVar13 - dVar45;
    dVar59 = dVar79 * dVar116 - dVar102 * dVar119;
    dVar60 = dVar83 * dVar139 - dVar103 * dVar128;
    local_1f08[0xb] = dVar41 - dVar59;
    dVar41 = RVar17 * -dVar119;
    local_12d8 = dVar56 - dVar41;
    local_12b0 = dVar43 - dVar41;
    local_12a8 = dVar41 + dVar44;
    local_d28 = -dVar119 * local_1e38;
    local_d68 = dVar81 + local_d28;
    local_d58 = local_1dd8 - local_d28;
    local_d30 = dVar82 - local_d28;
    local_d28 = local_d28 + dVar100;
    local_1f08[3] = local_1f08[3] - dVar60;
    local_1f08[4] = dVar60 + dVar39 + dVar59;
    local_1f08[6] = local_1f08[6] - dVar59;
    local_1f08[7] = local_1f08[7] - dVar60;
    local_1f08[0xc] = dVar59 + local_1f08[0xc];
    local_1f08[0xd] = dVar60 + local_1f08[0xd];
    local_13a0 = local_13a0 - dVar63;
    dStack_1398 = dStack_1398 + dVar63;
    local_1350 = local_1350 + dVar63;
    local_1380 = local_1380 - dVar63;
    local_12f0 = local_12f0 - dVar84;
    dStack_12e8 = (double)local_1e58._0_8_ + dVar41 + dVar84;
    local_12a0 = local_12a0 + dVar84;
    dStack_12d0 = dStack_12d0 - dVar84;
    local_10e0 = local_10e0 - dVar87;
    local_10d8 = local_10d8 + dVar87;
    local_1090 = local_1090 + dVar87;
    dStack_10c0 = dStack_10c0 - dVar87;
    local_cc0 = local_cc0 - dVar36;
    local_cb8 = local_cb8 + dVar36;
    local_c70 = local_c70 + dVar36;
    local_ca0 = local_ca0 - dVar36;
    local_758[3] = local_758[3] - dVar58;
    local_758[4] = dVar154 + dVar45 + dVar58;
    local_758[6] = local_758[6] - dVar45;
    local_758[7] = local_758[7] - dVar58;
    local_6f8 = dVar45 + local_6f8;
    dStack_6f0 = dVar58 + dStack_6f0;
    dVar117 = c[0] * c[7];
    dVar119 = exp(dVar35 * -3638.256493768126 + dVar101);
    RVar16 = c[9];
    RVar14 = c[1];
    dVar69 = c[1] * c[9];
    dVar128 = exp(local_1768);
    dVar102 = local_758[9];
    dVar147 = local_758[7];
    dVar101 = local_758[1];
    dVar139 = local_758[0];
    dVar154 = local_f50;
    dVar100 = local_f90;
    dVar82 = local_f98;
    dVar81 = local_10b0;
    dVar61 = dStack_10c0;
    dVar60 = local_10f0;
    dVar59 = dStack_14d0;
    dVar58 = local_14e0;
    uVar25 = auStack_1510._0_8_;
    dVar45 = local_15c8[9];
    dVar44 = local_15c8[7];
    dVar43 = local_15c8[1];
    dVar36 = local_15c8[0];
    RVar18 = c[9];
    dVar39 = local_1f08[9];
    dVar56 = local_1f08[7];
    dVar41 = local_1f08[1];
    local_1dc8 = dVar107 - ((h_RT[1] + h_RT[9]) - (h_RT[0] + h_RT[7])) * dVar35;
    local_1768 = local_1f08[0];
    local_1e58._0_8_ = local_15c8[0x16];
    local_1e58._8_8_ = auStack_1510._0_8_;
    local_1e38 = local_f60;
    dVar129 = exp(dVar57);
    RVar15 = c[0x10];
    local_1e08 = c[1];
    local_1dd8 = c[1] * c[0x10];
    dVar140 = exp(dVar140);
    dVar103 = dStack_6d8;
    dVar116 = local_f18;
    RVar17 = h_RT[7];
    RVar22 = c[10];
    uVar13 = auStack_1e88._0_8_;
    auVar136._8_8_ = dVar140;
    auVar136._0_8_ = dVar128;
    dVar119 = dVar119 * 0.5;
    dVar129 = dVar129 * 40000000.0;
    auVar95._8_8_ = dVar129;
    auVar95._0_8_ = dVar119;
    auVar90 = divpd(auVar95,auVar136);
    dStack_1770 = auVar90._8_8_;
    dVar128 = -auVar90._0_8_;
    dVar140 = -dStack_1770;
    dVar132 = dVar119 * dVar117 + dVar69 * dVar128;
    dVar85 = dVar107 * dVar119 * dVar117 - local_1dc8 * auVar90._0_8_ * dVar69;
    local_1f08[0] = local_1768 - dVar132;
    local_15c8[9] = RVar20 * dVar119;
    local_15c8[0] = dVar36 - local_15c8[9];
    local_15c8[1] = dVar43 + local_15c8[9];
    local_15c8[7] = dVar44 - local_15c8[9];
    local_15c8[9] = local_15c8[9] + dVar45;
    dVar119 = RVar144 * dVar119;
    local_10f8 = local_10f8 - dVar119;
    dVar86 = RVar14 * dVar128;
    local_f98 = dVar82 - dVar86;
    local_1e38 = local_1e38 - dVar86;
    local_758[0] = dVar139 - dVar85;
    dVar128 = RVar16 * dVar128;
    dVar36 = RVar15 * dVar140;
    local_15c8[0x16] = (double)local_1e58._0_8_ - dVar128;
    auStack_1510._0_8_ = (double)uVar25 + dVar128 + dVar36;
    local_14e0 = (dVar58 - dVar128) - dVar36;
    dStack_14d0 = (dVar59 + dVar128) - dVar36;
    local_1498 = local_1498 + dVar36;
    dVar79 = dVar129 * RVar18;
    local_10f0 = dVar60 + dVar119 + dVar79;
    dVar124 = local_1dd8 * dVar140;
    local_1078 = dVar79 + local_1078;
    dVar140 = local_1e08 * dVar140;
    local_ac0 = local_ac0 + dVar140;
    local_a90 = local_a90 - dVar140;
    dStack_a80 = dStack_a80 - dVar140;
    dVar36 = (double)local_1df8._0_8_ * dVar129;
    local_a48 = dVar140 + local_a48;
    local_1778 = dStack_1770 *
                 ((double)local_1df8._0_8_ - ((h_RT[1] + h_RT[0x10]) - (h_RT[9] + h_RT[7])) * dVar35
                 ) * local_1dd8;
    local_1f08[1] = dVar41 + dVar132;
    local_1f08[7] = dVar56 - dVar132;
    local_1f08[9] = dVar132 + dVar39;
    local_1e08 = exp(local_1608);
    RVar20 = c[9];
    local_1618 = exp(__x);
    uVar25 = local_708._0_8_;
    dVar59 = local_e98;
    dVar58 = local_f48;
    dVar44 = local_1f08[10];
    dVar83 = RVar17 + h_RT[10];
    dVar82 = h_RT[9] + h_RT[9];
    local_1608 = local_ea0;
    local_1628 = c[7];
    uStack_1620 = 0;
    dVar139 = exp(dVar141);
    dVar117 = exp(local_1758);
    dVar60 = local_758[8];
    dVar45 = local_1008;
    dVar43 = local_1f08[8];
    local_1e58._0_8_ = h_RT[7];
    local_1dd8 = h_RT[8];
    local_1768 = dVar65 - ((h_RT[0x13] + h_RT[7]) - (h_RT[8] + h_RT[0x13])) * dVar35;
    local_1e08 = local_1e08 * 2.46;
    dStack_1e00 = dVar139 * 15000000.0;
    local_1758 = dStack_1e00 * c[0x13];
    dVar139 = local_1010 + local_1758;
    local_1dc8 = dStack_1e00;
    dStack_1dc0 = dStack_1e00;
    dStack_1750 = dStack_1e00;
    dVar69 = exp(dVar141);
    dVar128 = exp(local_688);
    RVar16 = c[8];
    RVar14 = c[7];
    dVar87 = local_1dd8 + h_RT[0x14];
    dVar140 = h_RT[0x14] + (double)local_1e58._0_8_;
    local_688 = c[3];
    dStack_680 = 0.0;
    dVar63 = exp(dVar57);
    RVar144 = c[4];
    local_1e58._0_8_ = c[1];
    dVar141 = c[1] * c[4];
    local_1dd8 = c[0xb];
    dStack_1dd0 = 0.0;
    dVar118 = exp((dVar118 + dStack_2030) - dVar42);
    RVar15 = c[8];
    dVar84 = RVar18 * c[7];
    dVar124 = dVar129 * dVar84 + dVar124;
    dVar84 = dVar84 * dVar36 - local_1778;
    auStack_1e88._0_8_ = dVar124 + (double)uVar13;
    dVar129 = dVar129 * c[7];
    local_f90 = dVar100 + dVar86 + dVar129;
    local_f18 = dVar129 + dVar116;
    dStack_6d8 = dVar84 + dVar103;
    auVar96._8_8_ = dVar117;
    auVar96._0_8_ = local_1618;
    auVar12._8_8_ = dStack_1e00;
    auVar12._0_8_ = local_1e08;
    auVar90 = divpd(auVar12,auVar96);
    dVar116 = auVar90._0_8_;
    dVar100 = RVar22 * c[7];
    dVar36 = dVar99 * local_1e08 * dVar100 -
             (dVar99 - (dVar82 - dVar83) * dVar35) * dVar116 * RVar20 * RVar20;
    dVar103 = auVar90._8_8_;
    dVar82 = local_1e08 * dVar100 - RVar20 * RVar20 * dVar116;
    dVar99 = dStack_1e00 * c[0x13] * c[8] - c[0x13] * local_1628 * dVar103;
    local_1f08[9] = dVar82 + dVar82 + ((dVar132 + dVar39) - dVar124);
    local_1f08[10] = dVar44 - dVar82;
    dVar100 = RVar22 * local_1e08;
    local_10a8 = local_10a8 - dVar100;
    local_10b0 = dVar100 + dVar100 + ((dVar119 + dVar81) - dVar79);
    dVar39 = dVar116 * -2.0 * RVar20;
    local_f60 = (local_1e38 - dVar129) - dVar39;
    local_f48 = dVar58 - dVar39;
    local_f50 = dVar39 + dVar39 + ((dVar86 + dVar154) - dVar129);
    dVar39 = local_1e08 * local_1628;
    local_eb0 = local_eb0 - dVar39;
    local_e98 = dVar59 - dVar39;
    local_ea0 = dVar39 + dVar39 + local_1608;
    local_708._0_8_ = (double)uVar25 - dVar36;
    local_758[9] = dVar36 + dVar36 + ((dVar85 + dVar102) - dVar84);
    dVar81 = c[0x13] * c[8] * dVar65 * local_1dc8 - c[0x13] * local_1628 * dVar103 * local_1768;
    dVar44 = c[0x13] * -dVar103;
    dVar39 = c[8] * local_1dc8 + -dVar103 * local_1628;
    dVar69 = dVar69 * 9000000.0;
    dVar63 = dVar63 * 28000000.0;
    auVar97._8_8_ = dVar37 * dVar118;
    auVar97._0_8_ = dVar128;
    auVar151._8_8_ = dVar63;
    auVar151._0_8_ = dVar69;
    auVar90 = divpd(auVar151,auVar97);
    dVar141 = local_1dd8 * dVar141;
    dVar154 = auVar90._0_8_;
    dVar116 = auVar90._8_8_;
    dVar58 = dVar69 * c[0x14] * c[8] - c[0x14] * local_1628 * dVar154;
    dVar59 = dVar63 * RVar16 * local_688 - dVar141 * dVar116;
    local_880 = local_880 + dVar39;
    local_878 = local_878 - dVar39;
    dVar102 = dVar65 * dVar69 * c[0x14] * c[8] -
              (dVar65 - (dVar140 - dVar87) * dVar35) * dVar154 * c[0x14] * local_1628;
    dVar39 = -dVar116;
    dVar37 = c[0x14] * -dVar154;
    dStack_10c0 = (((dVar61 - dVar119) - dVar79) - dVar100) + dVar44 + dVar37;
    local_10b8 = (local_10b8 - dVar44) - dVar37;
    local_1010 = dVar139 + dVar69 * c[0x14];
    dVar37 = dVar69 * RVar16 + RVar14 * -dVar154;
    local_7d0 = local_7d0 + dVar37;
    local_7c8 = local_7c8 - dVar37;
    local_758[7] = (((dVar147 - dVar85) - dVar84) - dVar36) + dVar81 + dVar102;
    local_1f08[7] = (((dVar56 - dVar132) - dVar124) - dVar82) + dVar99 + dVar58;
    local_1f08[8] = ((dVar43 - dVar99) - dVar58) - dVar59;
    dVar37 = RVar16 * local_688 * (double)local_1df8._0_8_ * dVar63 -
             dVar141 * dVar116 * ((double)local_1df8._0_8_ -
                                 (((h_RT[1] + h_RT[4] + h_RT[0xb]) - (h_RT[3] + h_RT[8])) + -1.0) *
                                 dVar35);
    local_1f08[1] = dVar41 + dVar132 + dVar124 + dVar59;
    local_1f08[3] = local_1f08[3] - dVar59;
    local_1f08[4] = local_1f08[4] + dVar59;
    dVar36 = RVar144 * dVar39 * local_1dd8;
    auStack_1510._0_8_ = (double)auStack_1510._0_8_ + dVar36;
    local_1500 = local_1500 - dVar36;
    dStack_14f8 = dStack_14f8 + dVar36;
    local_14d8 = local_14d8 - dVar36;
    local_14c0 = dVar36 + local_14c0;
    dVar36 = RVar16 * dVar63;
    local_13b0 = local_13b0 + dVar36;
    local_13a0 = local_13a0 - dVar36;
    dStack_1398 = dStack_1398 + dVar36;
    local_1378 = local_1378 - dVar36;
    local_1360 = dVar36 + local_1360;
    dVar36 = (double)local_1e58._0_8_ * dVar39 * local_1dd8;
    local_1300 = local_1300 + dVar36;
    local_12f0 = local_12f0 - dVar36;
    dStack_12e8 = dStack_12e8 + dVar36;
    local_12c8 = local_12c8 - dVar36;
    local_12b0 = dVar36 + local_12b0;
    dVar63 = dVar63 * c[3];
    local_1040 = local_1040 + dVar63;
    local_1030 = local_1030 - dVar63;
    local_1028 = local_1028 + dVar63;
    local_1008 = ((dVar45 - local_1758) - dVar69 * c[0x14]) - dVar63;
    local_ff0 = dVar63 + local_ff0;
    dVar36 = c[1] * dVar39 * c[4];
    local_e30 = local_e30 + dVar36;
    local_e20 = local_e20 - dVar36;
    local_e18 = local_e18 + dVar36;
    local_df8 = local_df8 - dVar36;
    dStack_de0 = dVar36 + dStack_de0;
    local_1f08[0xb] = local_1f08[0xb] + dVar59;
    local_758[1] = dVar101 + dVar85 + dVar84 + dVar37;
    local_758[3] = local_758[3] - dVar37;
    local_758[4] = local_758[4] + dVar37;
    local_758[8] = ((dVar60 - dVar81) - dVar102) - dVar37;
    local_708._8_8_ = dVar37 + (double)local_708._8_8_;
    dVar41 = c[3] * c[8];
    local_1e38 = exp(dVar57);
    RVar16 = c[0xb];
    RVar144 = c[5];
    local_1e38 = local_1e38 * 12000000.0;
    dVar36 = c[5] * c[0xb];
    dVar37 = exp(((dStack_1a10 - dStack_1cb0) + dStack_2030) - dVar42);
    RVar14 = c[8];
    dVar37 = local_1e38 / dVar37;
    dVar39 = local_1e38 * dVar41 - dVar36 * dVar37;
    local_1f08[3] = local_1f08[3] - dVar39;
    local_1f08[5] = local_1f08[5] + dVar39;
    local_1f08[8] = local_1f08[8] - dVar39;
    local_1f08[0xb] = dVar39 + local_1f08[0xb];
    dVar39 = RVar15 * local_1e38;
    local_13a0 = local_13a0 - dVar39;
    local_1390._0_8_ = (double)local_1390._0_8_ + dVar39;
    local_1378 = local_1378 - dVar39;
    local_1360 = dVar39 + local_1360;
    dVar39 = RVar16 * -dVar37;
    local_1240 = local_1240 - dVar39;
    local_1230 = local_1230 + dVar39;
    local_1218 = local_1218 - dVar39;
    local_1200 = dVar39 + local_1200;
    dVar36 = (double)local_1df8._0_8_ * local_1e38 * dVar41 -
             ((double)local_1df8._0_8_ - ((h_RT[5] + h_RT[0xb]) - (h_RT[3] + h_RT[8])) * dVar35) *
             dVar37 * dVar36;
    dVar39 = local_1e38 * c[3];
    local_1030 = local_1030 - dVar39;
    local_1020 = local_1020 + dVar39;
    local_1008 = local_1008 - dVar39;
    local_ff0 = dVar39 + local_ff0;
    dVar37 = -dVar37 * RVar144;
    local_e20 = local_e20 - dVar37;
    local_e10 = local_e10 + dVar37;
    local_df8 = local_df8 - dVar37;
    dStack_de0 = dVar37 + dStack_de0;
    local_758[3] = local_758[3] - dVar36;
    local_758[5] = local_758[5] + dVar36;
    local_758[8] = local_758[8] - dVar36;
    local_708._8_8_ = dVar36 + (double)local_708._8_8_;
    dVar154 = exp(dVar57);
    RVar20 = c[9];
    local_1dc8 = c[1];
    dStack_1dc0 = 0.0;
    dVar102 = exp(local_1e18);
    dVar100 = local_758[8];
    dVar82 = local_f50;
    dVar81 = local_f58;
    dVar61 = local_f90;
    dVar60 = local_1000;
    dVar59 = local_1008;
    dVar43 = local_1040;
    dVar45 = local_14d8;
    uVar13 = auStack_1510._0_8_;
    dVar56 = local_15c8[0x16];
    dVar41 = local_15c8[9];
    dVar39 = local_15c8[8];
    RVar16 = c[8];
    dVar44 = local_1f08[9];
    dVar37 = local_1f08[8];
    dVar36 = local_1f08[0];
    dStack_1dd0 = h_RT[1] + h_RT[9];
    local_1dd8 = dStack_1dd0 - (h_RT[0] + h_RT[8]);
    dStack_1dd0 = dStack_1dd0 - dStack_1dd0;
    local_1768 = local_1f08[1];
    local_1608 = local_15c8[0];
    local_1758 = local_15c8[1];
    dVar99 = c[5] * c[8];
    local_688 = dStack_14d0;
    local_1e58._0_8_ = local_f98;
    local_1e18 = local_758[0];
    local_1e38 = local_758[1];
    dVar103 = exp(dVar57);
    dVar103 = dVar103 * 30000000.0;
    local_1e08 = c[7];
    dVar116 = c[5] * c[7];
    dVar58 = exp(((dStack_1cb0 - dStack_1cb0) - local_1a18) + dStack_2030);
    RVar18 = h_RT[8];
    RVar22 = c[9];
    dVar58 = dVar103 / dVar58;
    dVar132 = dVar103 * dVar99 - dVar116 * dVar58;
    dVar124 = (double)local_1df8._0_8_ * dVar103 * dVar99 -
              ((double)local_1df8._0_8_ - ((h_RT[5] + h_RT[7]) - (h_RT[5] + h_RT[8])) * dVar35) *
              dVar58 * dVar116;
    local_1f08[7] = local_1f08[7] + dVar132;
    dVar99 = dVar103 * RVar16 - dVar58 * local_1e08;
    local_1220 = local_1220 + dVar99;
    local_1218 = local_1218 - dVar99;
    local_10b8 = local_10b8 - -dVar58 * c[5];
    dStack_10c0 = -dVar58 * c[5] + dStack_10c0;
    local_1010 = local_1010 + dVar103 * c[5];
    local_758[7] = local_758[7] + dVar124;
    dVar117 = exp(dVar88);
    RVar144 = c[1];
    local_1e08 = c[0x10];
    dStack_1e00 = 0.0;
    dVar118 = exp(dVar138);
    dVar147 = dStack_6d8;
    dVar101 = local_a48;
    dVar139 = dStack_a80;
    dVar116 = local_ac0;
    dVar99 = local_f18;
    dVar58 = local_1498;
    RVar19 = c[10];
    RVar15 = c[8];
    dVar79 = RVar18 + h_RT[9];
    dVar119 = h_RT[1] + h_RT[0x10];
    dVar128 = exp(dVar88);
    RVar17 = c[9];
    dVar129 = exp(local_598);
    RVar21 = c[0xb];
    RVar18 = c[8];
    local_598 = h_RT[8];
    auVar115._8_8_ = dVar129;
    auVar115._0_8_ = dVar102;
    dVar154 = dVar154 * 70000000.0;
    dVar128 = dVar128 * 16000000.0;
    auVar53._8_8_ = dVar128;
    auVar53._0_8_ = dVar154;
    auVar90 = divpd(auVar53,auVar115);
    dVar102 = auVar90._0_8_;
    dVar65 = auVar90._8_8_;
    dVar141 = RVar20 * local_1dc8;
    dStack_1dd0 = RVar17 * RVar17;
    dVar69 = RVar14 * c[0];
    dVar84 = RVar19 * RVar15;
    dVar83 = dVar154 * dVar69 - dVar141 * dVar102;
    local_1f08[0] = dVar36 - dVar83;
    local_1f08[1] = local_1768 + dVar83;
    local_1f08[8] = dVar37 - dVar83;
    local_15c8[9] = RVar14 * dVar154;
    local_15c8[0] = local_1608 - local_15c8[9];
    local_15c8[1] = local_1758 + local_15c8[9];
    local_15c8[8] = dVar39 - local_15c8[9];
    local_15c8[9] = local_15c8[9] + dVar41;
    dVar129 = RVar20 * -dVar102;
    local_15c8[0x16] = dVar56 - dVar129;
    dVar140 = dVar129 + local_688;
    dVar88 = c[0] * dVar154;
    local_1048 = local_1048 - dVar88;
    dVar36 = dVar128 * RVar15;
    local_ea8 = local_ea8 - dVar36;
    local_e98 = local_e98 - dVar36;
    local_ea0 = dVar36 + dVar36 + local_ea0;
    dVar104 = -dVar102 * local_1dc8;
    local_f98 = (double)local_1e58._0_8_ - dVar104;
    dVar39 = (double)local_1df8._0_8_ * dVar154 * dVar69 -
             ((double)local_1df8._0_8_ - local_1dd8 * dVar35) * dVar102 * dVar141;
    dVar41 = dVar66 * dVar128 * dVar84 -
             (dVar66 - ((h_RT[9] + h_RT[9]) - (h_RT[10] + h_RT[8])) * dVar35) * dVar65 * dStack_1dd0
    ;
    local_758[0] = local_1e18 - dVar39;
    dVar132 = local_1f08[8] - dVar132;
    local_1e38 = local_1e38 + dVar39;
    dVar124 = (dVar100 - dVar39) - dVar124;
    dVar39 = local_758[9] + dVar39;
    local_708._0_8_ = (double)local_708._0_8_ - dVar41;
    dVar106 = dVar128 * RVar19;
    local_ff8 = local_ff8 - dVar106;
    dVar100 = dVar65 * -2.0 * RVar17;
    local_f48 = local_f48 - dVar100;
    dVar36 = c[8] * c[0xb];
    local_1f08[9] = dVar83 + dVar44;
    local_1dd8 = dVar141;
    local_14d8 = dVar45 - dVar129;
    dStack_14d0 = dVar140;
    local_1040 = dVar43 + dVar88;
    local_1000 = dVar88 + dVar60;
    local_f90 = dVar61 + dVar104;
    local_f58 = dVar81 - dVar104;
    local_f50 = dVar104 + dVar82;
    local_758[1] = local_1e38;
    local_758[8] = dVar124;
    local_758[9] = dVar39;
    auStack_1510._0_8_ = (double)uVar13 + dVar129;
    local_1758 = exp(dVar57);
    local_1758 = local_1758 * 9000000.0;
    local_1e58._8_8_ = 0;
    local_1e58._0_8_ = c[7] * RVar21;
    dVar37 = exp(local_1e48);
    dVar37 = local_1758 / dVar37;
    local_1e18 = h_RT[7];
    dStack_1e10 = 0.0;
    dVar138 = local_1758 * dVar36 - (double)local_1e58._0_8_ * dVar37;
    local_688 = (double)local_1df8._0_8_ * local_1758 * dVar36 -
                ((double)local_1df8._0_8_ -
                ((h_RT[0xb] + h_RT[7]) - (local_598 + h_RT[0xb])) * dVar35) * dVar37 *
                (double)local_1e58._0_8_;
    dStack_680 = (double)local_1df8._8_8_;
    dVar85 = local_1f08[7] + dVar138;
    dVar87 = dStack_10c0 + -dVar37 * RVar21;
    dVar69 = RVar21 * local_1758;
    dVar154 = local_1010 + dVar69;
    dVar36 = local_1758 * RVar18 - dVar37 * c[7];
    local_e00 = local_e00 + dVar36;
    local_df8 = local_df8 - dVar36;
    local_598 = local_758[7] + local_688;
    uStack_590 = 0;
    local_1e58._0_8_ = local_10b8 - -dVar37 * RVar21;
    dVar102 = exp(dVar57);
    local_1768 = exp(local_588);
    RVar17 = h_RT[8];
    local_1608 = local_d50;
    local_588 = local_d48;
    local_1758 = c[8];
    dStack_1750 = 0.0;
    dVar36 = exp(dVar57);
    local_1e48 = c[0xe];
    dStack_1e40 = 0.0;
    dVar37 = exp(dVar148);
    RVar20 = c[9];
    RVar14 = c[3];
    dVar102 = dVar102 * 7000000.0;
    dStack_1e10 = dVar36 * 14000000.0;
    auVar127._8_8_ = dVar37;
    auVar127._0_8_ = local_1768;
    auVar156._8_8_ = dStack_1e10;
    auVar156._0_8_ = dVar102;
    auVar90 = divpd(auVar156,auVar127);
    dVar148 = c[0xb] * local_1e48;
    dVar37 = c[0xc] * local_1758;
    local_d48 = dStack_1e10 * local_1758;
    dVar56 = local_1de8 - ((h_RT[0xe] + h_RT[0xb]) - (h_RT[0xc] + RVar17)) * dVar35;
    dVar86 = auVar90._0_8_;
    dVar105 = auVar90._8_8_;
    dVar141 = dVar102 * RVar18 * c[0xc] - c[0xc] * c[7] * dVar86;
    dVar63 = dStack_1e10 * dVar37 - dVar148 * dVar105;
    local_1e48 = local_1e48 * -dVar105;
    dVar36 = c[0xb] * -dVar105;
    local_1758 = dVar102 * c[0xc];
    local_1010 = dVar154 + local_1758;
    local_1dc8 = local_df8;
    local_1768 = local_bb8;
    local_1de8 = local_1de8 * dVar102 * RVar18 * c[0xc] -
                 (dStack_1de0 - ((local_1e18 + h_RT[0xc]) - (h_RT[0xc] + RVar17)) * dVar35) * dVar86
                 * c[0xc] * c[7];
    dStack_1de0 = dStack_1de0 * dStack_1e10 * dVar37 - dVar56 * dVar105 * dVar148;
    local_1e18 = dStack_1e10 * c[0xc];
    local_ff0 = local_ff0 + local_1e18;
    local_fe8 = local_fe8 - local_1e18;
    local_fd8 = local_fd8 + local_1e18;
    local_d30 = local_d30 + local_d48;
    local_d28 = local_d28 - local_d48;
    local_d18 = local_d18 + local_d48;
    local_708._8_8_ = (double)local_708._8_8_ + dStack_1de0;
    local_6f8 = local_6f8 - dStack_1de0;
    local_10b8 = c[0xc] * -dVar86;
    dStack_10c0 = dVar87 + local_10b8;
    local_10b8 = (double)local_1e58._0_8_ - local_10b8;
    dVar37 = dVar102 * RVar18 + -dVar86 * c[7];
    local_d50 = local_1608 + dVar37;
    local_1f08[0xb] = local_1f08[0xb] + dVar63;
    local_1f08[0xc] = local_1f08[0xc] - dVar63;
    local_df8 = local_df8 - local_1e48;
    dStack_de0 = dStack_de0 + local_1e48;
    local_dc8 = local_dc8 + local_1e48;
    local_dd8 = local_dd8 - local_1e48;
    local_d48 = (local_588 - dVar37) - local_d48;
    local_be8 = local_be8 - dVar36;
    local_bd0 = local_bd0 + dVar36;
    local_bb8 = local_bb8 + dVar36;
    local_bc8 = local_bc8 - dVar36;
    dVar87 = c[3] * c[9];
    dStack_1750 = dStack_1e10;
    dVar102 = exp(local_15f8);
    dVar102 = dVar102 * 26750000.0;
    local_1e48 = c[0xf];
    local_1e58._8_8_ = 0;
    local_1e58._0_8_ = c[2] * c[0xf];
    local_1608 = exp(((dStack_1a10 - local_2038) + dStack_1ce0) - dVar80);
    RVar19 = h_RT[9];
    local_1608 = dVar102 / local_1608;
    local_15f8 = local_658 * dVar102;
    uStack_15f0 = 0;
    dVar65 = dStack_1dd0 * dVar65;
    dStack_1dd0 = (double)(extraout_XMM0_Qb_00 ^ 0x8000000000000000);
    dVar56 = dVar87 * dVar102 - (double)local_1e58._0_8_ * local_1608;
    dVar65 = dVar84 * dVar128 - dVar65;
    local_1e48 = local_1e48 * -local_1608;
    dVar84 = RVar20 * dVar102;
    dVar102 = dVar102 * RVar14;
    local_1dd8 = -local_1608 * c[2];
    dVar36 = RVar16 * RVar22;
    dVar37 = RVar144 * local_1e08;
    local_588 = dVar65;
    dStack_580 = dVar65;
    dVar128 = exp(local_15e8);
    dVar148 = exp(dVar68);
    RVar16 = c[9];
    local_15e8 = c[9] * c[9];
    uStack_15e0 = 0;
    dVar68 = exp(local_258);
    RVar20 = c[0x11];
    dVar117 = dVar117 * 12000000.0;
    dVar68 = dVar68 * 4990000.0;
    dVar154 = RVar22 * dVar117;
    local_fc8 = local_fc8 + dVar154;
    dVar86 = RVar15 * dVar117;
    local_f18 = dVar99 + dVar86;
    local_1040 = dVar43 + dVar88 + dVar154;
    local_f90 = dVar61 + dVar104 + dVar86;
    local_1000 = dVar106 + dVar106 + ((dVar88 + dVar60) - dVar154);
    local_f58 = ((dVar81 - dVar104) - dVar86) - dVar100;
    local_f50 = dVar100 + dVar100 + ((dVar104 + dVar82) - dVar86);
    local_1008 = ((((((dVar59 - dVar88) - dVar103 * c[5]) - dVar154) - dVar106) - dVar69) -
                 local_1758) - local_1e18;
    dVar103 = c[1] * c[0x11];
    dVar69 = exp((dStack_1ce0 + dStack_1ce0 + -local_1ce8) - local_1b20);
    dVar154 = local_bb8;
    dVar100 = local_be0;
    dVar99 = local_c08;
    dVar82 = local_c10;
    dVar81 = local_1298;
    dVar61 = dStack_12e8;
    dVar60 = local_1348;
    dVar59 = dStack_1398;
    RVar23 = h_RT[0xe];
    RVar21 = h_RT[9];
    RVar17 = h_RT[4];
    RVar22 = h_RT[3];
    RVar18 = c[0xd];
    RVar15 = c[9];
    RVar14 = c[3];
    dVar43 = local_1f08[4];
    auVar98._8_8_ = dVar69;
    auVar98._0_8_ = dVar118;
    auVar11._8_8_ = dVar68;
    auVar11._0_8_ = dVar117;
    auVar90 = divpd(auVar11,auVar98);
    dVar118 = auVar90._0_8_;
    dVar69 = dVar66 * dVar117 * dVar36 - (dVar66 - (dVar119 - dVar79) * dVar35) * dVar118 * dVar37;
    dVar119 = auVar90._8_8_;
    dVar66 = local_1e08 * -dVar118;
    local_14d8 = (dVar45 - dVar129) - dVar66;
    local_1498 = dVar58 + dVar66;
    local_a48 = RVar144 * -dVar118;
    local_ac0 = dVar116 + local_a48;
    local_a88 = local_a88 - local_a48;
    dStack_a80 = dVar139 - local_a48;
    local_a48 = local_a48 + dVar101;
    dStack_6d8 = dVar147 + dVar69;
    local_758[1] = local_1e38 + dVar69;
    local_758[7] = local_598 + local_1de8;
    local_758[8] = ((((dVar124 - dVar69) - dVar41) - local_688) - local_1de8) - dStack_1de0;
    dVar36 = dVar36 * dVar117 - dVar37 * dVar118;
    dVar37 = local_15e8 * dVar68 - dVar103 * dVar119;
    local_1f08[7] = dVar85 + dVar141;
    local_1f08[8] = ((((dVar132 - dVar36) - local_588) - dVar138) - dVar141) - dVar63;
    local_1f08[2] = dVar56 + local_1f08[2];
    dVar117 = local_1f08[3] - dVar56;
    dVar45 = (local_588 + local_588 + ((dVar83 + dVar44) - dVar36)) - dVar56;
    local_1f08[10] = local_1f08[10] - dVar65;
    local_1f08[0xe] = dVar63 + local_1f08[0xe];
    local_1f08[0xf] = dVar56 + local_1f08[0xf];
    dVar56 = local_15f8 * dVar87 -
             (local_658 - ((h_RT[0xf] + h_RT[2]) - (RVar19 + h_RT[3])) * dVar35) * local_1608 *
             (double)local_1e58._0_8_;
    dStack_1458 = dStack_1458 + local_1e48;
    local_1450 = local_1450 - local_1e48;
    local_1420 = local_1420 - local_1e48;
    local_13f0 = local_1e48 + local_13f0;
    dStack_13a8 = dStack_13a8 + dVar84;
    dVar44 = local_13a0 - dVar84;
    dVar58 = local_1370 - dVar84;
    local_1340 = dVar84 + local_1340;
    local_f88 = local_f88 + dVar102;
    dVar116 = local_f80 - dVar102;
    dVar139 = local_f50 - dVar102;
    local_f20 = dVar102 + local_f20;
    local_b68 = local_b68 + local_1dd8;
    local_b60 = local_b60 - local_1dd8;
    local_b30 = local_b30 - local_1dd8;
    local_b00 = local_1dd8 + local_b00;
    local_758[2] = local_758[2] + dVar56;
    dVar101 = local_758[3] - dVar56;
    local_1e38 = (dVar41 + dVar41 + (dVar39 - dVar69)) - dVar56;
    dStack_6e8 = dStack_1de0 + dStack_6e8;
    dStack_6e0 = dVar56 + dStack_6e0;
    dVar147 = dVar123 * dVar68 * local_15e8 -
              dVar119 * (dVar123 - ((h_RT[1] + h_RT[0x11]) - (h_RT[9] + h_RT[9])) * dVar35) *
              dVar103;
    local_1f08[1] = dVar36 + local_1f08[1] + dVar37;
    dVar39 = dVar37 + (double)auStack_1e88._8_8_;
    auStack_1e88._8_4_ = SUB84(dVar39,0);
    auStack_1e88._0_8_ = dVar36 + (double)auStack_1e88._0_8_;
    auStack_1e88._12_4_ = (int)((ulong)dVar39 >> 0x20);
    dVar36 = RVar20 * -dVar119;
    local_1e18 = local_12f0;
    local_1e48 = local_12c0;
    local_1dd8 = local_f78;
    local_1e08 = local_758[4];
    auStack_1510._0_8_ = dVar66 + (double)uVar13 + dVar129 + dVar36;
    dStack_14d0 = (dVar140 - dVar66) - (dVar36 + dVar36);
    local_1490 = dVar36 + local_1490;
    dVar102 = (dVar68 + dVar68) * RVar16;
    local_f90 = local_f90 + dVar102;
    local_f10 = local_f10 + dVar102;
    dVar36 = c[1] * -dVar119;
    local_a10 = local_a10 + dVar36;
    local_9d0 = local_9d0 - (dVar36 + dVar36);
    local_990 = dVar36 + local_990;
    local_758[1] = local_758[1] + dVar147;
    dStack_6d0 = dStack_6d0 + dVar147;
    dVar39 = RVar16 * c[0xd];
    dVar41 = c[9] * c[3];
    local_1de8 = c[0xe];
    dStack_1de0 = 0.0;
    local_1f08[3] = dVar117;
    local_1f08[9] = dVar45;
    local_f80 = dVar116;
    local_f50 = dVar139;
    local_758[3] = dVar101;
    local_758[9] = local_1e38;
    dVar36 = exp(dVar57);
    RVar16 = c[0xb];
    RVar144 = c[10];
    local_1e58._0_8_ = c[0xb] * c[10];
    local_1e58._8_8_ = local_1de8 * c[4];
    auVar54._0_8_ = exp(local_668);
    RVar20 = c[0xe];
    auVar54._8_8_ = dVar148;
    dVar36 = dVar36 * 26480000.0;
    dVar128 = dVar128 * 36000.0;
    auVar76._8_8_ = dVar128;
    auVar76._0_8_ = dVar36;
    auVar90 = divpd(auVar76,auVar54);
    local_1348 = dVar128 * RVar15;
    local_13a0 = dVar44 - local_1348;
    dStack_1398 = dVar59 + local_1348;
    local_1370 = dVar58 - local_1348;
    local_1348 = local_1348 + dVar60;
    dVar59 = RVar18 * dVar36;
    dVar60 = RVar14 * dVar128;
    local_f80 = dVar116 - dVar60;
    local_f78 = local_1dd8 + dVar60;
    dVar56 = auVar90._0_8_;
    dVar44 = auVar90._8_8_;
    dVar57 = (double)local_1df8._0_8_ * dVar36 * dVar39 -
             ((double)local_1df8._0_8_ - ((h_RT[0xb] + h_RT[10]) - (RVar21 + h_RT[0xd])) * dVar35) *
             dVar56 * (double)local_1e58._0_8_;
    dVar58 = (double)local_1df8._8_8_ * dVar128 * dVar41 -
             ((double)local_1df8._8_8_ - ((RVar23 + RVar17) - (RVar21 + RVar22)) * dVar35) * dVar44
             * (double)local_1e58._8_8_;
    local_758[3] = dVar101 - dVar58;
    local_758[4] = local_1e08 + dVar58;
    dVar39 = dVar39 * dVar36 - (double)local_1e58._0_8_ * dVar56;
    dVar41 = dVar41 * dVar128 - (double)local_1e58._8_8_ * dVar44;
    local_1f08[3] = dVar117 - dVar41;
    local_1f08[4] = dVar43 + dVar41;
    local_1298 = local_1de8 * -dVar44;
    local_12f0 = local_1e18 - local_1298;
    local_f48 = dVar59 + local_f48;
    dStack_f40 = dVar59 + dStack_f40;
    dStack_12e8 = dVar61 + local_1298;
    local_12c0 = local_1e48 - local_1298;
    local_1298 = local_1298 + dVar81;
    local_bb8 = c[4] * -dVar44;
    local_c10 = dVar82 - local_bb8;
    local_c08 = dVar99 + local_bb8;
    local_be0 = dVar100 - local_bb8;
    local_bb8 = local_bb8 + dVar154;
    local_1f08[10] = dVar39 + local_1f08[10];
    local_1f08[0xb] = dVar39 + local_1f08[0xb];
    local_1f08[9] = ((dVar45 - dVar41) - (dVar37 + dVar37)) - dVar39;
    local_1f08[0xd] = local_1f08[0xd] - dVar39;
    local_1f08[0xe] = dVar41 + local_1f08[0xe];
    local_f50 = ((dVar139 - dVar60) - (dVar102 + dVar102)) - dVar59;
    local_f30 = local_f30 - dVar59;
    dStack_f28 = dVar60 + dStack_f28;
    dVar37 = RVar16 * -dVar56;
    local_ea0 = local_ea0 - dVar37;
    local_e98 = dVar37 + local_e98;
    dStack_e90 = dVar37 + dStack_e90;
    local_e80 = local_e80 - dVar37;
    dVar37 = -dVar56 * RVar144;
    local_df0 = local_df0 - dVar37;
    local_de8 = dVar37 + local_de8;
    dStack_de0 = dVar37 + dStack_de0;
    local_dd0 = local_dd0 - dVar37;
    dVar36 = dVar36 * c[9];
    local_1df8._0_8_ = local_c90 - dVar36;
    local_c80 = local_c80 + dVar36;
    local_758[9] = ((local_1e38 - dVar58) - (dVar147 + dVar147)) - dVar57;
    local_708._0_8_ = dVar57 + (double)local_708._0_8_;
    local_708._8_8_ = dVar57 + (double)local_708._8_8_;
    dVar41 = local_c70 - dVar36;
    dStack_6f0 = dStack_6f0 - dVar57;
    dStack_6e8 = dVar58 + dStack_6e8;
    dVar43 = c[9] * c[0xe];
    dVar37 = exp((double)local_1e28._0_8_ * 2.81 + dVar35 * -2948.8496616156594);
    RVar144 = c[10];
    dVar37 = dVar37 * 0.00332;
    dVar56 = dVar35 * 2.81 + dVar38 * 2948.8496616156594;
    local_1de8 = c[0xd];
    dVar38 = c[10] * c[0xd];
    dVar39 = exp((dVar67 - dVar40) + local_1728);
    RVar16 = c[9];
    dVar39 = dVar37 / dVar39;
    dVar154 = dVar37 * dVar43 - dVar38 * dVar39;
    dVar82 = dVar56 * dVar37 * dVar43 -
             (dVar56 - ((h_RT[10] + h_RT[0xd]) - (h_RT[9] + h_RT[0xe])) * dVar35) * dVar39 * dVar38;
    local_1f08[9] = local_1f08[9] - dVar154;
    local_1f08[10] = local_1f08[10] + dVar154;
    local_1f08[0xd] = local_1f08[0xd] + dVar154;
    dVar38 = RVar20 * dVar37;
    local_f50 = local_f50 - dVar38;
    local_f48 = local_f48 + dVar38;
    dStack_f28 = dStack_f28 - dVar38;
    local_f30 = dVar38 + local_f30;
    dVar38 = local_1de8 * -dVar39;
    local_ea0 = local_ea0 - dVar38;
    local_e98 = local_e98 + dVar38;
    local_e80 = local_e80 + dVar38;
    local_e78 = local_e78 - dVar38;
    dVar38 = -dVar39 * RVar144;
    local_c90 = (double)local_1df8._0_8_ - dVar38;
    local_c88 = local_c88 + dVar36 + dVar38;
    local_c70 = dVar41 + dVar38;
    local_c68 = local_c68 - dVar38;
    dVar37 = dVar37 * c[9];
    local_be0 = local_be0 - dVar37;
    local_bd8 = local_bd8 + dVar37;
    local_bc0 = local_bc0 + dVar37;
    local_bb8 = local_bb8 - dVar37;
    local_758[9] = local_758[9] - dVar82;
    local_708._0_8_ = (double)local_708._0_8_ + dVar82;
    dStack_6f0 = dStack_6f0 + dVar82;
    local_1e58._0_8_ = exp((double)local_1e28._0_8_ * 1.74 + dVar35 * -5258.6141576593245);
    local_1e08 = local_1828 * 5258.6141576593245;
    dStack_1e00 = dStack_1820 * 201.28666632188802;
    local_1de8 = c[0x11];
    dStack_1de0 = 0.0;
    local_1e58._8_8_ = extraout_XMM0_Qb_01;
    dVar36 = exp((dVar67 - local_1b20) + local_1818);
    dVar81 = local_6c8;
    dVar61 = dStack_6d0;
    dVar60 = local_758[9];
    dVar59 = local_8d8;
    dVar58 = local_8e0;
    dVar57 = local_988;
    dVar45 = local_e98;
    dVar44 = local_ea0;
    dVar43 = local_f10;
    dVar56 = local_f48;
    dVar41 = local_f50;
    RVar20 = h_RT[0x12];
    RVar18 = h_RT[0x11];
    RVar15 = h_RT[9];
    RVar144 = c[3];
    dVar39 = local_1e78;
    dVar38 = local_1f08[9];
    local_1dd8 = h_RT[10];
    dStack_1dd0 = h_RT[0xb];
    uVar13 = auStack_1e88._8_8_;
    local_1818 = local_9d0;
    local_1e38 = local_990;
    local_1e18 = c[9];
    local_1e48 = local_918;
    dVar37 = exp(dVar35 * -201.28666632188802 + dVar62);
    RVar14 = c[6];
    local_1df8._8_8_ = 0;
    local_1df8._0_8_ = c[0xb];
    dVar40 = exp((dVar64 - dVar42) + dVar40);
    auVar77._8_8_ = dVar40;
    auVar77._0_8_ = dVar36;
    local_8d8 = (double)local_1e58._0_8_ * 6.14;
    dVar37 = dVar37 * 7600000.0;
    auVar137._8_8_ = dVar37;
    auVar137._0_8_ = local_8d8;
    auVar90 = divpd(auVar137,auVar77);
    uVar153 = local_1df8._12_4_;
    dVar36 = local_1df8._0_8_ * RVar14;
    dVar40 = local_8d8 * c[0x12];
    dVar147 = c[0xd] * RVar144;
    local_1e08 = dVar35 * 1.74 + local_1e08;
    dVar42 = dVar35 * 0.0 + dStack_1e00;
    dVar116 = auVar90._0_8_;
    dVar139 = auVar90._8_8_;
    dVar99 = local_1e08 * local_8d8 * c[0x12] * RVar16 -
             (local_1e08 - ((RVar18 + local_1dd8) - (RVar20 + RVar15)) * dVar35) * dVar116 *
             local_1de8 * c[10];
    dVar100 = dVar42 * dVar37 * dVar147 -
              (dVar42 - ((h_RT[0xb] + h_RT[6]) - (h_RT[0xd] + h_RT[3])) * dVar35) * dVar139 * dVar36
    ;
    dVar101 = c[0x12] * RVar16 * local_8d8 - local_1de8 * c[10] * dVar116;
    dVar147 = dVar147 * dVar37 - dVar36 * dVar139;
    dVar36 = local_1df8._0_8_ * -dVar139;
    local_1df8._8_4_ = local_1df8._8_4_;
    local_1df8._0_8_ = dVar36;
    local_1df8._12_4_ = uVar153;
    dVar42 = RVar14 * -dVar139;
    dVar139 = c[0xd] * dVar37;
    dVar37 = dVar37 * RVar144;
    local_f50 = dVar41 - dVar40;
    local_1e58._0_8_ = local_e08;
    local_1dd8 = local_c80;
    local_1e08 = local_758[6];
    local_f48 = dVar56 + dVar40;
    local_f10 = dVar43 + dVar40;
    local_f08 = local_f08 - dVar40;
    local_8d8 = local_8d8 * local_1e18;
    local_920 = local_920 - local_8d8;
    local_918 = local_1e48 + local_8d8;
    local_8e0 = dVar58 + local_8d8;
    local_8d8 = dVar59 - local_8d8;
    local_758[9] = dVar60 - dVar99;
    dStack_6d0 = dVar61 + dVar99;
    local_6c8 = dVar81 - dVar99;
    local_1f08[9] = dVar38 - dVar101;
    local_1e78 = dVar39 - dVar101;
    dVar38 = local_1de8 * -dVar116;
    local_ea0 = dVar44 - dVar38;
    local_e98 = dVar45 + dVar38;
    local_e60 = local_e60 + dVar38;
    local_e58 = local_e58 - dVar38;
    local_988 = -dVar116 * c[10];
    local_9d0 = local_1818 - local_988;
    local_9c8 = local_9c8 + local_988;
    local_990 = local_1e38 + local_988;
    local_988 = dVar57 - local_988;
    local_1f08[6] = local_1f08[6] + dVar147;
    local_1f08[3] = local_1f08[3] - dVar147;
    local_1f08[10] = local_1f08[10] + dVar101;
    local_1f08[0xb] = local_1f08[0xb] + dVar147;
    local_1f08[0xd] = local_1f08[0xd] - dVar147;
    local_1f08[0xe] = local_1f08[0xe] - dVar154;
    local_13a0 = local_13a0 - dVar139;
    local_1390._8_8_ = (double)local_1390._8_8_ + dVar139;
    local_1360 = local_1360 + dVar139;
    local_1350 = local_1350 - dVar139;
    local_1190 = local_1190 - dVar36;
    dStack_1178 = dStack_1178 + dVar36;
    local_1150 = local_1150 + dVar36;
    local_1140 = local_1140 - dVar36;
    local_e20 = local_e20 - dVar42;
    local_e08 = local_e08 + dVar42;
    dStack_de0 = dStack_de0 + dVar42;
    local_dd0 = local_dd0 - dVar42;
    local_cc0 = local_cc0 - dVar37;
    local_ca8 = local_ca8 + dVar37;
    local_c80 = local_c80 + dVar37;
    local_c70 = local_c70 - dVar37;
    local_758[6] = local_758[6] + dVar100;
    local_758[3] = local_758[3] - dVar100;
    local_708._8_8_ = (double)local_708._8_8_ + dVar100;
    local_708._0_8_ = (double)local_708._0_8_ + dVar99;
    dStack_6f0 = dStack_6f0 - dVar100;
    dStack_6e8 = dStack_6e8 - dVar82;
    local_1e48 = c[3];
    dStack_1e40 = 0.0;
    auStack_1e88._8_8_ = (double)uVar13 + dVar101;
    local_1e18 = exp((double)local_1e28._0_8_ * 7.6 + dVar35 * 1776.3548302906618);
    local_1df8._8_8_ = 0;
    local_1df8._0_8_ = c[6];
    dVar36 = exp((dVar64 - local_1728) + dVar80);
    dVar81 = dStack_6e8;
    dVar61 = local_758[6];
    dVar60 = local_758[3];
    dVar59 = local_b00;
    dVar58 = local_b48;
    dVar57 = local_b60;
    dVar45 = local_bb8;
    dVar44 = local_bf8;
    dVar43 = local_c10;
    dVar56 = local_1130;
    dVar42 = local_1138;
    dVar41 = dStack_1178;
    dVar80 = local_1190;
    dVar40 = local_1340;
    dVar39 = local_1348;
    uVar13 = local_1390._8_8_;
    RVar16 = h_RT[0xf];
    RVar14 = h_RT[0xe];
    RVar144 = h_RT[3];
    dVar38 = local_1f08[6];
    dVar37 = local_1f08[3];
    local_1818 = h_RT[6];
    RStack_1810 = h_RT[7];
    local_1de8 = local_1f08[0xe];
    local_1e38 = local_13a0;
    local_1728 = local_bb0;
    local_1e08 = exp(dVar35 * -1949.96457999329 + dVar62);
    local_1e28._8_8_ = 0;
    local_1e28._0_8_ = c[6];
    dVar82 = exp((dVar64 - local_15d8) + local_1b20);
    piVar26 = local_570;
    auVar78._8_8_ = dVar82;
    auVar78._0_8_ = dVar36;
    dVar139 = local_1e18 * 4.28e-19;
    dVar101 = local_1e08 * 840000.0;
    auVar163._8_8_ = dVar101;
    auVar163._0_8_ = dVar139;
    auVar90 = divpd(auVar163,auVar78);
    dVar99 = c[0x10] * (double)local_1e28._0_8_;
    dVar147 = dVar139 * c[0xf];
    dVar36 = local_1818 + RVar14;
    dVar102 = auVar90._0_8_;
    dVar103 = auVar90._8_8_;
    dVar100 = c[0x10] * -dVar103;
    local_1e28._0_8_ = (double)local_1e28._0_8_ * -dVar103;
    dVar116 = c[0x11] * dVar101;
    dVar154 = dVar101 * c[3];
    dVar82 = local_1e38 - dVar147;
    local_15d8 = local_a40;
    local_1e38 = local_a00;
    local_1818 = local_9e8;
    local_1348 = dVar39 + dVar147;
    local_1340 = dVar40 - dVar147;
    dVar39 = local_1e48 * dVar139;
    local_b60 = dVar57 - dVar39;
    local_b48 = dVar58 + dVar39;
    local_b08 = local_b08 + dVar39;
    local_b00 = dVar59 - dVar39;
    dVar39 = dVar35 * 7.6 + local_1828 * -1776.3548302906618;
    dVar40 = dVar35 * 0.0 + dStack_1820 * 1949.96457999329;
    dVar57 = dVar39 * dVar139 * local_1e48 * c[0xf] -
             (dVar39 - (dVar36 - (RVar144 + RVar16)) * dVar35) * dVar102 *
             (double)local_1df8._0_8_ * c[0xe];
    dVar58 = dVar40 * dVar101 * c[0x11] * c[3] -
             (dVar40 - ((h_RT[0x10] + h_RT[6]) - (h_RT[0x11] + h_RT[3])) * dVar35) * dVar103 *
             dVar99;
    dStack_6e8 = dVar81 + dVar57;
    dVar39 = local_1e48 * c[0xf] * dVar139 - (double)local_1df8._0_8_ * c[0xe] * dVar102;
    dVar40 = c[0x11] * c[3] * dVar101 - dVar99 * dVar103;
    local_1f08[0xe] = local_1de8 + dVar39;
    dVar36 = c[0xe] * -dVar102;
    local_1138 = dVar42 + dVar36;
    local_1130 = dVar56 - dVar36;
    dVar42 = -dVar102 * (double)local_1df8._0_8_;
    local_c10 = dVar43 - dVar42;
    local_bf8 = dVar44 + dVar42;
    local_bb8 = dVar45 + dVar42;
    local_bb0 = local_1728 - dVar42;
    local_1f08[3] = (dVar37 - dVar39) - dVar40;
    local_1f08[6] = dVar38 + dVar39 + dVar40;
    local_1f08[0xf] = local_1f08[0xf] - dVar39;
    local_13a0 = dVar82 - dVar116;
    auStack_1e88._8_8_ = (double)auStack_1e88._8_8_ - dVar40;
    auStack_1e88._0_8_ = dVar40 + (double)auStack_1e88._0_8_;
    local_1390._8_8_ = dVar116 + (double)uVar13 + dVar147;
    local_1338 = local_1338 + dVar116;
    local_1330 = local_1330 - dVar116;
    local_1190 = (dVar80 - dVar36) - dVar100;
    dStack_1178 = dVar100 + dVar41 + dVar36;
    local_1128 = local_1128 + dVar100;
    local_1120 = local_1120 - dVar100;
    local_ab0 = local_ab0 - (double)local_1e28._0_8_;
    local_a98 = local_a98 + (double)local_1e28._0_8_;
    local_a48 = local_a48 + (double)local_1e28._0_8_;
    local_a40 = local_a40 - (double)local_1e28._0_8_;
    local_a00 = local_a00 - dVar154;
    local_9e8 = local_9e8 + dVar154;
    local_998 = local_998 + dVar154;
    local_990 = local_990 - dVar154;
    local_758[3] = (dVar60 - dVar57) - dVar58;
    local_758[6] = dVar61 + dVar57 + dVar58;
    dStack_6e0 = dStack_6e0 - dVar57;
    dStack_6d8 = dVar58 + dStack_6d8;
    dStack_6d0 = dStack_6d0 - dVar58;
    if (local_66c == 2) {
      if (1000.0 <= dVar1) {
        c_R[0] = dVar161 * 2.00255376e-14 +
                 dVar46 * -1.79566394e-10 +
                 dVar55 * 4.99456778e-07 + dVar1 * -4.94024731e-05 + 3.3372792;
        c_R[1] = dVar161 * 4.98197357e-22 +
                 dVar46 * -4.73515235e-18 +
                 dVar55 * 1.61561948e-14 + dVar1 * -2.30842973e-11 + 2.50000001;
        c_R[2] = dVar161 * 1.22833691e-15 +
                 dVar46 * -1.00177799e-11 +
                 dVar55 * 4.19484589e-08 + dVar1 * -8.59741137e-05 + 2.56942078;
        c_R[3] = dVar161 * -2.16717794e-14 +
                 dVar46 * 2.09470555e-10 +
                 dVar55 * -7.57966669e-07 + dVar1 * 0.00148308754 + 3.28253784;
        c_R[4] = dVar161 * 1.17412376e-14 +
                 dVar46 * -8.79461556e-11 +
                 dVar55 * 1.26505228e-07 + dVar1 * 0.000548429716 + 3.09288767;
        c_R[5] = dVar161 * 1.68200992e-14 +
                 dVar46 * -9.7041987e-11 +
                 dVar55 * -1.64072518e-07 + dVar1 * 0.00217691804 + 3.03399249;
        c_R[6] = dVar161 * -1.07908535e-14 +
                 dVar46 * 1.1424637e-10 +
                 dVar55 * -6.3365815e-07 + dVar1 * 0.00223982013 + 4.0172109;
        c_R[7] = dVar161 * -1.87727567e-14 +
                 dVar46 * 2.60179549e-10 +
                 dVar55 * -1.40894597e-06 + dVar1 * 0.00365639292 + 2.87410113;
        c_R[8] = dVar161 * -3.39716365e-14 +
                 dVar46 * 4.17906e-10 +
                 dVar55 * -2.01191947e-06 + dVar1 * 0.00465588637 + 2.29203842;
        c_R[9] = dVar161 * -4.67154394e-14 +
                 dVar46 * 5.95684644e-10 +
                 dVar55 * -2.98714348e-06 + dVar1 * 0.00723990037 + 2.28571772;
        c_R[10] = dVar161 * -1.0181523e-13 +
                  dVar46 * 1.22292535e-09 +
                  dVar55 * -5.73285809e-06 + dVar1 * 0.0133909467 + 0.074851495;
        c_R[0xb] = dVar161 * -2.03647716e-14 +
                   dVar46 * 2.30053008e-10 +
                   dVar55 * -9.98825771e-07 + dVar1 * 0.00206252743 + 2.71518561;
        c_R[0xc] = dVar161 * -4.72084164e-14 +
                   dVar46 * 5.23490188e-10 +
                   dVar55 * -2.21481404e-06 + dVar1 * 0.00441437026 + 3.85746029;
        c_R[0xd] = dVar161 * -5.33508711e-14 +
                   dVar46 * 5.89161778e-10 +
                   dVar55 * -2.48445613e-06 + dVar1 * 0.00495695526 + 2.77217438;
        c_R[0xe] = dVar161 * -8.8385564e-14 +
                   dVar46 * 1.00641212e-09 +
                   dVar55 * -4.42258813e-06 + dVar1 * 0.00920000082 + 1.76069008;
        c_R[0xf] = dVar161 * -2.112616e-14 +
                   dVar46 * 3.944431e-10 + dVar55 * -2.656384e-06 + dVar1 * 0.007871497 + 3.770799;
        c_R[0x10] = dVar161 * -1.25706061e-13 +
                    dVar46 * 1.47222923e-09 +
                    dVar55 * -6.71077915e-06 + dVar1 * 0.0146454151 + 2.03611116;
        c_R[0x11] = dVar161 * -1.49641576e-13 +
                    dVar46 * 1.75217689e-09 +
                    dVar55 * -7.98206668e-06 + dVar1 * 0.0173972722 + 1.95465642;
        dVar108 = dVar46 * 2.21412001e-09 +
                  dVar55 * -1.00256067e-05 + dVar1 * 0.0216852677 + 1.0718815;
        dVar38 = dVar46 * 1.0097038e-10 + dVar55 * -5.68476e-07 + dVar1 * 0.0014879768 + 2.92664;
        dVar36 = -1.9000289e-13;
        dVar37 = -6.753351e-15;
      }
      else {
        c_R[0] = dVar161 * -7.37611761e-12 +
                 dVar46 * 2.01572094e-08 +
                 dVar55 * -1.9478151e-05 + dVar1 * 0.00798052075 + 2.34433112;
        c_R[1] = dVar161 * -9.27732332e-22 +
                 dVar46 * 2.30081632e-18 + dVar55 * -1.99591964e-15 + dVar1 * 7.05332819e-13 + 2.5;
        c_R[2] = dVar161 * 2.11265971e-12 +
                 dVar46 * -6.12806624e-09 +
                 dVar55 * 6.64306396e-06 + dVar1 * -0.00327931884 + 3.1682671;
        c_R[3] = dVar161 * 3.24372837e-12 +
                 dVar46 * -9.68129509e-09 +
                 dVar55 * 9.84730201e-06 + dVar1 * -0.00299673416 + 3.78245636;
        c_R[4] = dVar161 * 1.3641147e-12 +
                 dVar46 * -3.88113333e-09 +
                 dVar55 * 4.61793841e-06 + dVar1 * -0.00240131752 + 3.99201543;
        c_R[5] = dVar161 * 1.77197817e-12 +
                 dVar46 * -5.48797062e-09 +
                 dVar55 * 6.52040211e-06 + dVar1 * -0.0020364341 + 4.19864056;
        c_R[6] = dVar161 * 9.29225124e-12 +
                 dVar46 * -2.42763894e-08 +
                 dVar55 * 2.11582891e-05 + dVar1 * -0.00474912051 + 4.30179801;
        c_R[7] = dVar161 * 1.68741719e-12 +
                 dVar46 * -3.85091153e-09 +
                 dVar55 * 2.79489841e-06 + dVar1 * 0.000968872143 + 3.76267867;
        c_R[8] = dVar161 * 1.94314737e-12 +
                 dVar46 * -6.68815981e-09 +
                 dVar55 * 8.2329622e-06 + dVar1 * -0.00236661419 + 4.19860411;
        c_R[9] = dVar161 * 2.54385734e-12 +
                 dVar46 * -6.87117425e-09 +
                 dVar55 * 5.73021856e-06 + dVar1 * 0.00201095175 + 3.6735904;
        c_R[10] = dVar161 * 1.66693956e-11 +
                  dVar46 * -4.84743026e-08 +
                  dVar55 * 4.91800599e-05 + dVar1 * -0.0136709788 + 5.14987613;
        c_R[0xb] = dVar161 * -9.04424499e-13 +
                   dVar46 * 9.07005884e-10 +
                   dVar55 * 1.01681433e-06 + dVar1 * -0.00061035368 + 3.57953347;
        c_R[0xc] = dVar161 * -1.43699548e-13 +
                   dVar46 * 2.45919022e-09 +
                   dVar55 * -7.12356269e-06 + dVar1 * 0.00898459677 + 2.35677352;
        c_R[0xd] = dVar161 * 4.33768865e-12 +
                   dVar46 * -1.33144093e-08 +
                   dVar55 * 1.37799446e-05 + dVar1 * -0.00324392532 + 4.22118584;
        c_R[0xe] = dVar161 * 1.31772652e-11 +
                   dVar46 * -3.79285261e-08 +
                   dVar55 * 3.73220008e-05 + dVar1 * -0.00990833369 + 4.79372315;
        c_R[0xf] = dVar161 * 2.07561e-12 +
                   dVar46 * -7.377636e-09 + dVar55 * 5.338472e-06 + dVar1 * 0.007216595 + 2.106204;
        c_R[0x10] = dVar161 * 2.69884373e-11 +
                    dVar46 * -6.91588753e-08 +
                    dVar55 * 5.70990292e-05 + dVar1 * -0.00757052247 + 3.95920148;
        c_R[0x11] = dVar161 * 2.30509004e-11 +
                    dVar46 * -5.99126606e-08 +
                    dVar55 * 4.97142807e-05 + dVar1 * -0.00418658892 + 4.30646568;
        dVar108 = dVar46 * -7.08466285e-08 +
                  dVar55 * 5.99438288e-05 + dVar1 * -0.0055015427 + 4.29142492;
        dVar38 = dVar46 * 5.641515e-09 + dVar55 * -3.963222e-06 + dVar1 * 0.0014082404 + 3.298677;
        dVar36 = 2.68685771e-11;
        dVar37 = -2.444854e-12;
      }
      c_R[0x12] = dVar161 * dVar36 + dVar108;
      c_R[0x13] = dVar161 * dVar37 + dVar38;
      c_R[0x14] = dVar161 * 0.0 + dVar46 * 0.0 + dVar55 * 0.0 + dVar1 * 0.0 + 2.5;
      if (1000.0 <= dVar1) {
        dcRdT[0] = dVar46 * 8.01021504e-14 +
                   dVar55 * -5.38699182e-10 + dVar1 * 9.98913556e-07 + -4.94024731e-05;
        dcRdT[1] = dVar46 * 1.99278943e-21 +
                   dVar55 * -1.42054571e-17 + dVar1 * 3.23123896e-14 + -2.30842973e-11;
        dcRdT[2] = dVar46 * 4.91334764e-15 +
                   dVar55 * -3.00533397e-11 + dVar1 * 8.38969178e-08 + -8.59741137e-05;
        dcRdT[3] = dVar46 * -8.66871176e-14 +
                   dVar55 * 6.28411665e-10 + dVar1 * -1.51593334e-06 + 0.00148308754;
        dcRdT[4] = dVar46 * 4.69649504e-14 +
                   dVar55 * -2.63838467e-10 + dVar1 * 2.53010456e-07 + 0.000548429716;
        dcRdT[5] = dVar46 * 6.72803968e-14 +
                   dVar55 * -2.91125961e-10 + dVar1 * -3.28145036e-07 + 0.00217691804;
        dcRdT[6] = dVar46 * -4.3163414e-14 +
                   dVar55 * 3.4273911e-10 + dVar1 * -1.2673163e-06 + 0.00223982013;
        dcRdT[7] = dVar46 * -7.50910268e-14 +
                   dVar55 * 7.80538647e-10 + dVar1 * -2.81789194e-06 + 0.00365639292;
        dcRdT[8] = dVar46 * -1.35886546e-13 +
                   dVar55 * 1.253718e-09 + dVar1 * -4.02383894e-06 + 0.00465588637;
        dcRdT[9] = dVar46 * -1.86861758e-13 +
                   dVar55 * 1.78705393e-09 + dVar1 * -5.97428696e-06 + 0.00723990037;
        dcRdT[10] = dVar46 * -4.0726092e-13 +
                    dVar55 * 3.66877605e-09 + dVar1 * -1.14657162e-05 + 0.0133909467;
        dcRdT[0xb] = dVar46 * -8.14590864e-14 +
                     dVar55 * 6.90159024e-10 + dVar1 * -1.99765154e-06 + 0.00206252743;
        dcRdT[0xc] = dVar46 * -1.88833666e-13 +
                     dVar55 * 1.57047056e-09 + dVar1 * -4.42962808e-06 + 0.00441437026;
        dcRdT[0xd] = dVar46 * -2.13403484e-13 +
                     dVar55 * 1.76748533e-09 + dVar1 * -4.96891226e-06 + 0.00495695526;
        dcRdT[0xe] = dVar46 * -3.53542256e-13 +
                     dVar55 * 3.01923636e-09 + dVar1 * -8.84517626e-06 + 0.00920000082;
        dcRdT[0xf] = dVar46 * -8.450464e-14 +
                     dVar55 * 1.1833293e-09 + dVar1 * -5.312768e-06 + 0.007871497;
        dcRdT[0x10] = dVar46 * -5.02824244e-13 +
                      dVar55 * 4.41668769e-09 + dVar1 * -1.34215583e-05 + 0.0146454151;
        dcRdT[0x11] = dVar46 * -5.98566304e-13 +
                      dVar55 * 5.25653067e-09 + dVar1 * -1.59641334e-05 + 0.0173972722;
        dVar161 = dVar55 * 6.64236003e-09 + dVar1 * -2.00512134e-05 + 0.0216852677;
        dVar108 = dVar55 * 3.0291114e-10 + dVar1 * -1.136952e-06 + 0.0014879768;
        dVar36 = -7.6001156e-13;
        dVar37 = -2.7013404e-14;
      }
      else {
        dcRdT[0] = dVar46 * -2.95044704e-11 +
                   dVar55 * 6.04716282e-08 + dVar1 * -3.8956302e-05 + 0.00798052075;
        dcRdT[1] = dVar46 * -3.71092933e-21 +
                   dVar55 * 6.90244896e-18 + dVar1 * -3.99183928e-15 + 7.05332819e-13;
        dcRdT[2] = dVar46 * 8.45063884e-12 +
                   dVar55 * -1.83841987e-08 + dVar1 * 1.32861279e-05 + -0.00327931884;
        dcRdT[3] = dVar46 * 1.29749135e-11 +
                   dVar55 * -2.90438853e-08 + dVar1 * 1.9694604e-05 + -0.00299673416;
        dcRdT[4] = dVar46 * 5.4564588e-12 +
                   dVar55 * -1.16434e-08 + dVar1 * 9.23587682e-06 + -0.00240131752;
        dcRdT[5] = dVar46 * 7.08791268e-12 +
                   dVar55 * -1.64639119e-08 + dVar1 * 1.30408042e-05 + -0.0020364341;
        dcRdT[6] = dVar46 * 3.7169005e-11 +
                   dVar55 * -7.28291682e-08 + dVar1 * 4.23165782e-05 + -0.00474912051;
        dcRdT[7] = dVar46 * 6.74966876e-12 +
                   dVar55 * -1.15527346e-08 + dVar1 * 5.58979682e-06 + 0.000968872143;
        dcRdT[8] = dVar46 * 7.77258948e-12 +
                   dVar55 * -2.00644794e-08 + dVar1 * 1.64659244e-05 + -0.00236661419;
        dcRdT[9] = dVar46 * 1.01754294e-11 +
                   dVar55 * -2.06135228e-08 + dVar1 * 1.14604371e-05 + 0.00201095175;
        dcRdT[10] = dVar46 * 6.66775824e-11 +
                    dVar55 * -1.45422908e-07 + dVar1 * 9.83601198e-05 + -0.0136709788;
        dcRdT[0xb] = dVar46 * -3.617698e-12 +
                     dVar55 * 2.72101765e-09 + dVar1 * 2.03362866e-06 + -0.00061035368;
        dcRdT[0xc] = dVar46 * -5.74798192e-13 +
                     dVar55 * 7.37757066e-09 + dVar1 * -1.42471254e-05 + 0.00898459677;
        dcRdT[0xd] = dVar46 * 1.73507546e-11 +
                     dVar55 * -3.99432279e-08 + dVar1 * 2.75598892e-05 + -0.00324392532;
        dcRdT[0xe] = dVar46 * 5.27090608e-11 +
                     dVar55 * -1.13785578e-07 + dVar1 * 7.46440016e-05 + -0.00990833369;
        dcRdT[0xf] = dVar46 * 8.30244e-12 +
                     dVar55 * -2.2132908e-08 + dVar1 * 1.0676944e-05 + 0.007216595;
        dcRdT[0x10] = dVar46 * 1.07953749e-10 +
                      dVar55 * -2.07476626e-07 + dVar1 * 0.000114198058 + -0.00757052247;
        dcRdT[0x11] = dVar46 * 9.22036016e-11 +
                      dVar55 * -1.79737982e-07 + dVar1 * 9.94285614e-05 + -0.00418658892;
        dVar161 = dVar55 * -2.12539886e-07 + dVar1 * 0.000119887658 + -0.0055015427;
        dVar108 = dVar55 * 1.6924545e-08 + dVar1 * -7.926444e-06 + 0.0014082404;
        dVar36 = 1.07474308e-10;
        dVar37 = -9.779416e-12;
      }
      dcRdT[0x12] = dVar46 * dVar36 + dVar161;
      dcRdT[0x13] = dVar46 * dVar37 + dVar108;
      RVar144 = dVar46 * 0.0 + dVar55 * 0.0 + dVar1 * 0.0 + 0.0;
      pdVar32 = h_RT;
      pRVar30 = local_578;
    }
    else {
      if (1000.0 <= dVar1) {
        c_R[0] = dVar161 * 2.00255376e-14 +
                 dVar46 * -1.79566394e-10 +
                 dVar55 * 4.99456778e-07 + dVar1 * -4.94024731e-05 + 2.3372792;
        c_R[1] = dVar161 * 4.98197357e-22 +
                 dVar46 * -4.73515235e-18 +
                 dVar55 * 1.61561948e-14 + dVar1 * -2.30842973e-11 + 1.50000001;
        c_R[2] = dVar161 * 1.22833691e-15 +
                 dVar46 * -1.00177799e-11 +
                 dVar55 * 4.19484589e-08 + dVar1 * -8.59741137e-05 + 1.56942078;
        c_R[3] = dVar161 * -2.16717794e-14 +
                 dVar46 * 2.09470555e-10 +
                 dVar55 * -7.57966669e-07 + dVar1 * 0.00148308754 + 2.28253784;
        c_R[4] = dVar161 * 1.17412376e-14 +
                 dVar46 * -8.79461556e-11 +
                 dVar55 * 1.26505228e-07 + dVar1 * 0.000548429716 + 2.09288767;
        c_R[5] = dVar161 * 1.68200992e-14 +
                 dVar46 * -9.7041987e-11 +
                 dVar55 * -1.64072518e-07 + dVar1 * 0.00217691804 + 2.03399249;
        c_R[6] = dVar161 * -1.07908535e-14 +
                 dVar46 * 1.1424637e-10 +
                 dVar55 * -6.3365815e-07 + dVar1 * 0.00223982013 + 3.0172109;
        c_R[7] = dVar161 * -1.87727567e-14 +
                 dVar46 * 2.60179549e-10 +
                 dVar55 * -1.40894597e-06 + dVar1 * 0.00365639292 + 1.87410113;
        c_R[8] = dVar161 * -3.39716365e-14 +
                 dVar46 * 4.17906e-10 +
                 dVar55 * -2.01191947e-06 + dVar1 * 0.00465588637 + 1.29203842;
        c_R[9] = dVar161 * -4.67154394e-14 +
                 dVar46 * 5.95684644e-10 +
                 dVar55 * -2.98714348e-06 + dVar1 * 0.00723990037 + 1.28571772;
        c_R[10] = dVar161 * -1.0181523e-13 +
                  dVar46 * 1.22292535e-09 +
                  dVar55 * -5.73285809e-06 + dVar1 * 0.0133909467 + -0.925148505;
        c_R[0xb] = dVar161 * -2.03647716e-14 +
                   dVar46 * 2.30053008e-10 +
                   dVar55 * -9.98825771e-07 + dVar1 * 0.00206252743 + 1.71518561;
        c_R[0xc] = dVar161 * -4.72084164e-14 +
                   dVar46 * 5.23490188e-10 +
                   dVar55 * -2.21481404e-06 + dVar1 * 0.00441437026 + 2.85746029;
        c_R[0xd] = dVar161 * -5.33508711e-14 +
                   dVar46 * 5.89161778e-10 +
                   dVar55 * -2.48445613e-06 + dVar1 * 0.00495695526 + 1.77217438;
        c_R[0xe] = dVar161 * -8.8385564e-14 +
                   dVar46 * 1.00641212e-09 +
                   dVar55 * -4.42258813e-06 + dVar1 * 0.00920000082 + 0.76069008;
        c_R[0xf] = dVar161 * -2.112616e-14 +
                   dVar46 * 3.944431e-10 + dVar55 * -2.656384e-06 + dVar1 * 0.007871497 + 2.770799;
        c_R[0x10] = dVar161 * -1.25706061e-13 +
                    dVar46 * 1.47222923e-09 +
                    dVar55 * -6.71077915e-06 + dVar1 * 0.0146454151 + 1.03611116;
        c_R[0x11] = dVar161 * -1.49641576e-13 +
                    dVar46 * 1.75217689e-09 +
                    dVar55 * -7.98206668e-06 + dVar1 * 0.0173972722 + 0.95465642;
        dVar38 = dVar46 * 2.21412001e-09 +
                 dVar55 * -1.00256067e-05 + dVar1 * 0.0216852677 + 0.0718815;
        dVar39 = dVar46 * 1.0097038e-10 + dVar55 * -5.68476e-07 + dVar1 * 0.0014879768 + 1.92664;
        dVar36 = -1.9000289e-13;
        dVar37 = -6.753351e-15;
      }
      else {
        c_R[0] = dVar161 * -7.37611761e-12 +
                 dVar46 * 2.01572094e-08 +
                 dVar55 * -1.9478151e-05 + dVar1 * 0.00798052075 + 1.34433112;
        c_R[1] = dVar161 * -9.27732332e-22 +
                 dVar46 * 2.30081632e-18 + dVar55 * -1.99591964e-15 + dVar1 * 7.05332819e-13 + 1.5;
        c_R[2] = dVar161 * 2.11265971e-12 +
                 dVar46 * -6.12806624e-09 +
                 dVar55 * 6.64306396e-06 + dVar1 * -0.00327931884 + 2.1682671;
        c_R[3] = dVar161 * 3.24372837e-12 +
                 dVar46 * -9.68129509e-09 +
                 dVar55 * 9.84730201e-06 + dVar1 * -0.00299673416 + 2.78245636;
        c_R[4] = dVar161 * 1.3641147e-12 +
                 dVar46 * -3.88113333e-09 +
                 dVar55 * 4.61793841e-06 + dVar1 * -0.00240131752 + 2.99201543;
        c_R[5] = dVar161 * 1.77197817e-12 +
                 dVar46 * -5.48797062e-09 +
                 dVar55 * 6.52040211e-06 + dVar1 * -0.0020364341 + 3.19864056;
        c_R[6] = dVar161 * 9.29225124e-12 +
                 dVar46 * -2.42763894e-08 +
                 dVar55 * 2.11582891e-05 + dVar1 * -0.00474912051 + 3.30179801;
        c_R[7] = dVar161 * 1.68741719e-12 +
                 dVar46 * -3.85091153e-09 +
                 dVar55 * 2.79489841e-06 + dVar1 * 0.000968872143 + 2.76267867;
        c_R[8] = dVar161 * 1.94314737e-12 +
                 dVar46 * -6.68815981e-09 +
                 dVar55 * 8.2329622e-06 + dVar1 * -0.00236661419 + 3.19860411;
        c_R[9] = dVar161 * 2.54385734e-12 +
                 dVar46 * -6.87117425e-09 +
                 dVar55 * 5.73021856e-06 + dVar1 * 0.00201095175 + 2.6735904;
        c_R[10] = dVar161 * 1.66693956e-11 +
                  dVar46 * -4.84743026e-08 +
                  dVar55 * 4.91800599e-05 + dVar1 * -0.0136709788 + 4.14987613;
        c_R[0xb] = dVar161 * -9.04424499e-13 +
                   dVar46 * 9.07005884e-10 +
                   dVar55 * 1.01681433e-06 + dVar1 * -0.00061035368 + 2.57953347;
        c_R[0xc] = dVar161 * -1.43699548e-13 +
                   dVar46 * 2.45919022e-09 +
                   dVar55 * -7.12356269e-06 + dVar1 * 0.00898459677 + 1.35677352;
        c_R[0xd] = dVar161 * 4.33768865e-12 +
                   dVar46 * -1.33144093e-08 +
                   dVar55 * 1.37799446e-05 + dVar1 * -0.00324392532 + 3.22118584;
        c_R[0xe] = dVar161 * 1.31772652e-11 +
                   dVar46 * -3.79285261e-08 +
                   dVar55 * 3.73220008e-05 + dVar1 * -0.00990833369 + 3.79372315;
        c_R[0xf] = dVar161 * 2.07561e-12 +
                   dVar46 * -7.377636e-09 + dVar55 * 5.338472e-06 + dVar1 * 0.007216595 + 1.106204;
        c_R[0x10] = dVar161 * 2.69884373e-11 +
                    dVar46 * -6.91588753e-08 +
                    dVar55 * 5.70990292e-05 + dVar1 * -0.00757052247 + 2.95920148;
        c_R[0x11] = dVar161 * 2.30509004e-11 +
                    dVar46 * -5.99126606e-08 +
                    dVar55 * 4.97142807e-05 + dVar1 * -0.00418658892 + 3.30646568;
        dVar38 = dVar46 * -7.08466285e-08 +
                 dVar55 * 5.99438288e-05 + dVar1 * -0.0055015427 + 3.29142492;
        dVar39 = dVar46 * 5.641515e-09 + dVar55 * -3.963222e-06 + dVar1 * 0.0014082404 + 2.298677;
        dVar36 = 2.68685771e-11;
        dVar37 = -2.444854e-12;
      }
      c_R[0x12] = dVar161 * dVar36 + dVar38;
      c_R[0x13] = dVar161 * dVar37 + dVar39;
      c_R[0x14] = dVar161 * 0.0 + dVar46 * 0.0 + dVar55 * 0.0 + dVar1 * 0.0 + 1.5;
      if (1000.0 <= dVar1) {
        dcRdT[0] = dVar46 * 8.01021504e-14 +
                   dVar55 * -5.38699182e-10 + dVar1 * 9.98913556e-07 + -4.94024731e-05;
        dcRdT[1] = dVar46 * 1.99278943e-21 +
                   dVar55 * -1.42054571e-17 + dVar1 * 3.23123896e-14 + -2.30842973e-11;
        dcRdT[2] = dVar46 * 4.91334764e-15 +
                   dVar55 * -3.00533397e-11 + dVar1 * 8.38969178e-08 + -8.59741137e-05;
        dcRdT[3] = dVar46 * -8.66871176e-14 +
                   dVar55 * 6.28411665e-10 + dVar1 * -1.51593334e-06 + 0.00148308754;
        dcRdT[4] = dVar46 * 4.69649504e-14 +
                   dVar55 * -2.63838467e-10 + dVar1 * 2.53010456e-07 + 0.000548429716;
        dcRdT[5] = dVar46 * 6.72803968e-14 +
                   dVar55 * -2.91125961e-10 + dVar1 * -3.28145036e-07 + 0.00217691804;
        dcRdT[6] = dVar46 * -4.3163414e-14 +
                   dVar55 * 3.4273911e-10 + dVar1 * -1.2673163e-06 + 0.00223982013;
        dcRdT[7] = dVar46 * -7.50910268e-14 +
                   dVar55 * 7.80538647e-10 + dVar1 * -2.81789194e-06 + 0.00365639292;
        dcRdT[8] = dVar46 * -1.35886546e-13 +
                   dVar55 * 1.253718e-09 + dVar1 * -4.02383894e-06 + 0.00465588637;
        dcRdT[9] = dVar46 * -1.86861758e-13 +
                   dVar55 * 1.78705393e-09 + dVar1 * -5.97428696e-06 + 0.00723990037;
        dcRdT[10] = dVar46 * -4.0726092e-13 +
                    dVar55 * 3.66877605e-09 + dVar1 * -1.14657162e-05 + 0.0133909467;
        dcRdT[0xb] = dVar46 * -8.14590864e-14 +
                     dVar55 * 6.90159024e-10 + dVar1 * -1.99765154e-06 + 0.00206252743;
        dcRdT[0xc] = dVar46 * -1.88833666e-13 +
                     dVar55 * 1.57047056e-09 + dVar1 * -4.42962808e-06 + 0.00441437026;
        dcRdT[0xd] = dVar46 * -2.13403484e-13 +
                     dVar55 * 1.76748533e-09 + dVar1 * -4.96891226e-06 + 0.00495695526;
        dcRdT[0xe] = dVar46 * -3.53542256e-13 +
                     dVar55 * 3.01923636e-09 + dVar1 * -8.84517626e-06 + 0.00920000082;
        dcRdT[0xf] = dVar46 * -8.450464e-14 +
                     dVar55 * 1.1833293e-09 + dVar1 * -5.312768e-06 + 0.007871497;
        dcRdT[0x10] = dVar46 * -5.02824244e-13 +
                      dVar55 * 4.41668769e-09 + dVar1 * -1.34215583e-05 + 0.0146454151;
        dcRdT[0x11] = dVar46 * -5.98566304e-13 +
                      dVar55 * 5.25653067e-09 + dVar1 * -1.59641334e-05 + 0.0173972722;
        dVar38 = dVar55 * 6.64236003e-09 + dVar1 * -2.00512134e-05 + 0.0216852677;
        dVar39 = dVar55 * 3.0291114e-10 + dVar1 * -1.136952e-06 + 0.0014879768;
        dVar36 = -7.6001156e-13;
        dVar37 = -2.7013404e-14;
      }
      else {
        dcRdT[0] = dVar46 * -2.95044704e-11 +
                   dVar55 * 6.04716282e-08 + dVar1 * -3.8956302e-05 + 0.00798052075;
        dcRdT[1] = dVar46 * -3.71092933e-21 +
                   dVar55 * 6.90244896e-18 + dVar1 * -3.99183928e-15 + 7.05332819e-13;
        dcRdT[2] = dVar46 * 8.45063884e-12 +
                   dVar55 * -1.83841987e-08 + dVar1 * 1.32861279e-05 + -0.00327931884;
        dcRdT[3] = dVar46 * 1.29749135e-11 +
                   dVar55 * -2.90438853e-08 + dVar1 * 1.9694604e-05 + -0.00299673416;
        dcRdT[4] = dVar46 * 5.4564588e-12 +
                   dVar55 * -1.16434e-08 + dVar1 * 9.23587682e-06 + -0.00240131752;
        dcRdT[5] = dVar46 * 7.08791268e-12 +
                   dVar55 * -1.64639119e-08 + dVar1 * 1.30408042e-05 + -0.0020364341;
        dcRdT[6] = dVar46 * 3.7169005e-11 +
                   dVar55 * -7.28291682e-08 + dVar1 * 4.23165782e-05 + -0.00474912051;
        dcRdT[7] = dVar46 * 6.74966876e-12 +
                   dVar55 * -1.15527346e-08 + dVar1 * 5.58979682e-06 + 0.000968872143;
        dcRdT[8] = dVar46 * 7.77258948e-12 +
                   dVar55 * -2.00644794e-08 + dVar1 * 1.64659244e-05 + -0.00236661419;
        dcRdT[9] = dVar46 * 1.01754294e-11 +
                   dVar55 * -2.06135228e-08 + dVar1 * 1.14604371e-05 + 0.00201095175;
        dcRdT[10] = dVar46 * 6.66775824e-11 +
                    dVar55 * -1.45422908e-07 + dVar1 * 9.83601198e-05 + -0.0136709788;
        dcRdT[0xb] = dVar46 * -3.617698e-12 +
                     dVar55 * 2.72101765e-09 + dVar1 * 2.03362866e-06 + -0.00061035368;
        dcRdT[0xc] = dVar46 * -5.74798192e-13 +
                     dVar55 * 7.37757066e-09 + dVar1 * -1.42471254e-05 + 0.00898459677;
        dcRdT[0xd] = dVar46 * 1.73507546e-11 +
                     dVar55 * -3.99432279e-08 + dVar1 * 2.75598892e-05 + -0.00324392532;
        dcRdT[0xe] = dVar46 * 5.27090608e-11 +
                     dVar55 * -1.13785578e-07 + dVar1 * 7.46440016e-05 + -0.00990833369;
        dcRdT[0xf] = dVar46 * 8.30244e-12 +
                     dVar55 * -2.2132908e-08 + dVar1 * 1.0676944e-05 + 0.007216595;
        dcRdT[0x10] = dVar46 * 1.07953749e-10 +
                      dVar55 * -2.07476626e-07 + dVar1 * 0.000114198058 + -0.00757052247;
        dcRdT[0x11] = dVar46 * 9.22036016e-11 +
                      dVar55 * -1.79737982e-07 + dVar1 * 9.94285614e-05 + -0.00418658892;
        dVar38 = dVar55 * -2.12539886e-07 + dVar1 * 0.000119887658 + -0.0055015427;
        dVar39 = dVar55 * 1.6924545e-08 + dVar1 * -7.926444e-06 + 0.0014082404;
        dVar36 = 1.07474308e-10;
        dVar37 = -9.779416e-12;
      }
      dcRdT[0x12] = dVar46 * dVar36 + dVar38;
      dcRdT[0x13] = dVar46 * dVar37 + dVar39;
      dcRdT[0x14] = dVar46 * 0.0 + dVar55 * 0.0 + dVar1 * 0.0 + 0.0;
      if (1000.0 <= dVar1) {
        local_358 = dVar35 * -950.158922 +
                    dVar161 * 4.00510752e-15 +
                    dVar46 * -4.48915985e-11 +
                    dVar55 * 1.66485593e-07 + dVar1 * -2.47012365e-05 + 2.3372792;
        dStack_350 = dVar35 * 25473.6599 +
                     dVar161 * 9.96394714e-23 +
                     dVar46 * -1.18378809e-18 +
                     dVar55 * 5.38539827e-15 + dVar1 * -1.15421486e-11 + 1.50000001;
        local_348 = dVar35 * 29217.5791 +
                    dVar161 * 2.45667382e-16 +
                    dVar46 * -2.50444497e-12 +
                    dVar55 * 1.39828196e-08 + dVar1 * -4.29870569e-05 + 1.56942078;
        dStack_340 = dVar35 * -1088.45772 +
                     dVar161 * -4.33435588e-15 +
                     dVar46 * 5.23676387e-11 +
                     dVar55 * -2.52655556e-07 + dVar1 * 0.00074154377 + 2.28253784;
        local_338 = dVar35 * 3858.657 +
                    dVar161 * 2.34824752e-15 +
                    dVar46 * -2.19865389e-11 +
                    dVar55 * 4.21684093e-08 + dVar1 * 0.000274214858 + 2.09288767;
        dStack_330 = dVar35 * -30004.2971 +
                     dVar161 * 3.36401984e-15 +
                     dVar46 * -2.42604967e-11 +
                     dVar55 * -5.46908393e-08 + dVar1 * 0.00108845902 + 2.03399249;
        local_328 = dVar35 * 111.856713 +
                    dVar161 * -2.1581707e-15 +
                    dVar46 * 2.85615925e-11 +
                    dVar55 * -2.11219383e-07 + dVar1 * 0.00111991006 + 3.0172109;
        dStack_320 = dVar35 * 46263.604 +
                     dVar161 * -3.75455134e-15 +
                     dVar46 * 6.50448872e-11 +
                     dVar55 * -4.69648657e-07 + dVar1 * 0.00182819646 + 1.87410113;
        local_318 = dVar35 * 50925.9997 +
                    dVar161 * -6.7943273e-15 +
                    dVar46 * 1.044765e-10 +
                    dVar55 * -6.70639823e-07 + dVar1 * 0.00232794318 + 1.29203842;
        dStack_310 = dVar35 * 16775.5843 +
                     dVar161 * -9.34308788e-15 +
                     dVar46 * 1.48921161e-10 +
                     dVar55 * -9.95714493e-07 + dVar1 * 0.00361995018 + 1.28571772;
        local_308 = dVar35 * -9468.34459 +
                    dVar161 * -2.0363046e-14 +
                    dVar46 * 3.05731338e-10 +
                    dVar55 * -1.9109527e-06 + dVar1 * 0.00669547335 + -0.925148505;
        dStack_300 = dVar35 * -14151.8724 +
                     dVar161 * -4.07295432e-15 +
                     dVar46 * 5.7513252e-11 +
                     dVar55 * -3.32941924e-07 + dVar1 * 0.00103126372 + 1.71518561;
        local_2f8 = dVar35 * -48759.166 +
                    dVar161 * -9.44168328e-15 +
                    dVar46 * 1.30872547e-10 +
                    dVar55 * -7.38271347e-07 + dVar1 * 0.00220718513 + 2.85746029;
        dStack_2f0 = dVar35 * 4011.91815 +
                     dVar161 * -1.06701742e-14 +
                     dVar46 * 1.47290445e-10 +
                     dVar55 * -8.28152043e-07 + dVar1 * 0.00247847763 + 1.77217438;
        local_2e8 = dVar35 * -13995.8323 +
                    dVar161 * -1.76771128e-14 +
                    dVar46 * 2.5160303e-10 +
                    dVar55 * -1.47419604e-06 + dVar1 * 0.00460000041 + 0.76069008;
        dStack_2e0 = dVar35 * 127.83252 +
                     dVar161 * -4.225232e-15 +
                     dVar46 * 9.8610775e-11 +
                     dVar55 * -8.85461333e-07 + dVar1 * 0.0039357485 + 2.770799;
        local_2d8 = dVar35 * 4939.88614 +
                    dVar161 * -2.51412122e-14 +
                    dVar46 * 3.68057308e-10 +
                    dVar55 * -2.23692638e-06 + dVar1 * 0.00732270755 + 1.03611116;
        dStack_2d0 = dVar35 * 12857.52 +
                     dVar161 * -2.99283152e-14 +
                     dVar46 * 4.38044223e-10 +
                     dVar55 * -2.66068889e-06 + dVar1 * 0.0086986361 + 0.95465642;
        local_2c8 = dVar35 * -11426.3932 +
                    dVar161 * -3.8000578e-14 +
                    dVar46 * 5.53530003e-10 +
                    dVar55 * -3.3418689e-06 + dVar1 * 0.0108426339 + 0.0718815;
        dVar37 = dVar161 * -1.3506702e-15 +
                 dVar46 * 2.5242595e-11 + dVar55 * -1.89492e-07 + dVar1 * 0.0007439884 + 1.92664;
        dVar36 = -922.7977;
      }
      else {
        local_358 = dVar35 * -917.935173 +
                    dVar161 * -1.47522352e-12 +
                    dVar46 * 5.03930235e-09 +
                    dVar55 * -6.492717e-06 + dVar1 * 0.00399026037 + 1.34433112;
        dStack_350 = dVar35 * 25473.6599 +
                     dVar161 * -1.85546466e-22 +
                     dVar46 * 5.7520408e-19 +
                     dVar55 * -6.65306547e-16 + dVar1 * 3.52666409e-13 + 1.5;
        local_348 = dVar35 * 29122.2592 +
                    dVar161 * 4.22531942e-13 +
                    dVar46 * -1.53201656e-09 +
                    dVar55 * 2.21435465e-06 + dVar1 * -0.00163965942 + 2.1682671;
        dStack_340 = dVar35 * -1063.94356 +
                     dVar161 * 6.48745674e-13 +
                     dVar46 * -2.42032377e-09 +
                     dVar55 * 3.282434e-06 + dVar1 * -0.00149836708 + 2.78245636;
        local_338 = dVar35 * 3615.08056 +
                    dVar161 * 2.7282294e-13 +
                    dVar46 * -9.70283332e-10 +
                    dVar55 * 1.5393128e-06 + dVar1 * -0.00120065876 + 2.99201543;
        dStack_330 = dVar35 * -30293.7267 +
                     dVar161 * 3.54395634e-13 +
                     dVar46 * -1.37199266e-09 +
                     dVar55 * 2.17346737e-06 + dVar1 * -0.00101821705 + 3.19864056;
        local_328 = dVar35 * 294.80804 +
                    dVar161 * 1.85845025e-12 +
                    dVar46 * -6.06909735e-09 +
                    dVar55 * 7.05276303e-06 + dVar1 * -0.00237456025 + 3.30179801;
        dStack_320 = dVar35 * 46004.0401 +
                     dVar161 * 3.37483438e-13 +
                     dVar46 * -9.62727883e-10 +
                     dVar55 * 9.31632803e-07 + dVar1 * 0.000484436072 + 2.76267867;
        local_318 = dVar35 * 50496.8163 +
                    dVar161 * 3.88629474e-13 +
                    dVar46 * -1.67203995e-09 +
                    dVar55 * 2.74432073e-06 + dVar1 * -0.0011833071 + 3.19860411;
        dStack_310 = dVar35 * 16444.9988 +
                     dVar161 * 5.08771468e-13 +
                     dVar46 * -1.71779356e-09 +
                     dVar55 * 1.91007285e-06 + dVar1 * 0.00100547588 + 2.6735904;
        local_308 = dVar35 * -10246.6476 +
                    dVar161 * 3.33387912e-12 +
                    dVar46 * -1.21185757e-08 +
                    dVar55 * 1.63933533e-05 + dVar1 * -0.0068354894 + 4.14987613;
        dStack_300 = dVar35 * -14344.086 +
                     dVar161 * -1.808849e-13 +
                     dVar46 * 2.26751471e-10 +
                     dVar55 * 3.3893811e-07 + dVar1 * -0.00030517684 + 2.57953347;
        local_2f8 = dVar35 * -48371.9697 +
                    dVar161 * -2.87399096e-14 +
                    dVar46 * 6.14797555e-10 +
                    dVar55 * -2.3745209e-06 + dVar1 * 0.00449229839 + 1.35677352;
        dStack_2f0 = dVar35 * 3839.56496 +
                     dVar161 * 8.6753773e-13 +
                     dVar46 * -3.32860233e-09 +
                     dVar55 * 4.59331487e-06 + dVar1 * -0.00162196266 + 3.22118584;
        local_2e8 = dVar35 * -14308.9567 +
                    dVar161 * 2.63545304e-12 +
                    dVar46 * -9.48213152e-09 +
                    dVar55 * 1.24406669e-05 + dVar1 * -0.00495416684 + 3.79372315;
        dStack_2e0 = dVar35 * 978.6011 +
                     dVar161 * 4.15122e-13 +
                     dVar46 * -1.844409e-09 +
                     dVar55 * 1.77949067e-06 + dVar1 * 0.0036082975 + 1.106204;
        local_2d8 = dVar35 * 5089.77593 +
                    dVar161 * 5.39768746e-12 +
                    dVar46 * -1.72897188e-08 +
                    dVar55 * 1.90330097e-05 + dVar1 * -0.00378526124 + 2.95920148;
        dStack_2d0 = dVar35 * 12841.6265 +
                     dVar161 * 4.61018008e-12 +
                     dVar46 * -1.49781651e-08 +
                     dVar55 * 1.65714269e-05 + dVar1 * -0.00209329446 + 3.30646568;
        local_2c8 = dVar35 * -11522.2055 +
                    dVar161 * 5.37371542e-12 +
                    dVar46 * -1.77116571e-08 +
                    dVar55 * 1.99812763e-05 + dVar1 * -0.00275077135 + 3.29142492;
        dVar37 = dVar161 * -4.889708e-13 +
                 dVar46 * 1.41037875e-09 + dVar55 * -1.321074e-06 + dVar1 * 0.0007041202 + 2.298677;
        dVar36 = -1020.8999;
      }
      local_2c0 = dVar36 * dVar35 + dVar37;
      RVar144 = dVar108 + dVar161 * 0.0 + dVar46 * 0.0 + dVar55 * 0.0 + dVar1 * 0.0 + 1.5;
    }
    *pRVar30 = RVar144;
    dVar46 = 0.0;
    dVar55 = 0.0;
    dVar36 = 0.0;
    dVar37 = 0.0;
    for (lVar29 = 0; lVar29 != 0xa8; lVar29 = lVar29 + 8) {
      dVar36 = dVar36 + *(double *)((long)dcRdT + lVar29) * *(double *)((long)c + lVar29);
      dVar161 = *(double *)((long)pdVar32 + lVar29);
      dVar46 = dVar46 + *(double *)((long)c + lVar29) * *(double *)((long)c_R + lVar29);
      dVar55 = dVar55 + *(double *)((long)local_1f08 + lVar29) * dVar161;
      dVar37 = dVar37 + (*(double *)((long)c_R + lVar29) - dVar161) * dVar35 *
                        *(double *)((long)local_1f08 + lVar29) +
                        dVar161 * *(double *)((long)local_758 + lVar29);
    }
    dVar55 = dVar55 * (1.0 / dVar46);
    dVar1 = dVar1 * (1.0 / dVar46);
    dVar35 = dVar55 * dVar1;
    dVar1 = -dVar1;
    pdVar31 = local_15c8 + 0x15;
    for (lVar29 = 0; lVar29 != 0x15; lVar29 = lVar29 + 1) {
      dVar46 = 0.0;
      for (lVar33 = 0; lVar33 != 0x15; lVar33 = lVar33 + 1) {
        dVar46 = dVar46 + pdVar32[lVar33] * pdVar34[lVar33];
      }
      *(double *)(auStack_1510 + lVar29 * 0xb0 + -0x10) = c_R[lVar29] * dVar35 + dVar46 * dVar1;
      pdVar34 = pdVar34 + 0x16;
    }
    local_6b0 = dVar1 * dVar37 + (dVar35 * dVar36 - dVar55);
    for (lVar29 = -0xa8; lVar29 != 0; lVar29 = lVar29 + 8) {
      *(double *)((long)&local_6b0 + lVar29) = *(double *)((long)&local_6b0 + lVar29) * 1e-06;
      *pdVar31 = *pdVar31 * 1000000.0;
      pdVar31 = pdVar31 + 0x16;
    }
    SUNDlsMat_denseScale(0.0,*(realtype ***)*puVar3,0x16,0x16);
    a = *(realtype ***)*puVar3;
    pdVar32 = local_15c8;
    for (lVar29 = 0; lVar29 != 0x15; lVar29 = lVar29 + 1) {
      dVar35 = local_238[lVar29];
      pdVar34 = pdVar32;
      for (lVar33 = 0; lVar33 != 0x15; lVar33 = lVar33 + 1) {
        a[lVar33][lVar29] = (*pdVar34 * dVar35) / local_238[lVar33];
        pdVar34 = pdVar34 + 0x16;
      }
      a[lVar29][0x15] = local_15c8[lVar29 * 0x16 + 0x15] / dVar35;
      pdVar32 = pdVar32 + 1;
    }
    prVar28 = a[0x15];
    for (lVar29 = 0; lVar29 != 0x15; lVar29 = lVar29 + 1) {
      prVar28[lVar29] = local_758[lVar29] * local_238[lVar29];
    }
    prVar28[0x15] = local_6b0;
    SUNDlsMat_denseCopy(a,*(realtype ***)*puVar2,0x16,0x16);
    *piVar26 = 1;
  }
  else {
    SUNDlsMat_denseCopy(*(realtype ***)*puVar3,*(realtype ***)*puVar2,0x16,0x16);
    *jcurPtr = 0;
  }
  SUNDlsMat_denseScale(-local_248,*(realtype ***)*puVar2,0x16,0x16);
  SUNDlsMat_denseAddIdentity(*(realtype ***)*puVar2,0x16);
  sVar27 = SUNDlsMat_denseGETRF(*(realtype ***)*puVar2,0x16,0x16,*(sunindextype **)*puVar4);
  return (int)(sVar27 != 0);
}

Assistant:

int
Precond(
  amrex::Real /* tn */,
  N_Vector u,
  N_Vector /* fu */,
  booleantype jok,
  booleantype* jcurPtr,
  amrex::Real gamma,
  void* user_data)
{
  BL_PROFILE("Pele::ReactorCvode::Precond()");
  // Make local copies of pointers to input data
  amrex::Real* u_d = N_VGetArrayPointer(u);

  // Make local copies of pointers in user_data
  auto* udata = static_cast<CVODEUserData*>(user_data);
  auto reactor_type = udata->reactor_type;
  auto* P = udata->P;
  auto* Jbd = udata->Jbd;
  auto* pivot = udata->pivot;

  // MW CGS
  amrex::Real mw[NUM_SPECIES] = {0.0};
  get_mw(mw);

  if (jok != 0) {
    // jok = SUNTRUE: Copy Jbd to P
    SUNDlsMat_denseCopy(Jbd[0][0], P[0][0], NUM_SPECIES + 1, NUM_SPECIES + 1);
    *jcurPtr = SUNFALSE;
  } else {
    // rho MKS
    amrex::Real rho = 0.0;
    for (int i = 0; i < NUM_SPECIES; i++) {
      rho = rho + u_d[i];
    }
    // Yks
    amrex::Real massfrac[NUM_SPECIES] = {0.0};
    amrex::Real rhoinv = 1.0 / rho;
    for (int i = 0; i < NUM_SPECIES; i++) {
      massfrac[i] = u_d[i] * rhoinv;
    }
    amrex::Real temp = u_d[NUM_SPECIES];
    // Activities
    amrex::Real activity[NUM_SPECIES] = {0.0};
    auto eos = pele::physics::PhysicsType::eos();
    eos.RTY2C(rho, temp, massfrac, activity);
    int consP = static_cast<int>(reactor_type == ReactorTypes::h_reactor_type);
    amrex::Real Jmat[(NUM_SPECIES + 1) * (NUM_SPECIES + 1)] = {0.0};
    DWDOT_SIMPLIFIED(Jmat, activity, &temp, &consP);

    // Scale Jacobian.  Load into P.
    SUNDlsMat_denseScale(0.0, Jbd[0][0], NUM_SPECIES + 1, NUM_SPECIES + 1);
    for (int i = 0; i < NUM_SPECIES; i++) {
      for (int k = 0; k < NUM_SPECIES; k++) {
        (Jbd[0][0])[k][i] = Jmat[k * (NUM_SPECIES + 1) + i] * mw[i] / mw[k];
      }
      (Jbd[0][0])[i][NUM_SPECIES] =
        Jmat[i * (NUM_SPECIES + 1) + NUM_SPECIES] / mw[i];
    }
    for (int i = 0; i < NUM_SPECIES; i++) {
      (Jbd[0][0])[NUM_SPECIES][i] =
        Jmat[NUM_SPECIES * (NUM_SPECIES + 1) + i] * mw[i];
    }
    (Jbd[0][0])[NUM_SPECIES][NUM_SPECIES] =
      Jmat[(NUM_SPECIES + 1) * (NUM_SPECIES + 1) - 1];

    SUNDlsMat_denseCopy(Jbd[0][0], P[0][0], NUM_SPECIES + 1, NUM_SPECIES + 1);

    *jcurPtr = SUNTRUE;
  }

  // Scale by -gamma
  SUNDlsMat_denseScale(-gamma, P[0][0], NUM_SPECIES + 1, NUM_SPECIES + 1);

  // Add identity matrix and do LU decompositions on blocks in place.
  SUNDlsMat_denseAddIdentity(P[0][0], NUM_SPECIES + 1);
  sunindextype ierr = SUNDlsMat_denseGETRF(
    P[0][0], NUM_SPECIES + 1, NUM_SPECIES + 1, pivot[0][0]);
  if (ierr != 0) {
    return (1);
  }

  return (0);
}